

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_3x3_pack4.h
# Opt level: O0

void ncnn::convdw3x3s1_pack4_sse(Mat *bottom_blob,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  undefined8 uVar33;
  undefined8 uVar34;
  undefined8 uVar35;
  undefined8 uVar36;
  undefined8 uVar37;
  undefined8 uVar38;
  Mat *in_RCX;
  Mat *in_RDX;
  long in_RSI;
  long in_RDI;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  __m128 _r22_3;
  __m128 _r21_3;
  __m128 _r20_3;
  __m128 _r12_3;
  __m128 _r11_3;
  __m128 _r10_3;
  __m128 _r02_3;
  __m128 _r01_3;
  __m128 _r00_3;
  __m128 _sum0_3;
  __m128 _r23_2;
  __m128 _r13_2;
  __m128 _r03_2;
  __m128 _sum1_2;
  __m128 _r22_2;
  __m128 _r21_2;
  __m128 _r20_2;
  __m128 _r12_2;
  __m128 _r11_2;
  __m128 _r10_2;
  __m128 _r02_2;
  __m128 _r01_2;
  __m128 _r00_2;
  __m128 _sum0_2;
  __m128 _r25_1;
  __m128 _r15_1;
  __m128 _r05_1;
  __m128 _sum3_1;
  __m128 _r24_1;
  __m128 _r14_1;
  __m128 _r04_1;
  __m128 _sum2_1;
  __m128 _r23_1;
  __m128 _r13_1;
  __m128 _r03_1;
  __m128 _sum1_1;
  __m128 _r22_1;
  __m128 _r21_1;
  __m128 _r20_1;
  __m128 _r12_1;
  __m128 _r11_1;
  __m128 _r10_1;
  __m128 _r02_1;
  __m128 _r01_1;
  __m128 _r00_1;
  __m128 _sum0_1;
  __m128 _r29;
  __m128 _r19;
  __m128 _r09;
  __m128 _sum7;
  __m128 _r28;
  __m128 _r18;
  __m128 _r08;
  __m128 _sum6;
  __m128 _r27;
  __m128 _r17;
  __m128 _r07;
  __m128 _sum5;
  __m128 _r26;
  __m128 _r16;
  __m128 _r06;
  __m128 _sum4;
  __m128 _r25;
  __m128 _r15;
  __m128 _r05;
  __m128 _sum3;
  __m128 _r24;
  __m128 _r14;
  __m128 _r04;
  __m128 _sum2;
  __m128 _r23;
  __m128 _r13;
  __m128 _r03;
  __m128 _sum1;
  __m128 _r22;
  __m128 _r21;
  __m128 _r20;
  __m128 _r12;
  __m128 _r11;
  __m128 _r10;
  __m128 _r02;
  __m128 _r01;
  __m128 _r00;
  __m128 _sum0;
  int j;
  int i;
  __m128 _k22;
  __m128 _k21;
  __m128 _k20;
  __m128 _k12;
  __m128 _k11;
  __m128 _k10;
  __m128 _k02;
  __m128 _k01;
  __m128 _k00;
  float *r2;
  float *r1;
  float *r0;
  Mat img0;
  float *outptr0;
  float *k0;
  __m128 _bias0;
  Mat out;
  int g;
  float *bias;
  int group;
  int outh;
  int outw;
  float in_stack_ffffffffffffac24;
  float in_stack_ffffffffffffac28;
  float in_stack_ffffffffffffac2c;
  undefined8 local_46a8;
  undefined8 uStack_46a0;
  int local_4140;
  int local_413c;
  float *local_40a8;
  float *local_40a0;
  float *local_4098;
  Mat local_4090;
  float *local_4048;
  float *local_4040;
  undefined8 local_4028;
  undefined8 uStack_4020;
  Mat local_4018;
  int local_3fcc;
  float *local_3fc8;
  int local_3fbc;
  int local_3fb8;
  int local_3fb4;
  Mat *local_3fa0;
  undefined4 local_3f88;
  undefined4 uStack_3f84;
  undefined4 uStack_3f80;
  undefined4 uStack_3f7c;
  undefined4 local_3f74;
  float *local_3f70;
  float *local_3f68;
  float *local_3f60;
  float *local_3f58;
  float *local_3f50;
  float *local_3f48;
  float *local_3f40;
  float *local_3f38;
  float *local_3f30;
  float *local_3f28;
  float *local_3f20;
  float *local_3f18;
  float *local_3f10;
  float *local_3f08;
  float *local_3f00;
  float *local_3ef8;
  float *local_3ef0;
  float *local_3ee8;
  float *local_3ee0;
  float *local_3ed8;
  float *local_3ed0;
  float *local_3ec8;
  float *local_3ec0;
  float *local_3eb8;
  float *local_3eb0;
  float *local_3ea8;
  float *local_3ea0;
  float *local_3e98;
  float *local_3e90;
  float *local_3e88;
  float *local_3e80;
  float *local_3e78;
  float *local_3e70;
  float *local_3e68;
  float *local_3e60;
  float *local_3e58;
  float *local_3e50;
  float *local_3e48;
  float *local_3e40;
  float *local_3e38;
  float *local_3e30;
  float *local_3e28;
  float *local_3e20;
  float *local_3e18;
  float *local_3e10;
  float *local_3e08;
  float *local_3e00;
  float *local_3df8;
  float *local_3df0;
  float *local_3de8;
  float *local_3de0;
  float *local_3dd8;
  float *local_3dd0;
  float *local_3dc8;
  float *local_3dc0;
  float *local_3db8;
  float *local_3db0;
  float *local_3da8;
  float *local_3da0;
  float *local_3d98;
  float *local_3d90;
  float *local_3d88;
  float *local_3d80;
  float *local_3d78;
  float *local_3d70;
  float *local_3d68;
  float *local_3d60;
  float *local_3d58;
  float *local_3d50;
  float *local_3d48;
  float *local_3d40;
  float *local_3d38;
  float *local_3d30;
  float *local_3d28;
  float *local_3d20;
  float *local_3d18;
  float *local_3d10;
  float *local_3d08;
  float *local_3d00;
  undefined8 local_3cf8;
  undefined8 uStack_3cf0;
  float *local_3ce0;
  undefined8 local_3cd8;
  undefined8 uStack_3cd0;
  float *local_3cc0;
  undefined8 local_3cb8;
  undefined8 uStack_3cb0;
  float *local_3ca0;
  undefined8 local_3c98;
  undefined8 uStack_3c90;
  float *local_3c80;
  undefined8 local_3c78;
  undefined8 uStack_3c70;
  float *local_3c60;
  undefined8 local_3c58;
  undefined8 uStack_3c50;
  float *local_3c40;
  undefined8 local_3c38;
  undefined8 uStack_3c30;
  float *local_3c20;
  undefined8 local_3c18;
  undefined8 uStack_3c10;
  float *local_3c00;
  undefined8 local_3bf8;
  undefined8 uStack_3bf0;
  float *local_3be0;
  undefined8 local_3bd8;
  undefined8 uStack_3bd0;
  float *local_3bc0;
  undefined8 local_3bb8;
  undefined8 uStack_3bb0;
  float *local_3ba0;
  undefined8 local_3b98;
  undefined8 uStack_3b90;
  float *local_3b80;
  undefined8 local_3b78;
  undefined8 uStack_3b70;
  float *local_3b60;
  undefined8 local_3b58;
  undefined8 uStack_3b50;
  float *local_3b40;
  undefined8 local_3b38;
  undefined8 uStack_3b30;
  float *local_3b20;
  undefined8 local_3b18;
  undefined8 uStack_3b10;
  undefined8 local_3b08;
  undefined8 uStack_3b00;
  undefined8 local_3af8;
  undefined8 uStack_3af0;
  undefined8 local_3ae8;
  undefined8 uStack_3ae0;
  undefined1 local_3ad8 [16];
  undefined8 local_3ac8;
  undefined8 uStack_3ac0;
  undefined8 local_3ab8;
  undefined8 uStack_3ab0;
  undefined8 local_3aa8;
  undefined8 uStack_3aa0;
  undefined8 local_3a98;
  undefined8 uStack_3a90;
  undefined8 local_3a88;
  undefined8 uStack_3a80;
  undefined8 local_3a78;
  undefined8 uStack_3a70;
  float local_3a68;
  float fStack_3a64;
  float fStack_3a60;
  float fStack_3a5c;
  undefined8 local_3a58;
  undefined8 uStack_3a50;
  undefined8 local_3a48;
  undefined8 uStack_3a40;
  undefined8 local_3a38;
  undefined8 uStack_3a30;
  undefined8 local_3a28;
  undefined8 uStack_3a20;
  undefined8 local_3a18;
  undefined8 uStack_3a10;
  undefined8 local_3a08;
  undefined8 uStack_3a00;
  float local_39f8;
  float fStack_39f4;
  float fStack_39f0;
  float fStack_39ec;
  undefined8 local_39e8;
  undefined8 uStack_39e0;
  undefined8 local_39d8;
  undefined8 uStack_39d0;
  undefined8 local_39c8;
  undefined8 uStack_39c0;
  undefined8 local_39b8;
  undefined8 uStack_39b0;
  undefined8 local_39a8;
  undefined8 uStack_39a0;
  undefined8 local_3998;
  undefined8 uStack_3990;
  float local_3988;
  float fStack_3984;
  float fStack_3980;
  float fStack_397c;
  undefined8 local_3978;
  undefined8 uStack_3970;
  undefined8 local_3968;
  undefined8 uStack_3960;
  undefined8 local_3958;
  undefined8 uStack_3950;
  undefined8 local_3948;
  undefined8 uStack_3940;
  undefined8 local_3938;
  undefined8 uStack_3930;
  undefined8 local_3928;
  undefined8 uStack_3920;
  float local_3918;
  float fStack_3914;
  float fStack_3910;
  float fStack_390c;
  undefined8 local_3908;
  undefined8 uStack_3900;
  undefined8 local_38f8;
  undefined8 uStack_38f0;
  undefined8 local_38e8;
  undefined8 uStack_38e0;
  undefined8 local_38d8;
  undefined8 uStack_38d0;
  undefined8 local_38c8;
  undefined8 uStack_38c0;
  undefined8 local_38b8;
  undefined8 uStack_38b0;
  float local_38a8;
  float fStack_38a4;
  float fStack_38a0;
  float fStack_389c;
  undefined8 local_3898;
  undefined8 uStack_3890;
  undefined8 local_3888;
  undefined8 uStack_3880;
  undefined8 local_3878;
  undefined8 uStack_3870;
  undefined8 local_3868;
  undefined8 uStack_3860;
  undefined8 local_3858;
  undefined8 uStack_3850;
  undefined8 local_3848;
  undefined8 uStack_3840;
  float local_3838;
  float fStack_3834;
  float fStack_3830;
  float fStack_382c;
  undefined8 local_3828;
  undefined8 uStack_3820;
  undefined8 local_3818;
  undefined8 uStack_3810;
  undefined8 local_3808;
  undefined8 uStack_3800;
  undefined8 local_37f8;
  undefined8 uStack_37f0;
  undefined8 local_37e8;
  undefined8 uStack_37e0;
  undefined8 local_37d8;
  undefined8 uStack_37d0;
  float local_37c8;
  float fStack_37c4;
  float fStack_37c0;
  float fStack_37bc;
  undefined8 local_37b8;
  undefined8 uStack_37b0;
  undefined8 local_37a8;
  undefined8 uStack_37a0;
  undefined8 local_3798;
  undefined8 uStack_3790;
  undefined8 local_3788;
  undefined8 uStack_3780;
  undefined8 local_3778;
  undefined8 uStack_3770;
  undefined8 local_3768;
  undefined8 uStack_3760;
  float local_3758;
  float fStack_3754;
  float fStack_3750;
  float fStack_374c;
  undefined8 local_3748;
  undefined8 uStack_3740;
  undefined8 local_3738;
  undefined8 uStack_3730;
  undefined8 local_3728;
  undefined8 uStack_3720;
  undefined8 local_3718;
  undefined8 uStack_3710;
  undefined8 local_3708;
  undefined8 uStack_3700;
  undefined8 local_36f8;
  undefined8 uStack_36f0;
  undefined1 local_36e8 [16];
  undefined8 local_36d8;
  undefined8 uStack_36d0;
  undefined8 local_36c8;
  undefined8 uStack_36c0;
  undefined8 local_36b8;
  undefined8 uStack_36b0;
  undefined8 local_36a8;
  undefined8 uStack_36a0;
  undefined8 local_3698;
  undefined8 uStack_3690;
  undefined8 local_3688;
  undefined8 uStack_3680;
  float local_3678;
  float fStack_3674;
  float fStack_3670;
  float fStack_366c;
  undefined8 local_3668;
  undefined8 uStack_3660;
  undefined8 local_3658;
  undefined8 uStack_3650;
  undefined8 local_3648;
  undefined8 uStack_3640;
  undefined8 local_3638;
  undefined8 uStack_3630;
  undefined8 local_3628;
  undefined8 uStack_3620;
  undefined8 local_3618;
  undefined8 uStack_3610;
  float local_3608;
  float fStack_3604;
  float fStack_3600;
  float fStack_35fc;
  undefined8 local_35f8;
  undefined8 uStack_35f0;
  undefined8 local_35e8;
  undefined8 uStack_35e0;
  undefined8 local_35d8;
  undefined8 uStack_35d0;
  undefined8 local_35c8;
  undefined8 uStack_35c0;
  undefined8 local_35b8;
  undefined8 uStack_35b0;
  undefined8 local_35a8;
  undefined8 uStack_35a0;
  float local_3598;
  float fStack_3594;
  float fStack_3590;
  float fStack_358c;
  undefined8 local_3588;
  undefined8 uStack_3580;
  undefined8 local_3578;
  undefined8 uStack_3570;
  undefined8 local_3568;
  undefined8 uStack_3560;
  undefined8 local_3558;
  undefined8 uStack_3550;
  undefined8 local_3548;
  undefined8 uStack_3540;
  undefined8 local_3538;
  undefined8 uStack_3530;
  float local_3528;
  float fStack_3524;
  float fStack_3520;
  float fStack_351c;
  undefined8 local_3518;
  undefined8 uStack_3510;
  undefined8 local_3508;
  undefined8 uStack_3500;
  undefined8 local_34f8;
  undefined8 uStack_34f0;
  undefined8 local_34e8;
  undefined8 uStack_34e0;
  undefined8 local_34d8;
  undefined8 uStack_34d0;
  undefined8 local_34c8;
  undefined8 uStack_34c0;
  float local_34b8;
  float fStack_34b4;
  float fStack_34b0;
  float fStack_34ac;
  undefined8 local_34a8;
  undefined8 uStack_34a0;
  undefined8 local_3498;
  undefined8 uStack_3490;
  undefined8 local_3488;
  undefined8 uStack_3480;
  undefined8 local_3478;
  undefined8 uStack_3470;
  undefined8 local_3468;
  undefined8 uStack_3460;
  undefined8 local_3458;
  undefined8 uStack_3450;
  float local_3448;
  float fStack_3444;
  float fStack_3440;
  float fStack_343c;
  undefined8 local_3438;
  undefined8 uStack_3430;
  undefined8 local_3428;
  undefined8 uStack_3420;
  undefined8 local_3418;
  undefined8 uStack_3410;
  undefined8 local_3408;
  undefined8 uStack_3400;
  undefined8 local_33f8;
  undefined8 uStack_33f0;
  undefined8 local_33e8;
  undefined8 uStack_33e0;
  float local_33d8;
  float fStack_33d4;
  float fStack_33d0;
  float fStack_33cc;
  undefined8 local_33c8;
  undefined8 uStack_33c0;
  undefined8 local_33b8;
  undefined8 uStack_33b0;
  undefined8 local_33a8;
  undefined8 uStack_33a0;
  undefined8 local_3398;
  undefined8 uStack_3390;
  undefined8 local_3388;
  undefined8 uStack_3380;
  undefined8 local_3378;
  undefined8 uStack_3370;
  float local_3368;
  float fStack_3364;
  float fStack_3360;
  float fStack_335c;
  undefined8 local_3358;
  undefined8 uStack_3350;
  undefined8 local_3348;
  undefined8 uStack_3340;
  undefined8 local_3338;
  undefined8 uStack_3330;
  undefined8 local_3328;
  undefined8 uStack_3320;
  undefined8 local_3318;
  undefined8 uStack_3310;
  undefined8 local_3308;
  undefined8 uStack_3300;
  float local_32f8;
  float fStack_32f4;
  float fStack_32f0;
  float fStack_32ec;
  undefined8 local_32e8;
  undefined8 uStack_32e0;
  undefined8 local_32d8;
  undefined8 uStack_32d0;
  undefined8 local_32c8;
  undefined8 uStack_32c0;
  undefined8 local_32b8;
  undefined8 uStack_32b0;
  undefined8 local_32a8;
  undefined8 uStack_32a0;
  undefined8 local_3298;
  undefined8 uStack_3290;
  float local_3288;
  float fStack_3284;
  float fStack_3280;
  float fStack_327c;
  undefined8 local_3278;
  undefined8 uStack_3270;
  undefined8 local_3268;
  undefined8 uStack_3260;
  undefined8 local_3258;
  undefined8 uStack_3250;
  undefined8 local_3248;
  undefined8 uStack_3240;
  undefined8 local_3238;
  undefined8 uStack_3230;
  undefined8 local_3228;
  undefined8 uStack_3220;
  float local_3218;
  float fStack_3214;
  float fStack_3210;
  float fStack_320c;
  undefined8 local_3208;
  undefined8 uStack_3200;
  undefined8 local_31f8;
  undefined8 uStack_31f0;
  undefined8 local_31e8;
  undefined8 uStack_31e0;
  undefined8 local_31d8;
  undefined8 uStack_31d0;
  undefined8 local_31c8;
  undefined8 uStack_31c0;
  undefined8 local_31b8;
  undefined8 uStack_31b0;
  float local_31a8;
  float fStack_31a4;
  float fStack_31a0;
  float fStack_319c;
  undefined8 local_3198;
  undefined8 uStack_3190;
  undefined8 local_3188;
  undefined8 uStack_3180;
  undefined8 local_3178;
  undefined8 uStack_3170;
  undefined8 local_3168;
  undefined8 uStack_3160;
  undefined8 local_3158;
  undefined8 uStack_3150;
  undefined8 local_3148;
  undefined8 uStack_3140;
  float local_3138;
  float fStack_3134;
  float fStack_3130;
  float fStack_312c;
  undefined8 local_3128;
  undefined8 uStack_3120;
  undefined8 local_3118;
  undefined8 uStack_3110;
  undefined8 local_3108;
  undefined8 uStack_3100;
  undefined8 local_30f8;
  undefined8 uStack_30f0;
  undefined8 local_30e8;
  undefined8 uStack_30e0;
  undefined8 local_30d8;
  undefined8 uStack_30d0;
  float local_30c8;
  float fStack_30c4;
  float fStack_30c0;
  float fStack_30bc;
  undefined8 local_30b8;
  undefined8 uStack_30b0;
  undefined8 local_30a8;
  undefined8 uStack_30a0;
  undefined8 local_3098;
  undefined8 uStack_3090;
  undefined8 local_3088;
  undefined8 uStack_3080;
  undefined8 local_3078;
  undefined8 uStack_3070;
  undefined8 local_3068;
  undefined8 uStack_3060;
  float local_3058;
  float fStack_3054;
  float fStack_3050;
  float fStack_304c;
  undefined8 local_3048;
  undefined8 uStack_3040;
  undefined8 local_3038;
  undefined8 uStack_3030;
  undefined8 local_3028;
  undefined8 uStack_3020;
  undefined8 local_3018;
  undefined8 uStack_3010;
  undefined8 local_3008;
  undefined8 uStack_3000;
  undefined8 local_2ff8;
  undefined8 uStack_2ff0;
  float local_2fe8;
  float fStack_2fe4;
  float fStack_2fe0;
  float fStack_2fdc;
  undefined8 local_2fd8;
  undefined8 uStack_2fd0;
  undefined8 local_2fc8;
  undefined8 uStack_2fc0;
  undefined8 local_2fb8;
  undefined8 uStack_2fb0;
  undefined8 local_2fa8;
  undefined8 uStack_2fa0;
  undefined8 local_2f98;
  undefined8 uStack_2f90;
  undefined8 local_2f88;
  undefined8 uStack_2f80;
  float local_2f78;
  float fStack_2f74;
  float fStack_2f70;
  float fStack_2f6c;
  undefined8 local_2f68;
  undefined8 uStack_2f60;
  undefined8 local_2f58;
  undefined8 uStack_2f50;
  undefined8 local_2f48;
  undefined8 uStack_2f40;
  undefined8 local_2f38;
  undefined8 uStack_2f30;
  undefined8 local_2f28;
  undefined8 uStack_2f20;
  undefined8 local_2f18;
  undefined8 uStack_2f10;
  undefined1 local_2f08 [16];
  undefined8 local_2ef8;
  undefined8 uStack_2ef0;
  undefined8 local_2ee8;
  undefined8 uStack_2ee0;
  undefined8 local_2ed8;
  undefined8 uStack_2ed0;
  undefined8 local_2ec8;
  undefined8 uStack_2ec0;
  undefined8 local_2eb8;
  undefined8 uStack_2eb0;
  undefined8 local_2ea8;
  undefined8 uStack_2ea0;
  float local_2e98;
  float fStack_2e94;
  float fStack_2e90;
  float fStack_2e8c;
  undefined8 local_2e88;
  undefined8 uStack_2e80;
  undefined8 local_2e78;
  undefined8 uStack_2e70;
  undefined8 local_2e68;
  undefined8 uStack_2e60;
  undefined8 local_2e58;
  undefined8 uStack_2e50;
  undefined8 local_2e48;
  undefined8 uStack_2e40;
  undefined8 local_2e38;
  undefined8 uStack_2e30;
  float local_2e28;
  float fStack_2e24;
  float fStack_2e20;
  float fStack_2e1c;
  undefined8 local_2e18;
  undefined8 uStack_2e10;
  undefined8 local_2e08;
  undefined8 uStack_2e00;
  undefined8 local_2df8;
  undefined8 uStack_2df0;
  undefined8 local_2de8;
  undefined8 uStack_2de0;
  undefined8 local_2dd8;
  undefined8 uStack_2dd0;
  undefined8 local_2dc8;
  undefined8 uStack_2dc0;
  float local_2db8;
  float fStack_2db4;
  float fStack_2db0;
  float fStack_2dac;
  undefined8 local_2da8;
  undefined8 uStack_2da0;
  undefined8 local_2d98;
  undefined8 uStack_2d90;
  undefined8 local_2d88;
  undefined8 uStack_2d80;
  undefined8 local_2d78;
  undefined8 uStack_2d70;
  undefined8 local_2d68;
  undefined8 uStack_2d60;
  undefined8 local_2d58;
  undefined8 uStack_2d50;
  float local_2d48;
  float fStack_2d44;
  float fStack_2d40;
  float fStack_2d3c;
  undefined8 local_2d38;
  undefined8 uStack_2d30;
  undefined8 local_2d28;
  undefined8 uStack_2d20;
  undefined8 local_2d18;
  undefined8 uStack_2d10;
  undefined8 local_2d08;
  undefined8 uStack_2d00;
  undefined8 local_2cf8;
  undefined8 uStack_2cf0;
  undefined8 local_2ce8;
  undefined8 uStack_2ce0;
  float local_2cd8;
  float fStack_2cd4;
  float fStack_2cd0;
  float fStack_2ccc;
  undefined8 local_2cc8;
  undefined8 uStack_2cc0;
  undefined8 local_2cb8;
  undefined8 uStack_2cb0;
  undefined8 local_2ca8;
  undefined8 uStack_2ca0;
  undefined8 local_2c98;
  undefined8 uStack_2c90;
  undefined8 local_2c88;
  undefined8 uStack_2c80;
  undefined8 local_2c78;
  undefined8 uStack_2c70;
  float local_2c68;
  float fStack_2c64;
  float fStack_2c60;
  float fStack_2c5c;
  undefined8 local_2c58;
  undefined8 uStack_2c50;
  undefined8 local_2c48;
  undefined8 uStack_2c40;
  undefined8 local_2c38;
  undefined8 uStack_2c30;
  undefined8 local_2c28;
  undefined8 uStack_2c20;
  undefined8 local_2c18;
  undefined8 uStack_2c10;
  undefined8 local_2c08;
  undefined8 uStack_2c00;
  float local_2bf8;
  float fStack_2bf4;
  float fStack_2bf0;
  float fStack_2bec;
  undefined8 local_2be8;
  undefined8 uStack_2be0;
  undefined8 local_2bd8;
  undefined8 uStack_2bd0;
  undefined8 local_2bc8;
  undefined8 uStack_2bc0;
  undefined8 local_2bb8;
  undefined8 uStack_2bb0;
  undefined8 local_2ba8;
  undefined8 uStack_2ba0;
  undefined8 local_2b98;
  undefined8 uStack_2b90;
  float local_2b88;
  float fStack_2b84;
  float fStack_2b80;
  float fStack_2b7c;
  undefined8 local_2b78;
  undefined8 uStack_2b70;
  undefined8 local_2b68;
  undefined8 uStack_2b60;
  undefined8 local_2b58;
  undefined8 uStack_2b50;
  undefined8 local_2b48;
  undefined8 uStack_2b40;
  undefined8 local_2b38;
  undefined8 uStack_2b30;
  undefined8 local_2b28;
  undefined8 uStack_2b20;
  float local_2b18;
  float fStack_2b14;
  float fStack_2b10;
  float fStack_2b0c;
  undefined8 local_2b08;
  undefined8 uStack_2b00;
  undefined8 local_2af8;
  undefined8 uStack_2af0;
  undefined8 local_2ae8;
  undefined8 uStack_2ae0;
  undefined8 local_2ad8;
  undefined8 uStack_2ad0;
  undefined8 local_2ac8;
  undefined8 uStack_2ac0;
  undefined8 local_2ab8;
  undefined8 uStack_2ab0;
  float local_2aa8;
  float fStack_2aa4;
  float fStack_2aa0;
  float fStack_2a9c;
  undefined8 local_2a98;
  undefined8 uStack_2a90;
  undefined8 local_2a88;
  undefined8 uStack_2a80;
  undefined8 local_2a78;
  undefined8 uStack_2a70;
  undefined8 local_2a68;
  undefined8 uStack_2a60;
  undefined8 local_2a58;
  undefined8 uStack_2a50;
  undefined8 local_2a48;
  undefined8 uStack_2a40;
  float local_2a38;
  float fStack_2a34;
  float fStack_2a30;
  float fStack_2a2c;
  undefined8 local_2a28;
  undefined8 uStack_2a20;
  undefined8 local_2a18;
  undefined8 uStack_2a10;
  undefined8 local_2a08;
  undefined8 uStack_2a00;
  undefined8 local_29f8;
  undefined8 uStack_29f0;
  undefined8 local_29e8;
  undefined8 uStack_29e0;
  undefined8 local_29d8;
  undefined8 uStack_29d0;
  float local_29c8;
  float fStack_29c4;
  float fStack_29c0;
  float fStack_29bc;
  undefined8 local_29b8;
  undefined8 uStack_29b0;
  undefined8 local_29a8;
  undefined8 uStack_29a0;
  undefined8 local_2998;
  undefined8 uStack_2990;
  undefined8 local_2988;
  undefined8 uStack_2980;
  undefined8 local_2978;
  undefined8 uStack_2970;
  undefined8 local_2968;
  undefined8 uStack_2960;
  float local_2958;
  float fStack_2954;
  float fStack_2950;
  float fStack_294c;
  undefined8 local_2948;
  undefined8 uStack_2940;
  undefined8 local_2938;
  undefined8 uStack_2930;
  undefined8 local_2928;
  undefined8 uStack_2920;
  undefined8 local_2918;
  undefined8 uStack_2910;
  undefined8 local_2908;
  undefined8 uStack_2900;
  undefined8 local_28f8;
  undefined8 uStack_28f0;
  float local_28e8;
  float fStack_28e4;
  float fStack_28e0;
  float fStack_28dc;
  undefined8 local_28d8;
  undefined8 uStack_28d0;
  undefined8 local_28c8;
  undefined8 uStack_28c0;
  undefined8 local_28b8;
  undefined8 uStack_28b0;
  undefined8 local_28a8;
  undefined8 uStack_28a0;
  undefined8 local_2898;
  undefined8 uStack_2890;
  undefined8 local_2888;
  undefined8 uStack_2880;
  float local_2878;
  float fStack_2874;
  float fStack_2870;
  float fStack_286c;
  undefined8 local_2868;
  undefined8 uStack_2860;
  undefined8 local_2858;
  undefined8 uStack_2850;
  undefined8 local_2848;
  undefined8 uStack_2840;
  undefined8 local_2838;
  undefined8 uStack_2830;
  undefined8 local_2828;
  undefined8 uStack_2820;
  undefined8 local_2818;
  undefined8 uStack_2810;
  float local_2808;
  float fStack_2804;
  float fStack_2800;
  float fStack_27fc;
  undefined8 local_27f8;
  undefined8 uStack_27f0;
  undefined8 local_27e8;
  undefined8 uStack_27e0;
  undefined8 local_27d8;
  undefined8 uStack_27d0;
  undefined8 local_27c8;
  undefined8 uStack_27c0;
  undefined8 local_27b8;
  undefined8 uStack_27b0;
  undefined8 local_27a8;
  undefined8 uStack_27a0;
  float local_2798;
  float fStack_2794;
  float fStack_2790;
  float fStack_278c;
  undefined8 local_2788;
  undefined8 uStack_2780;
  undefined8 local_2778;
  undefined8 uStack_2770;
  undefined8 local_2768;
  undefined8 uStack_2760;
  undefined8 local_2758;
  undefined8 uStack_2750;
  undefined8 local_2748;
  undefined8 uStack_2740;
  undefined8 local_2738;
  undefined8 uStack_2730;
  float local_2728;
  float fStack_2724;
  float fStack_2720;
  float fStack_271c;
  undefined8 local_2718;
  undefined8 uStack_2710;
  undefined8 local_2708;
  undefined8 uStack_2700;
  undefined8 local_26f8;
  undefined8 uStack_26f0;
  undefined8 local_26e8;
  undefined8 uStack_26e0;
  undefined8 local_26d8;
  undefined8 uStack_26d0;
  undefined8 local_26c8;
  undefined8 uStack_26c0;
  float local_26b8;
  float fStack_26b4;
  float fStack_26b0;
  float fStack_26ac;
  undefined8 local_26a8;
  undefined8 uStack_26a0;
  undefined8 local_2698;
  undefined8 uStack_2690;
  undefined8 local_2688;
  undefined8 uStack_2680;
  undefined8 local_2678;
  undefined8 uStack_2670;
  undefined8 local_2668;
  undefined8 uStack_2660;
  undefined8 local_2658;
  undefined8 uStack_2650;
  float local_2648;
  float fStack_2644;
  float fStack_2640;
  float fStack_263c;
  undefined8 local_2638;
  undefined8 uStack_2630;
  undefined8 local_2628;
  undefined8 uStack_2620;
  undefined8 local_2618;
  undefined8 uStack_2610;
  undefined8 local_2608;
  undefined8 uStack_2600;
  undefined8 local_25f8;
  undefined8 uStack_25f0;
  undefined8 local_25e8;
  undefined8 uStack_25e0;
  float local_25d8;
  float fStack_25d4;
  float fStack_25d0;
  float fStack_25cc;
  undefined8 local_25c8;
  undefined8 uStack_25c0;
  undefined8 local_25b8;
  undefined8 uStack_25b0;
  undefined8 local_25a8;
  undefined8 uStack_25a0;
  undefined8 local_2598;
  undefined8 uStack_2590;
  undefined8 local_2588;
  undefined8 uStack_2580;
  undefined8 local_2578;
  undefined8 uStack_2570;
  float local_2568;
  float fStack_2564;
  float fStack_2560;
  float fStack_255c;
  undefined8 local_2558;
  undefined8 uStack_2550;
  undefined8 local_2548;
  undefined8 uStack_2540;
  undefined8 local_2538;
  undefined8 uStack_2530;
  undefined8 local_2528;
  undefined8 uStack_2520;
  undefined8 local_2518;
  undefined8 uStack_2510;
  undefined8 local_2508;
  undefined8 uStack_2500;
  float local_24f8;
  float fStack_24f4;
  float fStack_24f0;
  float fStack_24ec;
  undefined8 local_24e8;
  undefined8 uStack_24e0;
  undefined8 local_24d8;
  undefined8 uStack_24d0;
  undefined8 local_24c8;
  undefined8 uStack_24c0;
  undefined8 local_24b8;
  undefined8 uStack_24b0;
  undefined8 local_24a8;
  undefined8 uStack_24a0;
  undefined8 local_2498;
  undefined8 uStack_2490;
  float local_2488;
  float fStack_2484;
  float fStack_2480;
  float fStack_247c;
  undefined8 local_2478;
  undefined8 uStack_2470;
  undefined8 local_2468;
  undefined8 uStack_2460;
  undefined8 local_2458;
  undefined8 uStack_2450;
  undefined8 local_2448;
  undefined8 uStack_2440;
  undefined8 local_2438;
  undefined8 uStack_2430;
  undefined8 local_2428;
  undefined8 uStack_2420;
  float local_2418;
  float fStack_2414;
  float fStack_2410;
  float fStack_240c;
  undefined8 local_2408;
  undefined8 uStack_2400;
  undefined8 local_23f8;
  undefined8 uStack_23f0;
  undefined8 local_23e8;
  undefined8 uStack_23e0;
  undefined8 local_23d8;
  undefined8 uStack_23d0;
  undefined8 local_23c8;
  undefined8 uStack_23c0;
  undefined8 local_23b8;
  undefined8 uStack_23b0;
  float local_23a8;
  float fStack_23a4;
  float fStack_23a0;
  float fStack_239c;
  undefined8 local_2398;
  undefined8 uStack_2390;
  undefined8 local_2388;
  undefined8 uStack_2380;
  undefined8 local_2378;
  undefined8 uStack_2370;
  undefined8 local_2368;
  undefined8 uStack_2360;
  undefined8 local_2358;
  undefined8 uStack_2350;
  undefined8 local_2348;
  undefined8 uStack_2340;
  float local_2338;
  float fStack_2334;
  float fStack_2330;
  float fStack_232c;
  undefined8 local_2328;
  undefined8 uStack_2320;
  undefined8 local_2318;
  undefined8 uStack_2310;
  undefined8 local_2308;
  undefined8 uStack_2300;
  undefined8 local_22f8;
  undefined8 uStack_22f0;
  undefined8 local_22e8;
  undefined8 uStack_22e0;
  undefined8 local_22d8;
  undefined8 uStack_22d0;
  float local_22c8;
  float fStack_22c4;
  float fStack_22c0;
  float fStack_22bc;
  undefined8 local_22b8;
  undefined8 uStack_22b0;
  undefined8 local_22a8;
  undefined8 uStack_22a0;
  undefined8 local_2298;
  undefined8 uStack_2290;
  undefined8 local_2288;
  undefined8 uStack_2280;
  undefined8 local_2278;
  undefined8 uStack_2270;
  undefined8 local_2268;
  undefined8 uStack_2260;
  float local_2258;
  float fStack_2254;
  float fStack_2250;
  float fStack_224c;
  undefined8 local_2248;
  undefined8 uStack_2240;
  undefined8 local_2238;
  undefined8 uStack_2230;
  undefined8 local_2228;
  undefined8 uStack_2220;
  undefined8 local_2218;
  undefined8 uStack_2210;
  undefined8 local_2208;
  undefined8 uStack_2200;
  undefined8 local_21f8;
  undefined8 uStack_21f0;
  float local_21e8;
  float fStack_21e4;
  float fStack_21e0;
  float fStack_21dc;
  undefined8 local_21d8;
  undefined8 uStack_21d0;
  undefined8 local_21c8;
  undefined8 uStack_21c0;
  undefined8 local_21b8;
  undefined8 uStack_21b0;
  undefined8 local_21a8;
  undefined8 uStack_21a0;
  undefined8 local_2198;
  undefined8 uStack_2190;
  undefined8 local_2188;
  undefined8 uStack_2180;
  float local_2178;
  float fStack_2174;
  float fStack_2170;
  float fStack_216c;
  undefined8 local_2168;
  undefined8 uStack_2160;
  undefined8 local_2158;
  undefined8 uStack_2150;
  undefined8 local_2148;
  undefined8 uStack_2140;
  undefined8 local_2138;
  undefined8 uStack_2130;
  undefined8 local_2128;
  undefined8 uStack_2120;
  undefined8 local_2118;
  undefined8 uStack_2110;
  float local_2108;
  float fStack_2104;
  float fStack_2100;
  float fStack_20fc;
  undefined8 local_20f8;
  undefined8 uStack_20f0;
  undefined8 local_20e8;
  undefined8 uStack_20e0;
  undefined8 local_20d8;
  undefined8 uStack_20d0;
  undefined8 local_20c8;
  undefined8 uStack_20c0;
  undefined8 local_20b8;
  undefined8 uStack_20b0;
  undefined8 local_20a8;
  undefined8 uStack_20a0;
  float local_2098;
  float fStack_2094;
  float fStack_2090;
  float fStack_208c;
  undefined8 local_2088;
  undefined8 uStack_2080;
  undefined8 local_2078;
  undefined8 uStack_2070;
  undefined8 local_2068;
  undefined8 uStack_2060;
  undefined8 local_2058;
  undefined8 uStack_2050;
  undefined8 local_2048;
  undefined8 uStack_2040;
  undefined8 local_2038;
  undefined8 uStack_2030;
  float local_2028;
  float fStack_2024;
  float fStack_2020;
  float fStack_201c;
  undefined8 local_2018;
  undefined8 uStack_2010;
  undefined8 local_2008;
  undefined8 uStack_2000;
  undefined8 local_1ff8;
  undefined8 uStack_1ff0;
  undefined8 local_1fe8;
  undefined8 uStack_1fe0;
  undefined8 local_1fd8;
  undefined8 uStack_1fd0;
  undefined8 local_1fc8;
  undefined8 uStack_1fc0;
  float local_1fb8;
  float fStack_1fb4;
  float fStack_1fb0;
  float fStack_1fac;
  undefined8 local_1fa8;
  undefined8 uStack_1fa0;
  undefined8 local_1f98;
  undefined8 uStack_1f90;
  undefined8 local_1f88;
  undefined8 uStack_1f80;
  undefined8 local_1f78;
  undefined8 uStack_1f70;
  undefined8 local_1f68;
  undefined8 uStack_1f60;
  undefined8 local_1f58;
  undefined8 uStack_1f50;
  undefined1 local_1f48 [16];
  undefined8 local_1f38;
  undefined8 uStack_1f30;
  undefined8 local_1f28;
  undefined8 uStack_1f20;
  undefined8 local_1f18;
  undefined8 uStack_1f10;
  undefined8 local_1f08;
  undefined8 uStack_1f00;
  undefined8 local_1ef8;
  undefined8 uStack_1ef0;
  undefined8 local_1ee8;
  undefined8 uStack_1ee0;
  float local_1ed8;
  float fStack_1ed4;
  float fStack_1ed0;
  float fStack_1ecc;
  undefined8 local_1ec8;
  undefined8 uStack_1ec0;
  undefined8 local_1eb8;
  undefined8 uStack_1eb0;
  undefined8 local_1ea8;
  undefined8 uStack_1ea0;
  undefined8 local_1e98;
  undefined8 uStack_1e90;
  undefined8 local_1e88;
  undefined8 uStack_1e80;
  undefined8 local_1e78;
  undefined8 uStack_1e70;
  float local_1e68;
  float fStack_1e64;
  float fStack_1e60;
  float fStack_1e5c;
  undefined8 local_1e58;
  undefined8 uStack_1e50;
  undefined8 local_1e48;
  undefined8 uStack_1e40;
  undefined8 local_1e38;
  undefined8 uStack_1e30;
  undefined8 local_1e28;
  undefined8 uStack_1e20;
  undefined8 local_1e18;
  undefined8 uStack_1e10;
  undefined8 local_1e08;
  undefined8 uStack_1e00;
  float local_1df8;
  float fStack_1df4;
  float fStack_1df0;
  float fStack_1dec;
  undefined8 local_1de8;
  undefined8 uStack_1de0;
  undefined8 local_1dd8;
  undefined8 uStack_1dd0;
  undefined8 local_1dc8;
  undefined8 uStack_1dc0;
  undefined8 local_1db8;
  undefined8 uStack_1db0;
  undefined8 local_1da8;
  undefined8 uStack_1da0;
  undefined8 local_1d98;
  undefined8 uStack_1d90;
  float local_1d88;
  float fStack_1d84;
  float fStack_1d80;
  float fStack_1d7c;
  undefined8 local_1d78;
  undefined8 uStack_1d70;
  undefined8 local_1d68;
  undefined8 uStack_1d60;
  undefined8 local_1d58;
  undefined8 uStack_1d50;
  undefined8 local_1d48;
  undefined8 uStack_1d40;
  undefined8 local_1d38;
  undefined8 uStack_1d30;
  undefined8 local_1d28;
  undefined8 uStack_1d20;
  float local_1d18;
  float fStack_1d14;
  float fStack_1d10;
  float fStack_1d0c;
  undefined8 local_1d08;
  undefined8 uStack_1d00;
  undefined8 local_1cf8;
  undefined8 uStack_1cf0;
  undefined8 local_1ce8;
  undefined8 uStack_1ce0;
  undefined8 local_1cd8;
  undefined8 uStack_1cd0;
  undefined8 local_1cc8;
  undefined8 uStack_1cc0;
  undefined8 local_1cb8;
  undefined8 uStack_1cb0;
  float local_1ca8;
  float fStack_1ca4;
  float fStack_1ca0;
  float fStack_1c9c;
  undefined8 local_1c98;
  undefined8 uStack_1c90;
  undefined8 local_1c88;
  undefined8 uStack_1c80;
  undefined8 local_1c78;
  undefined8 uStack_1c70;
  undefined8 local_1c68;
  undefined8 uStack_1c60;
  undefined8 local_1c58;
  undefined8 uStack_1c50;
  undefined8 local_1c48;
  undefined8 uStack_1c40;
  float local_1c38;
  float fStack_1c34;
  float fStack_1c30;
  float fStack_1c2c;
  undefined8 local_1c28;
  undefined8 uStack_1c20;
  undefined8 local_1c18;
  undefined8 uStack_1c10;
  undefined8 local_1c08;
  undefined8 uStack_1c00;
  undefined8 local_1bf8;
  undefined8 uStack_1bf0;
  undefined8 local_1be8;
  undefined8 uStack_1be0;
  undefined8 local_1bd8;
  undefined8 uStack_1bd0;
  float local_1bc8;
  float fStack_1bc4;
  float fStack_1bc0;
  float fStack_1bbc;
  undefined8 local_1bb8;
  undefined8 uStack_1bb0;
  undefined8 local_1ba8;
  undefined8 uStack_1ba0;
  undefined8 local_1b98;
  undefined8 uStack_1b90;
  undefined8 local_1b88;
  undefined8 uStack_1b80;
  undefined8 local_1b78;
  undefined8 uStack_1b70;
  undefined8 local_1b68;
  undefined8 uStack_1b60;
  float local_1b58;
  float fStack_1b54;
  float fStack_1b50;
  float fStack_1b4c;
  undefined8 local_1b48;
  undefined8 uStack_1b40;
  undefined8 local_1b38;
  undefined8 uStack_1b30;
  undefined8 local_1b28;
  undefined8 uStack_1b20;
  undefined8 local_1b18;
  undefined8 uStack_1b10;
  undefined8 local_1b08;
  undefined8 uStack_1b00;
  undefined8 local_1af8;
  undefined8 uStack_1af0;
  float local_1ae8;
  float fStack_1ae4;
  float fStack_1ae0;
  float fStack_1adc;
  undefined8 local_1ad8;
  undefined8 uStack_1ad0;
  undefined8 local_1ac8;
  undefined8 uStack_1ac0;
  undefined8 local_1ab8;
  undefined8 uStack_1ab0;
  undefined8 local_1aa8;
  undefined8 uStack_1aa0;
  undefined8 local_1a98;
  undefined8 uStack_1a90;
  undefined8 local_1a88;
  undefined8 uStack_1a80;
  float local_1a78;
  float fStack_1a74;
  float fStack_1a70;
  float fStack_1a6c;
  undefined8 local_1a68;
  undefined8 uStack_1a60;
  undefined8 local_1a58;
  undefined8 uStack_1a50;
  undefined8 local_1a48;
  undefined8 uStack_1a40;
  undefined8 local_1a38;
  undefined8 uStack_1a30;
  undefined8 local_1a28;
  undefined8 uStack_1a20;
  undefined8 local_1a18;
  undefined8 uStack_1a10;
  float local_1a08;
  float fStack_1a04;
  float fStack_1a00;
  float fStack_19fc;
  undefined8 local_19f8;
  undefined8 uStack_19f0;
  undefined8 local_19e8;
  undefined8 uStack_19e0;
  undefined8 local_19d8;
  undefined8 uStack_19d0;
  undefined8 local_19c8;
  undefined8 uStack_19c0;
  undefined8 local_19b8;
  undefined8 uStack_19b0;
  undefined8 local_19a8;
  undefined8 uStack_19a0;
  float local_1998;
  float fStack_1994;
  float fStack_1990;
  float fStack_198c;
  undefined8 local_1988;
  undefined8 uStack_1980;
  undefined8 local_1978;
  undefined8 uStack_1970;
  undefined8 local_1968;
  undefined8 uStack_1960;
  undefined8 local_1958;
  undefined8 uStack_1950;
  undefined8 local_1948;
  undefined8 uStack_1940;
  undefined8 local_1938;
  undefined8 uStack_1930;
  float local_1928;
  float fStack_1924;
  float fStack_1920;
  float fStack_191c;
  undefined8 local_1918;
  undefined8 uStack_1910;
  undefined8 local_1908;
  undefined8 uStack_1900;
  undefined8 local_18f8;
  undefined8 uStack_18f0;
  undefined8 local_18e8;
  undefined8 uStack_18e0;
  undefined8 local_18d8;
  undefined8 uStack_18d0;
  undefined8 local_18c8;
  undefined8 uStack_18c0;
  float local_18b8;
  float fStack_18b4;
  float fStack_18b0;
  float fStack_18ac;
  undefined8 local_18a8;
  undefined8 uStack_18a0;
  undefined8 local_1898;
  undefined8 uStack_1890;
  undefined8 local_1888;
  undefined8 uStack_1880;
  undefined8 local_1878;
  undefined8 uStack_1870;
  undefined8 local_1868;
  undefined8 uStack_1860;
  undefined8 local_1858;
  undefined8 uStack_1850;
  float local_1848;
  float fStack_1844;
  float fStack_1840;
  float fStack_183c;
  undefined8 local_1838;
  undefined8 uStack_1830;
  undefined8 local_1828;
  undefined8 uStack_1820;
  undefined8 local_1818;
  undefined8 uStack_1810;
  undefined8 local_1808;
  undefined8 uStack_1800;
  undefined8 local_17f8;
  undefined8 uStack_17f0;
  undefined8 local_17e8;
  undefined8 uStack_17e0;
  float local_17d8;
  float fStack_17d4;
  float fStack_17d0;
  float fStack_17cc;
  undefined8 local_17c8;
  undefined8 uStack_17c0;
  undefined8 local_17b8;
  undefined8 uStack_17b0;
  undefined8 local_17a8;
  undefined8 uStack_17a0;
  undefined8 local_1798;
  undefined8 uStack_1790;
  undefined8 local_1788;
  undefined8 uStack_1780;
  undefined8 local_1778;
  undefined8 uStack_1770;
  float local_1768;
  float fStack_1764;
  float fStack_1760;
  float fStack_175c;
  undefined8 local_1758;
  undefined8 uStack_1750;
  undefined8 local_1748;
  undefined8 uStack_1740;
  undefined8 local_1738;
  undefined8 uStack_1730;
  undefined8 local_1728;
  undefined8 uStack_1720;
  undefined8 local_1718;
  undefined8 uStack_1710;
  undefined8 local_1708;
  undefined8 uStack_1700;
  float local_16f8;
  float fStack_16f4;
  float fStack_16f0;
  float fStack_16ec;
  undefined8 local_16e8;
  undefined8 uStack_16e0;
  undefined8 local_16d8;
  undefined8 uStack_16d0;
  undefined8 local_16c8;
  undefined8 uStack_16c0;
  undefined8 local_16b8;
  undefined8 uStack_16b0;
  undefined8 local_16a8;
  undefined8 uStack_16a0;
  undefined8 local_1698;
  undefined8 uStack_1690;
  float local_1688;
  float fStack_1684;
  float fStack_1680;
  float fStack_167c;
  undefined8 local_1678;
  undefined8 uStack_1670;
  undefined8 local_1668;
  undefined8 uStack_1660;
  undefined8 local_1658;
  undefined8 uStack_1650;
  undefined8 local_1648;
  undefined8 uStack_1640;
  undefined8 local_1638;
  undefined8 uStack_1630;
  undefined8 local_1628;
  undefined8 uStack_1620;
  float local_1618;
  float fStack_1614;
  float fStack_1610;
  float fStack_160c;
  undefined8 local_1608;
  undefined8 uStack_1600;
  undefined8 local_15f8;
  undefined8 uStack_15f0;
  undefined8 local_15e8;
  undefined8 uStack_15e0;
  undefined8 local_15d8;
  undefined8 uStack_15d0;
  undefined8 local_15c8;
  undefined8 uStack_15c0;
  undefined8 local_15b8;
  undefined8 uStack_15b0;
  float local_15a8;
  float fStack_15a4;
  float fStack_15a0;
  float fStack_159c;
  undefined8 local_1598;
  undefined8 uStack_1590;
  undefined8 local_1588;
  undefined8 uStack_1580;
  undefined8 local_1578;
  undefined8 uStack_1570;
  undefined8 local_1568;
  undefined8 uStack_1560;
  undefined8 local_1558;
  undefined8 uStack_1550;
  undefined8 local_1548;
  undefined8 uStack_1540;
  float local_1538;
  float fStack_1534;
  float fStack_1530;
  float fStack_152c;
  undefined8 local_1528;
  undefined8 uStack_1520;
  undefined8 local_1518;
  undefined8 uStack_1510;
  undefined8 local_1508;
  undefined8 uStack_1500;
  undefined8 local_14f8;
  undefined8 uStack_14f0;
  undefined8 local_14e8;
  undefined8 uStack_14e0;
  undefined8 local_14d8;
  undefined8 uStack_14d0;
  float local_14c8;
  float fStack_14c4;
  float fStack_14c0;
  float fStack_14bc;
  undefined8 local_14b8;
  undefined8 uStack_14b0;
  undefined8 local_14a8;
  undefined8 uStack_14a0;
  undefined8 local_1498;
  undefined8 uStack_1490;
  undefined8 local_1488;
  undefined8 uStack_1480;
  undefined8 local_1478;
  undefined8 uStack_1470;
  undefined8 local_1468;
  undefined8 uStack_1460;
  float local_1458;
  float fStack_1454;
  float fStack_1450;
  float fStack_144c;
  undefined8 local_1448;
  undefined8 uStack_1440;
  undefined8 local_1438;
  undefined8 uStack_1430;
  undefined8 local_1428;
  undefined8 uStack_1420;
  undefined8 local_1418;
  undefined8 uStack_1410;
  undefined8 local_1408;
  undefined8 uStack_1400;
  undefined8 local_13f8;
  undefined8 uStack_13f0;
  float local_13e8;
  float fStack_13e4;
  float fStack_13e0;
  float fStack_13dc;
  undefined8 local_13d8;
  undefined8 uStack_13d0;
  undefined8 local_13c8;
  undefined8 uStack_13c0;
  undefined8 local_13b8;
  undefined8 uStack_13b0;
  undefined8 local_13a8;
  undefined8 uStack_13a0;
  undefined8 local_1398;
  undefined8 uStack_1390;
  undefined8 local_1388;
  undefined8 uStack_1380;
  float local_1378;
  float fStack_1374;
  float fStack_1370;
  float fStack_136c;
  undefined8 local_1368;
  undefined8 uStack_1360;
  undefined8 local_1358;
  undefined8 uStack_1350;
  undefined8 local_1348;
  undefined8 uStack_1340;
  undefined8 local_1338;
  undefined8 uStack_1330;
  undefined8 local_1328;
  undefined8 uStack_1320;
  undefined8 local_1318;
  undefined8 uStack_1310;
  float local_1308;
  float fStack_1304;
  float fStack_1300;
  float fStack_12fc;
  undefined8 local_12f8;
  undefined8 uStack_12f0;
  undefined8 local_12e8;
  undefined8 uStack_12e0;
  undefined8 local_12d8;
  undefined8 uStack_12d0;
  undefined8 local_12c8;
  undefined8 uStack_12c0;
  undefined8 local_12b8;
  undefined8 uStack_12b0;
  undefined8 local_12a8;
  undefined8 uStack_12a0;
  float local_1298;
  float fStack_1294;
  float fStack_1290;
  float fStack_128c;
  undefined8 local_1288;
  undefined8 uStack_1280;
  undefined8 local_1278;
  undefined8 uStack_1270;
  undefined8 local_1268;
  undefined8 uStack_1260;
  undefined8 local_1258;
  undefined8 uStack_1250;
  undefined8 local_1248;
  undefined8 uStack_1240;
  undefined8 local_1238;
  undefined8 uStack_1230;
  float local_1228;
  float fStack_1224;
  float fStack_1220;
  float fStack_121c;
  undefined8 local_1218;
  undefined8 uStack_1210;
  undefined8 local_1208;
  undefined8 uStack_1200;
  undefined8 local_11f8;
  undefined8 uStack_11f0;
  undefined8 local_11e8;
  undefined8 uStack_11e0;
  undefined8 local_11d8;
  undefined8 uStack_11d0;
  undefined8 local_11c8;
  undefined8 uStack_11c0;
  float local_11b8;
  float fStack_11b4;
  float fStack_11b0;
  float fStack_11ac;
  undefined8 local_11a8;
  undefined8 uStack_11a0;
  undefined8 local_1198;
  undefined8 uStack_1190;
  undefined8 local_1188;
  undefined8 uStack_1180;
  undefined8 local_1178;
  undefined8 uStack_1170;
  undefined8 local_1168;
  undefined8 uStack_1160;
  undefined8 local_1158;
  undefined8 uStack_1150;
  float local_1148;
  float fStack_1144;
  float fStack_1140;
  float fStack_113c;
  undefined8 local_1138;
  undefined8 uStack_1130;
  undefined8 local_1128;
  undefined8 uStack_1120;
  undefined8 local_1118;
  undefined8 uStack_1110;
  undefined8 local_1108;
  undefined8 uStack_1100;
  undefined8 local_10f8;
  undefined8 uStack_10f0;
  undefined8 local_10e8;
  undefined8 uStack_10e0;
  float local_10d8;
  float fStack_10d4;
  float fStack_10d0;
  float fStack_10cc;
  undefined8 local_10c8;
  undefined8 uStack_10c0;
  undefined8 local_10b8;
  undefined8 uStack_10b0;
  undefined8 local_10a8;
  undefined8 uStack_10a0;
  undefined8 local_1098;
  undefined8 uStack_1090;
  undefined8 local_1088;
  undefined8 uStack_1080;
  undefined8 local_1078;
  undefined8 uStack_1070;
  float local_1068;
  float fStack_1064;
  float fStack_1060;
  float fStack_105c;
  undefined8 local_1058;
  undefined8 uStack_1050;
  undefined8 local_1048;
  undefined8 uStack_1040;
  undefined8 local_1038;
  undefined8 uStack_1030;
  undefined8 local_1028;
  undefined8 uStack_1020;
  undefined8 local_1018;
  undefined8 uStack_1010;
  undefined8 local_1008;
  undefined8 uStack_1000;
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  undefined8 local_fe8;
  undefined8 uStack_fe0;
  undefined8 local_fd8;
  undefined8 uStack_fd0;
  undefined8 local_fc8;
  undefined8 uStack_fc0;
  undefined8 local_fb8;
  undefined8 uStack_fb0;
  undefined8 local_fa8;
  undefined8 uStack_fa0;
  undefined8 local_f98;
  undefined8 uStack_f90;
  float local_f88;
  float fStack_f84;
  float fStack_f80;
  float fStack_f7c;
  undefined8 local_f78;
  undefined8 uStack_f70;
  undefined8 local_f68;
  undefined8 uStack_f60;
  undefined8 local_f58;
  undefined8 uStack_f50;
  undefined8 local_f48;
  undefined8 uStack_f40;
  undefined8 local_f38;
  undefined8 uStack_f30;
  undefined8 local_f28;
  undefined8 uStack_f20;
  float local_f18;
  float fStack_f14;
  float fStack_f10;
  float fStack_f0c;
  undefined8 local_f08;
  undefined8 uStack_f00;
  undefined8 local_ef8;
  undefined8 uStack_ef0;
  undefined8 local_ee8;
  undefined8 uStack_ee0;
  undefined8 local_ed8;
  undefined8 uStack_ed0;
  undefined8 local_ec8;
  undefined8 uStack_ec0;
  undefined8 local_eb8;
  undefined8 uStack_eb0;
  float local_ea8;
  float fStack_ea4;
  float fStack_ea0;
  float fStack_e9c;
  undefined8 local_e98;
  undefined8 uStack_e90;
  undefined8 local_e88;
  undefined8 uStack_e80;
  undefined8 local_e78;
  undefined8 uStack_e70;
  undefined8 local_e68;
  undefined8 uStack_e60;
  undefined8 local_e58;
  undefined8 uStack_e50;
  undefined8 local_e48;
  undefined8 uStack_e40;
  float local_e38;
  float fStack_e34;
  float fStack_e30;
  float fStack_e2c;
  undefined8 local_e28;
  undefined8 uStack_e20;
  undefined8 local_e18;
  undefined8 uStack_e10;
  undefined8 local_e08;
  undefined8 uStack_e00;
  undefined8 local_df8;
  undefined8 uStack_df0;
  undefined8 local_de8;
  undefined8 uStack_de0;
  undefined8 local_dd8;
  undefined8 uStack_dd0;
  float local_dc8;
  float fStack_dc4;
  float fStack_dc0;
  float fStack_dbc;
  undefined8 local_db8;
  undefined8 uStack_db0;
  undefined8 local_da8;
  undefined8 uStack_da0;
  undefined8 local_d98;
  undefined8 uStack_d90;
  undefined8 local_d88;
  undefined8 uStack_d80;
  undefined8 local_d78;
  undefined8 uStack_d70;
  undefined8 local_d68;
  undefined8 uStack_d60;
  float local_d58;
  float fStack_d54;
  float fStack_d50;
  float fStack_d4c;
  undefined8 local_d48;
  undefined8 uStack_d40;
  undefined8 local_d38;
  undefined8 uStack_d30;
  undefined8 local_d28;
  undefined8 uStack_d20;
  undefined8 local_d18;
  undefined8 uStack_d10;
  undefined8 local_d08;
  undefined8 uStack_d00;
  undefined8 local_cf8;
  undefined8 uStack_cf0;
  float local_ce8;
  float fStack_ce4;
  float fStack_ce0;
  float fStack_cdc;
  undefined8 local_cd8;
  undefined8 uStack_cd0;
  undefined8 local_cc8;
  undefined8 uStack_cc0;
  undefined8 local_cb8;
  undefined8 uStack_cb0;
  undefined8 local_ca8;
  undefined8 uStack_ca0;
  undefined8 local_c98;
  undefined8 uStack_c90;
  undefined8 local_c88;
  undefined8 uStack_c80;
  float local_c78;
  float fStack_c74;
  float fStack_c70;
  float fStack_c6c;
  undefined8 local_c68;
  undefined8 uStack_c60;
  undefined8 local_c58;
  undefined8 uStack_c50;
  undefined8 local_c48;
  undefined8 uStack_c40;
  undefined8 local_c38;
  undefined8 uStack_c30;
  undefined8 local_c28;
  undefined8 uStack_c20;
  undefined8 local_c18;
  undefined8 uStack_c10;
  float local_c08;
  float fStack_c04;
  float fStack_c00;
  float fStack_bfc;
  undefined8 local_bf8;
  undefined8 uStack_bf0;
  undefined8 local_be8;
  undefined8 uStack_be0;
  undefined8 local_bd8;
  undefined8 uStack_bd0;
  undefined8 local_bc8;
  undefined8 uStack_bc0;
  undefined8 local_bb8;
  undefined8 uStack_bb0;
  undefined8 local_ba8;
  undefined8 uStack_ba0;
  float local_b98;
  float fStack_b94;
  float fStack_b90;
  float fStack_b8c;
  undefined8 local_b88;
  undefined8 uStack_b80;
  undefined8 local_b78;
  undefined8 uStack_b70;
  undefined8 local_b68;
  undefined8 uStack_b60;
  undefined8 local_b58;
  undefined8 uStack_b50;
  undefined8 local_b48;
  undefined8 uStack_b40;
  undefined8 local_b38;
  undefined8 uStack_b30;
  float local_b28;
  float fStack_b24;
  float fStack_b20;
  float fStack_b1c;
  undefined8 local_b18;
  undefined8 uStack_b10;
  undefined8 local_b08;
  undefined8 uStack_b00;
  undefined8 local_af8;
  undefined8 uStack_af0;
  undefined8 local_ae8;
  undefined8 uStack_ae0;
  undefined8 local_ad8;
  undefined8 uStack_ad0;
  undefined8 local_ac8;
  undefined8 uStack_ac0;
  float local_ab8;
  float fStack_ab4;
  float fStack_ab0;
  float fStack_aac;
  undefined8 local_aa8;
  undefined8 uStack_aa0;
  undefined8 local_a98;
  undefined8 uStack_a90;
  undefined8 local_a88;
  undefined8 uStack_a80;
  undefined8 local_a78;
  undefined8 uStack_a70;
  undefined8 local_a68;
  undefined8 uStack_a60;
  undefined8 local_a58;
  undefined8 uStack_a50;
  float local_a48;
  float fStack_a44;
  float fStack_a40;
  float fStack_a3c;
  undefined8 local_a38;
  undefined8 uStack_a30;
  undefined8 local_a28;
  undefined8 uStack_a20;
  undefined8 local_a18;
  undefined8 uStack_a10;
  undefined8 local_a08;
  undefined8 uStack_a00;
  undefined8 local_9f8;
  undefined8 uStack_9f0;
  undefined8 local_9e8;
  undefined8 uStack_9e0;
  float local_9d8;
  float fStack_9d4;
  float fStack_9d0;
  float fStack_9cc;
  undefined8 local_9c8;
  undefined8 uStack_9c0;
  undefined8 local_9b8;
  undefined8 uStack_9b0;
  undefined8 local_9a8;
  undefined8 uStack_9a0;
  undefined8 local_998;
  undefined8 uStack_990;
  undefined8 local_988;
  undefined8 uStack_980;
  undefined8 local_978;
  undefined8 uStack_970;
  float local_968;
  float fStack_964;
  float fStack_960;
  float fStack_95c;
  undefined8 local_958;
  undefined8 uStack_950;
  undefined8 local_948;
  undefined8 uStack_940;
  undefined8 local_938;
  undefined8 uStack_930;
  undefined8 local_928;
  undefined8 uStack_920;
  undefined8 local_918;
  undefined8 uStack_910;
  undefined8 local_908;
  undefined8 uStack_900;
  float local_8f8;
  float fStack_8f4;
  float fStack_8f0;
  float fStack_8ec;
  undefined8 local_8e8;
  undefined8 uStack_8e0;
  undefined8 local_8d8;
  undefined8 uStack_8d0;
  undefined8 local_8c8;
  undefined8 uStack_8c0;
  undefined8 local_8b8;
  undefined8 uStack_8b0;
  undefined8 local_8a8;
  undefined8 uStack_8a0;
  undefined8 local_898;
  undefined8 uStack_890;
  float local_888;
  float fStack_884;
  float fStack_880;
  float fStack_87c;
  undefined8 local_878;
  undefined8 uStack_870;
  undefined8 local_868;
  undefined8 uStack_860;
  undefined8 local_858;
  undefined8 uStack_850;
  undefined8 local_848;
  undefined8 uStack_840;
  undefined8 local_838;
  undefined8 uStack_830;
  undefined8 local_828;
  undefined8 uStack_820;
  float local_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  undefined8 local_808;
  undefined8 uStack_800;
  undefined8 local_7f8;
  undefined8 uStack_7f0;
  undefined8 local_7e8;
  undefined8 uStack_7e0;
  undefined8 local_7d8;
  undefined8 uStack_7d0;
  undefined8 local_7c8;
  undefined8 uStack_7c0;
  undefined8 local_7b8;
  undefined8 uStack_7b0;
  float local_7a8;
  float fStack_7a4;
  float fStack_7a0;
  float fStack_79c;
  undefined8 local_798;
  undefined8 uStack_790;
  undefined8 local_788;
  undefined8 uStack_780;
  undefined8 local_778;
  undefined8 uStack_770;
  undefined8 local_768;
  undefined8 uStack_760;
  undefined8 local_758;
  undefined8 uStack_750;
  undefined8 local_748;
  undefined8 uStack_740;
  float local_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  undefined8 local_728;
  undefined8 uStack_720;
  undefined8 local_718;
  undefined8 uStack_710;
  undefined8 local_708;
  undefined8 uStack_700;
  undefined8 local_6f8;
  undefined8 uStack_6f0;
  undefined8 local_6e8;
  undefined8 uStack_6e0;
  undefined8 local_6d8;
  undefined8 uStack_6d0;
  float local_6c8;
  float fStack_6c4;
  float fStack_6c0;
  float fStack_6bc;
  undefined8 local_6b8;
  undefined8 uStack_6b0;
  undefined8 local_6a8;
  undefined8 uStack_6a0;
  undefined8 local_698;
  undefined8 uStack_690;
  undefined8 local_688;
  undefined8 uStack_680;
  undefined8 local_678;
  undefined8 uStack_670;
  undefined8 local_668;
  undefined8 uStack_660;
  float local_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  undefined8 local_648;
  undefined8 uStack_640;
  undefined8 local_638;
  undefined8 uStack_630;
  undefined8 local_628;
  undefined8 uStack_620;
  undefined8 local_618;
  undefined8 uStack_610;
  undefined8 local_608;
  undefined8 uStack_600;
  undefined8 local_5f8;
  undefined8 uStack_5f0;
  float local_5e8;
  float fStack_5e4;
  float fStack_5e0;
  float fStack_5dc;
  undefined8 local_5d8;
  undefined8 uStack_5d0;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  undefined8 local_5b8;
  undefined8 uStack_5b0;
  undefined8 local_5a8;
  undefined8 uStack_5a0;
  undefined8 local_598;
  undefined8 uStack_590;
  undefined8 local_588;
  undefined8 uStack_580;
  float local_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  undefined8 local_568;
  undefined8 uStack_560;
  undefined8 local_558;
  undefined8 uStack_550;
  undefined8 local_548;
  undefined8 uStack_540;
  undefined8 local_538;
  undefined8 uStack_530;
  undefined8 local_528;
  undefined8 uStack_520;
  undefined8 local_518;
  undefined8 uStack_510;
  float local_508;
  float fStack_504;
  float fStack_500;
  float fStack_4fc;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  float local_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  undefined8 local_488;
  undefined8 uStack_480;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 local_438;
  undefined8 uStack_430;
  float local_428;
  float fStack_424;
  float fStack_420;
  float fStack_41c;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  float local_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 local_358;
  undefined8 uStack_350;
  float local_348;
  float fStack_344;
  float fStack_340;
  float fStack_33c;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  float local_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  float local_38;
  float fStack_34;
  float fStack_30;
  float fStack_2c;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_3fb4 = *(int *)(in_RSI + 0x2c);
  local_3fb8 = *(int *)(in_RSI + 0x30);
  local_3fbc = *(int *)(in_RDI + 0x38);
  local_3fa0 = in_RDX;
  local_3fc8 = Mat::operator_cast_to_float_(in_RCX);
  for (local_3fcc = 0; local_3fcc < local_3fbc; local_3fcc = local_3fcc + 1) {
    Mat::channel((Mat *)CONCAT44(in_stack_ffffffffffffac2c,in_stack_ffffffffffffac28),
                 (int)in_stack_ffffffffffffac24);
    if (local_3fc8 == (float *)0x0) {
      local_3f74 = 0;
      local_3f88 = 0;
      uStack_3f84 = 0;
      uStack_3f80 = 0;
      uStack_3f7c = 0;
      local_46a8 = 0;
      uStack_46a0 = 0;
    }
    else {
      local_3d00 = local_3fc8 + (local_3fcc << 2);
      local_46a8 = *(undefined8 *)local_3d00;
      uStack_46a0 = *(undefined8 *)(local_3d00 + 2);
    }
    local_4028 = local_46a8;
    uStack_4020 = uStack_46a0;
    local_4040 = Mat::row(local_3fa0,local_3fcc);
    local_4048 = Mat::row(&local_4018,0);
    Mat::channel((Mat *)CONCAT44(in_stack_ffffffffffffac2c,in_stack_ffffffffffffac28),
                 (int)in_stack_ffffffffffffac24);
    local_4098 = Mat::row(&local_4090,0);
    local_40a0 = Mat::row(&local_4090,1);
    local_40a8 = Mat::row(&local_4090,2);
    local_3d08 = local_4040;
    uVar1 = *(undefined8 *)local_4040;
    uVar2 = *(undefined8 *)(local_4040 + 2);
    local_3d10 = local_4040 + 4;
    uVar3 = *(undefined8 *)local_3d10;
    uVar4 = *(undefined8 *)(local_4040 + 6);
    local_3d18 = local_4040 + 8;
    uVar5 = *(undefined8 *)local_3d18;
    uVar6 = *(undefined8 *)(local_4040 + 10);
    local_3d20 = local_4040 + 0xc;
    uVar7 = *(undefined8 *)local_3d20;
    uVar8 = *(undefined8 *)(local_4040 + 0xe);
    local_3d28 = local_4040 + 0x10;
    uVar9 = *(undefined8 *)local_3d28;
    uVar10 = *(undefined8 *)(local_4040 + 0x12);
    local_3d30 = local_4040 + 0x14;
    uVar11 = *(undefined8 *)local_3d30;
    uVar12 = *(undefined8 *)(local_4040 + 0x16);
    local_3d38 = local_4040 + 0x18;
    uVar13 = *(undefined8 *)local_3d38;
    uVar14 = *(undefined8 *)(local_4040 + 0x1a);
    local_3d40 = local_4040 + 0x1c;
    uVar15 = *(undefined8 *)local_3d40;
    uVar16 = *(undefined8 *)(local_4040 + 0x1e);
    local_3d48 = local_4040 + 0x20;
    uVar17 = *(undefined8 *)local_3d48;
    uVar18 = *(undefined8 *)(local_4040 + 0x22);
    for (local_413c = 0; local_413c < local_3fb8; local_413c = local_413c + 1) {
      local_4140 = 0;
      while( true ) {
        uVar38 = uStack_10;
        uVar37 = local_18;
        uVar36 = uStack_40;
        uVar35 = local_48;
        uVar34 = uStack_80;
        uVar33 = local_88;
        uVar32 = uStack_f0;
        uVar31 = local_f8;
        uVar30 = uStack_160;
        uVar29 = local_168;
        uVar28 = uStack_1d0;
        uVar27 = local_1d8;
        uVar26 = uStack_240;
        uVar25 = local_248;
        uVar24 = uStack_2b0;
        uVar23 = local_2b8;
        uVar22 = uStack_320;
        uVar21 = local_328;
        uVar20 = uStack_390;
        uVar19 = local_398;
        local_18._0_4_ = (float)uVar1;
        local_18._4_4_ = (float)((ulong)uVar1 >> 0x20);
        uStack_10._0_4_ = (float)uVar2;
        uStack_10._4_4_ = (float)((ulong)uVar2 >> 0x20);
        local_48._0_4_ = (float)local_4028;
        local_48._4_4_ = (float)((ulong)local_4028 >> 0x20);
        uStack_40._0_4_ = (float)uStack_4020;
        uStack_40._4_4_ = (float)((ulong)uStack_4020 >> 0x20);
        local_88._0_4_ = (float)uVar3;
        local_88._4_4_ = (float)((ulong)uVar3 >> 0x20);
        uStack_80._0_4_ = (float)uVar4;
        uStack_80._4_4_ = (float)((ulong)uVar4 >> 0x20);
        local_f8._0_4_ = (float)uVar5;
        local_f8._4_4_ = (float)((ulong)uVar5 >> 0x20);
        uStack_f0._0_4_ = (float)uVar6;
        uStack_f0._4_4_ = (float)((ulong)uVar6 >> 0x20);
        local_168._0_4_ = (float)uVar7;
        local_168._4_4_ = (float)((ulong)uVar7 >> 0x20);
        uStack_160._0_4_ = (float)uVar8;
        uStack_160._4_4_ = (float)((ulong)uVar8 >> 0x20);
        local_1d8._0_4_ = (float)uVar9;
        local_1d8._4_4_ = (float)((ulong)uVar9 >> 0x20);
        uStack_1d0._0_4_ = (float)uVar10;
        uStack_1d0._4_4_ = (float)((ulong)uVar10 >> 0x20);
        local_248._0_4_ = (float)uVar11;
        local_248._4_4_ = (float)((ulong)uVar11 >> 0x20);
        uStack_240._0_4_ = (float)uVar12;
        uStack_240._4_4_ = (float)((ulong)uVar12 >> 0x20);
        local_2b8._0_4_ = (float)uVar13;
        local_2b8._4_4_ = (float)((ulong)uVar13 >> 0x20);
        uStack_2b0._0_4_ = (float)uVar14;
        uStack_2b0._4_4_ = (float)((ulong)uVar14 >> 0x20);
        local_328._0_4_ = (float)uVar15;
        local_328._4_4_ = (float)((ulong)uVar15 >> 0x20);
        uStack_320._0_4_ = (float)uVar16;
        uStack_320._4_4_ = (float)((ulong)uVar16 >> 0x20);
        local_398._0_4_ = (float)uVar17;
        local_398._4_4_ = (float)((ulong)uVar17 >> 0x20);
        uStack_390._0_4_ = (float)uVar18;
        uStack_390._4_4_ = (float)((ulong)uVar18 >> 0x20);
        if (local_3fb4 <= local_4140 + 7) break;
        local_3d50 = local_4098;
        local_68 = *(undefined8 *)local_4098;
        uStack_60 = *(undefined8 *)(local_4098 + 2);
        local_3d58 = local_4098 + 4;
        local_458 = *(undefined8 *)local_3d58;
        uStack_450 = *(undefined8 *)(local_4098 + 6);
        local_3d60 = local_4098 + 8;
        local_848 = *(undefined8 *)local_3d60;
        uStack_840 = *(undefined8 *)(local_4098 + 10);
        local_3d68 = local_40a0;
        local_1b8 = *(undefined8 *)local_40a0;
        uStack_1b0 = *(undefined8 *)(local_40a0 + 2);
        local_3d70 = local_40a0 + 4;
        local_5a8 = *(undefined8 *)local_3d70;
        uStack_5a0 = *(undefined8 *)(local_40a0 + 6);
        local_3d78 = local_40a0 + 8;
        local_998 = *(undefined8 *)local_3d78;
        uStack_990 = *(undefined8 *)(local_40a0 + 10);
        local_3d80 = local_40a8;
        local_308 = *(undefined8 *)local_40a8;
        uStack_300 = *(undefined8 *)(local_40a8 + 2);
        local_3d88 = local_40a8 + 4;
        local_6f8 = *(undefined8 *)local_3d88;
        uStack_6f0 = *(undefined8 *)(local_40a8 + 6);
        local_3d90 = local_40a8 + 8;
        local_ae8 = *(undefined8 *)local_3d90;
        uStack_ae0 = *(undefined8 *)(local_40a8 + 10);
        local_78 = local_4028;
        uStack_70 = uStack_4020;
        local_28._0_4_ = (float)local_68;
        local_28._4_4_ = (float)((ulong)local_68 >> 0x20);
        uStack_20._0_4_ = (float)uStack_60;
        uStack_20._4_4_ = (float)((ulong)uStack_60 >> 0x20);
        local_38 = (float)local_18 * (float)local_28;
        fStack_34 = local_18._4_4_ * local_28._4_4_;
        fStack_30 = (float)uStack_10 * (float)uStack_20;
        fStack_2c = uStack_10._4_4_ * uStack_20._4_4_;
        local_e8 = CONCAT44(fStack_34 + local_48._4_4_,local_38 + (float)local_48);
        uStack_e0 = CONCAT44(fStack_2c + uStack_40._4_4_,fStack_30 + (float)uStack_40);
        local_98._0_4_ = (float)local_458;
        local_98._4_4_ = (float)((ulong)local_458 >> 0x20);
        uStack_90._0_4_ = (float)uStack_450;
        uStack_90._4_4_ = (float)((ulong)uStack_450 >> 0x20);
        local_a8 = (float)local_88 * (float)local_98;
        fStack_a4 = local_88._4_4_ * local_98._4_4_;
        fStack_a0 = (float)uStack_80 * (float)uStack_90;
        fStack_9c = uStack_80._4_4_ * uStack_90._4_4_;
        fVar39 = local_a8 + local_38 + (float)local_48;
        fVar40 = fStack_a4 + fStack_34 + local_48._4_4_;
        fVar41 = fStack_a0 + fStack_30 + (float)uStack_40;
        fVar42 = fStack_9c + fStack_2c + uStack_40._4_4_;
        local_158 = CONCAT44(fVar40,fVar39);
        uStack_150 = CONCAT44(fVar42,fVar41);
        local_108._0_4_ = (float)local_848;
        local_108._4_4_ = (float)((ulong)local_848 >> 0x20);
        uStack_100._0_4_ = (float)uStack_840;
        uStack_100._4_4_ = (float)((ulong)uStack_840 >> 0x20);
        local_118 = (float)local_f8 * (float)local_108;
        fStack_114 = local_f8._4_4_ * local_108._4_4_;
        fStack_110 = (float)uStack_f0 * (float)uStack_100;
        fStack_10c = uStack_f0._4_4_ * uStack_100._4_4_;
        fVar39 = local_118 + fVar39;
        fVar40 = fStack_114 + fVar40;
        fVar41 = fStack_110 + fVar41;
        fVar42 = fStack_10c + fVar42;
        local_1c8 = CONCAT44(fVar40,fVar39);
        uStack_1c0 = CONCAT44(fVar42,fVar41);
        local_178._0_4_ = (float)local_1b8;
        local_178._4_4_ = (float)((ulong)local_1b8 >> 0x20);
        uStack_170._0_4_ = (float)uStack_1b0;
        uStack_170._4_4_ = (float)((ulong)uStack_1b0 >> 0x20);
        local_188 = (float)local_168 * (float)local_178;
        fStack_184 = local_168._4_4_ * local_178._4_4_;
        fStack_180 = (float)uStack_160 * (float)uStack_170;
        fStack_17c = uStack_160._4_4_ * uStack_170._4_4_;
        fVar39 = local_188 + fVar39;
        fVar40 = fStack_184 + fVar40;
        fVar41 = fStack_180 + fVar41;
        fVar42 = fStack_17c + fVar42;
        local_238 = CONCAT44(fVar40,fVar39);
        uStack_230 = CONCAT44(fVar42,fVar41);
        local_1e8._0_4_ = (float)local_5a8;
        local_1e8._4_4_ = (float)((ulong)local_5a8 >> 0x20);
        uStack_1e0._0_4_ = (float)uStack_5a0;
        uStack_1e0._4_4_ = (float)((ulong)uStack_5a0 >> 0x20);
        local_1f8 = (float)local_1d8 * (float)local_1e8;
        fStack_1f4 = local_1d8._4_4_ * local_1e8._4_4_;
        fStack_1f0 = (float)uStack_1d0 * (float)uStack_1e0;
        fStack_1ec = uStack_1d0._4_4_ * uStack_1e0._4_4_;
        fVar39 = local_1f8 + fVar39;
        fVar40 = fStack_1f4 + fVar40;
        fVar41 = fStack_1f0 + fVar41;
        fVar42 = fStack_1ec + fVar42;
        local_2a8 = CONCAT44(fVar40,fVar39);
        uStack_2a0 = CONCAT44(fVar42,fVar41);
        local_258._0_4_ = (float)local_998;
        local_258._4_4_ = (float)((ulong)local_998 >> 0x20);
        uStack_250._0_4_ = (float)uStack_990;
        uStack_250._4_4_ = (float)((ulong)uStack_990 >> 0x20);
        local_268 = (float)local_248 * (float)local_258;
        fStack_264 = local_248._4_4_ * local_258._4_4_;
        fStack_260 = (float)uStack_240 * (float)uStack_250;
        fStack_25c = uStack_240._4_4_ * uStack_250._4_4_;
        fVar39 = local_268 + fVar39;
        fVar40 = fStack_264 + fVar40;
        fVar41 = fStack_260 + fVar41;
        fVar42 = fStack_25c + fVar42;
        local_318 = CONCAT44(fVar40,fVar39);
        uStack_310 = CONCAT44(fVar42,fVar41);
        local_2c8._0_4_ = (float)local_308;
        local_2c8._4_4_ = (float)((ulong)local_308 >> 0x20);
        uStack_2c0._0_4_ = (float)uStack_300;
        uStack_2c0._4_4_ = (float)((ulong)uStack_300 >> 0x20);
        local_2d8 = (float)local_2b8 * (float)local_2c8;
        fStack_2d4 = local_2b8._4_4_ * local_2c8._4_4_;
        fStack_2d0 = (float)uStack_2b0 * (float)uStack_2c0;
        fStack_2cc = uStack_2b0._4_4_ * uStack_2c0._4_4_;
        fVar39 = local_2d8 + fVar39;
        fVar40 = fStack_2d4 + fVar40;
        fVar41 = fStack_2d0 + fVar41;
        fVar42 = fStack_2cc + fVar42;
        local_388 = CONCAT44(fVar40,fVar39);
        uStack_380 = CONCAT44(fVar42,fVar41);
        local_338._0_4_ = (float)local_6f8;
        local_338._4_4_ = (float)((ulong)local_6f8 >> 0x20);
        uStack_330._0_4_ = (float)uStack_6f0;
        uStack_330._4_4_ = (float)((ulong)uStack_6f0 >> 0x20);
        local_348 = (float)local_328 * (float)local_338;
        fStack_344 = local_328._4_4_ * local_338._4_4_;
        fStack_340 = (float)uStack_320 * (float)uStack_330;
        fStack_33c = uStack_320._4_4_ * uStack_330._4_4_;
        fVar39 = local_348 + fVar39;
        fVar40 = fStack_344 + fVar40;
        fVar41 = fStack_340 + fVar41;
        fVar42 = fStack_33c + fVar42;
        local_3f8 = CONCAT44(fVar40,fVar39);
        uStack_3f0 = CONCAT44(fVar42,fVar41);
        local_3a8._0_4_ = (float)local_ae8;
        local_3a8._4_4_ = (float)((ulong)local_ae8 >> 0x20);
        uStack_3a0._0_4_ = (float)uStack_ae0;
        uStack_3a0._4_4_ = (float)((ulong)uStack_ae0 >> 0x20);
        local_3b8 = (float)local_398 * (float)local_3a8;
        fStack_3b4 = local_398._4_4_ * local_3a8._4_4_;
        fStack_3b0 = (float)uStack_390 * (float)uStack_3a0;
        fStack_3ac = uStack_390._4_4_ * uStack_3a0._4_4_;
        local_3b38 = CONCAT44(fStack_3b4 + fVar40,local_3b8 + fVar39);
        uStack_3b30 = CONCAT44(fStack_3ac + fVar42,fStack_3b0 + fVar41);
        local_3d98 = local_4098 + 0xc;
        local_c38 = *(undefined8 *)local_3d98;
        uStack_c30 = *(undefined8 *)(local_4098 + 0xe);
        local_3da0 = local_40a0 + 0xc;
        local_d88 = *(undefined8 *)local_3da0;
        uStack_d80 = *(undefined8 *)(local_40a0 + 0xe);
        local_3da8 = local_40a8 + 0xc;
        local_ed8 = *(undefined8 *)local_3da8;
        uStack_ed0 = *(undefined8 *)(local_40a8 + 0xe);
        local_3b20 = local_4048;
        *(undefined8 *)local_4048 = local_3b38;
        *(undefined8 *)(local_4048 + 2) = uStack_3b30;
        local_468 = local_4028;
        uStack_460 = uStack_4020;
        local_428 = (float)local_18 * (float)local_98;
        fStack_424 = local_18._4_4_ * local_98._4_4_;
        fStack_420 = (float)uStack_10 * (float)uStack_90;
        fStack_41c = uStack_10._4_4_ * uStack_90._4_4_;
        local_438 = local_4028;
        uStack_430 = uStack_4020;
        local_4d8 = CONCAT44(fStack_424 + local_48._4_4_,local_428 + (float)local_48);
        uStack_4d0 = CONCAT44(fStack_41c + uStack_40._4_4_,fStack_420 + (float)uStack_40);
        local_498 = (float)local_88 * (float)local_108;
        fStack_494 = local_88._4_4_ * local_108._4_4_;
        fStack_490 = (float)uStack_80 * (float)uStack_100;
        fStack_48c = uStack_80._4_4_ * uStack_100._4_4_;
        fVar39 = local_498 + local_428 + (float)local_48;
        fVar40 = fStack_494 + fStack_424 + local_48._4_4_;
        fVar41 = fStack_490 + fStack_420 + (float)uStack_40;
        fVar42 = fStack_48c + fStack_41c + uStack_40._4_4_;
        local_548 = CONCAT44(fVar40,fVar39);
        uStack_540 = CONCAT44(fVar42,fVar41);
        local_4f8._0_4_ = (float)local_c38;
        local_4f8._4_4_ = (float)((ulong)local_c38 >> 0x20);
        uStack_4f0._0_4_ = (float)uStack_c30;
        uStack_4f0._4_4_ = (float)((ulong)uStack_c30 >> 0x20);
        local_508 = (float)local_f8 * (float)local_4f8;
        fStack_504 = local_f8._4_4_ * local_4f8._4_4_;
        fStack_500 = (float)uStack_f0 * (float)uStack_4f0;
        fStack_4fc = uStack_f0._4_4_ * uStack_4f0._4_4_;
        fVar39 = local_508 + fVar39;
        fVar40 = fStack_504 + fVar40;
        fVar41 = fStack_500 + fVar41;
        fVar42 = fStack_4fc + fVar42;
        local_5b8 = CONCAT44(fVar40,fVar39);
        uStack_5b0 = CONCAT44(fVar42,fVar41);
        local_578 = (float)local_168 * (float)local_1e8;
        fStack_574 = local_168._4_4_ * local_1e8._4_4_;
        fStack_570 = (float)uStack_160 * (float)uStack_1e0;
        fStack_56c = uStack_160._4_4_ * uStack_1e0._4_4_;
        fVar39 = local_578 + fVar39;
        fVar40 = fStack_574 + fVar40;
        fVar41 = fStack_570 + fVar41;
        fVar42 = fStack_56c + fVar42;
        local_628 = CONCAT44(fVar40,fVar39);
        uStack_620 = CONCAT44(fVar42,fVar41);
        local_5e8 = (float)local_1d8 * (float)local_258;
        fStack_5e4 = local_1d8._4_4_ * local_258._4_4_;
        fStack_5e0 = (float)uStack_1d0 * (float)uStack_250;
        fStack_5dc = uStack_1d0._4_4_ * uStack_250._4_4_;
        fVar39 = local_5e8 + fVar39;
        fVar40 = fStack_5e4 + fVar40;
        fVar41 = fStack_5e0 + fVar41;
        fVar42 = fStack_5dc + fVar42;
        local_698 = CONCAT44(fVar40,fVar39);
        uStack_690 = CONCAT44(fVar42,fVar41);
        local_648._0_4_ = (float)local_d88;
        local_648._4_4_ = (float)((ulong)local_d88 >> 0x20);
        uStack_640._0_4_ = (float)uStack_d80;
        uStack_640._4_4_ = (float)((ulong)uStack_d80 >> 0x20);
        local_658 = (float)local_248 * (float)local_648;
        fStack_654 = local_248._4_4_ * local_648._4_4_;
        fStack_650 = (float)uStack_240 * (float)uStack_640;
        fStack_64c = uStack_240._4_4_ * uStack_640._4_4_;
        fVar39 = local_658 + fVar39;
        fVar40 = fStack_654 + fVar40;
        fVar41 = fStack_650 + fVar41;
        fVar42 = fStack_64c + fVar42;
        local_708 = CONCAT44(fVar40,fVar39);
        uStack_700 = CONCAT44(fVar42,fVar41);
        local_6c8 = (float)local_2b8 * (float)local_338;
        fStack_6c4 = local_2b8._4_4_ * local_338._4_4_;
        fStack_6c0 = (float)uStack_2b0 * (float)uStack_330;
        fStack_6bc = uStack_2b0._4_4_ * uStack_330._4_4_;
        fVar39 = local_6c8 + fVar39;
        fVar40 = fStack_6c4 + fVar40;
        fVar41 = fStack_6c0 + fVar41;
        fVar42 = fStack_6bc + fVar42;
        local_778 = CONCAT44(fVar40,fVar39);
        uStack_770 = CONCAT44(fVar42,fVar41);
        local_738 = (float)local_328 * (float)local_3a8;
        fStack_734 = local_328._4_4_ * local_3a8._4_4_;
        fStack_730 = (float)uStack_320 * (float)uStack_3a0;
        fStack_72c = uStack_320._4_4_ * uStack_3a0._4_4_;
        fVar39 = local_738 + fVar39;
        fVar40 = fStack_734 + fVar40;
        fVar41 = fStack_730 + fVar41;
        fVar42 = fStack_72c + fVar42;
        local_7e8 = CONCAT44(fVar40,fVar39);
        uStack_7e0 = CONCAT44(fVar42,fVar41);
        local_798._0_4_ = (float)local_ed8;
        local_798._4_4_ = (float)((ulong)local_ed8 >> 0x20);
        uStack_790._0_4_ = (float)uStack_ed0;
        uStack_790._4_4_ = (float)((ulong)uStack_ed0 >> 0x20);
        local_7a8 = (float)local_398 * (float)local_798;
        fStack_7a4 = local_398._4_4_ * local_798._4_4_;
        fStack_7a0 = (float)uStack_390 * (float)uStack_790;
        fStack_79c = uStack_390._4_4_ * uStack_790._4_4_;
        local_3b58 = CONCAT44(fStack_7a4 + fVar40,local_7a8 + fVar39);
        uStack_3b50 = CONCAT44(fStack_79c + fVar42,fStack_7a0 + fVar41);
        local_3db0 = local_4098 + 0x10;
        local_1028 = *(undefined8 *)local_3db0;
        uStack_1020 = *(undefined8 *)(local_4098 + 0x12);
        local_3db8 = local_40a0 + 0x10;
        local_1178 = *(undefined8 *)local_3db8;
        uStack_1170 = *(undefined8 *)(local_40a0 + 0x12);
        local_3dc0 = local_40a8 + 0x10;
        local_12c8 = *(undefined8 *)local_3dc0;
        uStack_12c0 = *(undefined8 *)(local_40a8 + 0x12);
        local_3b40 = local_4048 + 4;
        *(undefined8 *)local_3b40 = local_3b58;
        *(undefined8 *)(local_4048 + 6) = uStack_3b50;
        local_858 = local_4028;
        uStack_850 = uStack_4020;
        local_818 = (float)local_18 * (float)local_108;
        fStack_814 = local_18._4_4_ * local_108._4_4_;
        fStack_810 = (float)uStack_10 * (float)uStack_100;
        fStack_80c = uStack_10._4_4_ * uStack_100._4_4_;
        local_828 = local_4028;
        uStack_820 = uStack_4020;
        local_8c8 = CONCAT44(fStack_814 + local_48._4_4_,local_818 + (float)local_48);
        uStack_8c0 = CONCAT44(fStack_80c + uStack_40._4_4_,fStack_810 + (float)uStack_40);
        local_888 = (float)local_88 * (float)local_4f8;
        fStack_884 = local_88._4_4_ * local_4f8._4_4_;
        fStack_880 = (float)uStack_80 * (float)uStack_4f0;
        fStack_87c = uStack_80._4_4_ * uStack_4f0._4_4_;
        fVar39 = local_888 + local_818 + (float)local_48;
        fVar40 = fStack_884 + fStack_814 + local_48._4_4_;
        fVar41 = fStack_880 + fStack_810 + (float)uStack_40;
        fVar42 = fStack_87c + fStack_80c + uStack_40._4_4_;
        local_938 = CONCAT44(fVar40,fVar39);
        uStack_930 = CONCAT44(fVar42,fVar41);
        local_8e8._0_4_ = (float)local_1028;
        local_8e8._4_4_ = (float)((ulong)local_1028 >> 0x20);
        uStack_8e0._0_4_ = (float)uStack_1020;
        uStack_8e0._4_4_ = (float)((ulong)uStack_1020 >> 0x20);
        local_8f8 = (float)local_f8 * (float)local_8e8;
        fStack_8f4 = local_f8._4_4_ * local_8e8._4_4_;
        fStack_8f0 = (float)uStack_f0 * (float)uStack_8e0;
        fStack_8ec = uStack_f0._4_4_ * uStack_8e0._4_4_;
        fVar39 = local_8f8 + fVar39;
        fVar40 = fStack_8f4 + fVar40;
        fVar41 = fStack_8f0 + fVar41;
        fVar42 = fStack_8ec + fVar42;
        local_9a8 = CONCAT44(fVar40,fVar39);
        uStack_9a0 = CONCAT44(fVar42,fVar41);
        local_968 = (float)local_168 * (float)local_258;
        fStack_964 = local_168._4_4_ * local_258._4_4_;
        fStack_960 = (float)uStack_160 * (float)uStack_250;
        fStack_95c = uStack_160._4_4_ * uStack_250._4_4_;
        fVar39 = local_968 + fVar39;
        fVar40 = fStack_964 + fVar40;
        fVar41 = fStack_960 + fVar41;
        fVar42 = fStack_95c + fVar42;
        local_a18 = CONCAT44(fVar40,fVar39);
        uStack_a10 = CONCAT44(fVar42,fVar41);
        local_9d8 = (float)local_1d8 * (float)local_648;
        fStack_9d4 = local_1d8._4_4_ * local_648._4_4_;
        fStack_9d0 = (float)uStack_1d0 * (float)uStack_640;
        fStack_9cc = uStack_1d0._4_4_ * uStack_640._4_4_;
        fVar39 = local_9d8 + fVar39;
        fVar40 = fStack_9d4 + fVar40;
        fVar41 = fStack_9d0 + fVar41;
        fVar42 = fStack_9cc + fVar42;
        local_a88 = CONCAT44(fVar40,fVar39);
        uStack_a80 = CONCAT44(fVar42,fVar41);
        local_a38._0_4_ = (float)local_1178;
        local_a38._4_4_ = (float)((ulong)local_1178 >> 0x20);
        uStack_a30._0_4_ = (float)uStack_1170;
        uStack_a30._4_4_ = (float)((ulong)uStack_1170 >> 0x20);
        local_a48 = (float)local_248 * (float)local_a38;
        fStack_a44 = local_248._4_4_ * local_a38._4_4_;
        fStack_a40 = (float)uStack_240 * (float)uStack_a30;
        fStack_a3c = uStack_240._4_4_ * uStack_a30._4_4_;
        fVar39 = local_a48 + fVar39;
        fVar40 = fStack_a44 + fVar40;
        fVar41 = fStack_a40 + fVar41;
        fVar42 = fStack_a3c + fVar42;
        local_af8 = CONCAT44(fVar40,fVar39);
        uStack_af0 = CONCAT44(fVar42,fVar41);
        local_ab8 = (float)local_2b8 * (float)local_3a8;
        fStack_ab4 = local_2b8._4_4_ * local_3a8._4_4_;
        fStack_ab0 = (float)uStack_2b0 * (float)uStack_3a0;
        fStack_aac = uStack_2b0._4_4_ * uStack_3a0._4_4_;
        fVar39 = local_ab8 + fVar39;
        fVar40 = fStack_ab4 + fVar40;
        fVar41 = fStack_ab0 + fVar41;
        fVar42 = fStack_aac + fVar42;
        local_b68 = CONCAT44(fVar40,fVar39);
        uStack_b60 = CONCAT44(fVar42,fVar41);
        local_b28 = (float)local_328 * (float)local_798;
        fStack_b24 = local_328._4_4_ * local_798._4_4_;
        fStack_b20 = (float)uStack_320 * (float)uStack_790;
        fStack_b1c = uStack_320._4_4_ * uStack_790._4_4_;
        fVar39 = local_b28 + fVar39;
        fVar40 = fStack_b24 + fVar40;
        fVar41 = fStack_b20 + fVar41;
        fVar42 = fStack_b1c + fVar42;
        local_bd8 = CONCAT44(fVar40,fVar39);
        uStack_bd0 = CONCAT44(fVar42,fVar41);
        local_b88._0_4_ = (float)local_12c8;
        local_b88._4_4_ = (float)((ulong)local_12c8 >> 0x20);
        uStack_b80._0_4_ = (float)uStack_12c0;
        uStack_b80._4_4_ = (float)((ulong)uStack_12c0 >> 0x20);
        local_b98 = (float)local_398 * (float)local_b88;
        fStack_b94 = local_398._4_4_ * local_b88._4_4_;
        fStack_b90 = (float)uStack_390 * (float)uStack_b80;
        fStack_b8c = uStack_390._4_4_ * uStack_b80._4_4_;
        local_3b78 = CONCAT44(fStack_b94 + fVar40,local_b98 + fVar39);
        uStack_3b70 = CONCAT44(fStack_b8c + fVar42,fStack_b90 + fVar41);
        local_3dc8 = local_4098 + 0x14;
        local_1418 = *(undefined8 *)local_3dc8;
        uStack_1410 = *(undefined8 *)(local_4098 + 0x16);
        local_3dd0 = local_40a0 + 0x14;
        local_1568 = *(undefined8 *)local_3dd0;
        uStack_1560 = *(undefined8 *)(local_40a0 + 0x16);
        local_3dd8 = local_40a8 + 0x14;
        local_16b8 = *(undefined8 *)local_3dd8;
        uStack_16b0 = *(undefined8 *)(local_40a8 + 0x16);
        local_3b60 = local_4048 + 8;
        *(undefined8 *)local_3b60 = local_3b78;
        *(undefined8 *)(local_4048 + 10) = uStack_3b70;
        local_c48 = local_4028;
        uStack_c40 = uStack_4020;
        local_c08 = (float)local_18 * (float)local_4f8;
        fStack_c04 = local_18._4_4_ * local_4f8._4_4_;
        fStack_c00 = (float)uStack_10 * (float)uStack_4f0;
        fStack_bfc = uStack_10._4_4_ * uStack_4f0._4_4_;
        local_c18 = local_4028;
        uStack_c10 = uStack_4020;
        local_cb8 = CONCAT44(fStack_c04 + local_48._4_4_,local_c08 + (float)local_48);
        uStack_cb0 = CONCAT44(fStack_bfc + uStack_40._4_4_,fStack_c00 + (float)uStack_40);
        local_c78 = (float)local_88 * (float)local_8e8;
        fStack_c74 = local_88._4_4_ * local_8e8._4_4_;
        fStack_c70 = (float)uStack_80 * (float)uStack_8e0;
        fStack_c6c = uStack_80._4_4_ * uStack_8e0._4_4_;
        fVar39 = local_c78 + local_c08 + (float)local_48;
        fVar40 = fStack_c74 + fStack_c04 + local_48._4_4_;
        fVar41 = fStack_c70 + fStack_c00 + (float)uStack_40;
        fVar42 = fStack_c6c + fStack_bfc + uStack_40._4_4_;
        local_d28 = CONCAT44(fVar40,fVar39);
        uStack_d20 = CONCAT44(fVar42,fVar41);
        local_cd8._0_4_ = (float)local_1418;
        local_cd8._4_4_ = (float)((ulong)local_1418 >> 0x20);
        uStack_cd0._0_4_ = (float)uStack_1410;
        uStack_cd0._4_4_ = (float)((ulong)uStack_1410 >> 0x20);
        local_ce8 = (float)local_f8 * (float)local_cd8;
        fStack_ce4 = local_f8._4_4_ * local_cd8._4_4_;
        fStack_ce0 = (float)uStack_f0 * (float)uStack_cd0;
        fStack_cdc = uStack_f0._4_4_ * uStack_cd0._4_4_;
        fVar39 = local_ce8 + fVar39;
        fVar40 = fStack_ce4 + fVar40;
        fVar41 = fStack_ce0 + fVar41;
        fVar42 = fStack_cdc + fVar42;
        local_d98 = CONCAT44(fVar40,fVar39);
        uStack_d90 = CONCAT44(fVar42,fVar41);
        local_d58 = (float)local_168 * (float)local_648;
        fStack_d54 = local_168._4_4_ * local_648._4_4_;
        fStack_d50 = (float)uStack_160 * (float)uStack_640;
        fStack_d4c = uStack_160._4_4_ * uStack_640._4_4_;
        fVar39 = local_d58 + fVar39;
        fVar40 = fStack_d54 + fVar40;
        fVar41 = fStack_d50 + fVar41;
        fVar42 = fStack_d4c + fVar42;
        local_e08 = CONCAT44(fVar40,fVar39);
        uStack_e00 = CONCAT44(fVar42,fVar41);
        local_dc8 = (float)local_1d8 * (float)local_a38;
        fStack_dc4 = local_1d8._4_4_ * local_a38._4_4_;
        fStack_dc0 = (float)uStack_1d0 * (float)uStack_a30;
        fStack_dbc = uStack_1d0._4_4_ * uStack_a30._4_4_;
        fVar39 = local_dc8 + fVar39;
        fVar40 = fStack_dc4 + fVar40;
        fVar41 = fStack_dc0 + fVar41;
        fVar42 = fStack_dbc + fVar42;
        local_e78 = CONCAT44(fVar40,fVar39);
        uStack_e70 = CONCAT44(fVar42,fVar41);
        local_e28._0_4_ = (float)local_1568;
        local_e28._4_4_ = (float)((ulong)local_1568 >> 0x20);
        uStack_e20._0_4_ = (float)uStack_1560;
        uStack_e20._4_4_ = (float)((ulong)uStack_1560 >> 0x20);
        local_e38 = (float)local_248 * (float)local_e28;
        fStack_e34 = local_248._4_4_ * local_e28._4_4_;
        fStack_e30 = (float)uStack_240 * (float)uStack_e20;
        fStack_e2c = uStack_240._4_4_ * uStack_e20._4_4_;
        fVar39 = local_e38 + fVar39;
        fVar40 = fStack_e34 + fVar40;
        fVar41 = fStack_e30 + fVar41;
        fVar42 = fStack_e2c + fVar42;
        local_ee8 = CONCAT44(fVar40,fVar39);
        uStack_ee0 = CONCAT44(fVar42,fVar41);
        local_ea8 = (float)local_2b8 * (float)local_798;
        fStack_ea4 = local_2b8._4_4_ * local_798._4_4_;
        fStack_ea0 = (float)uStack_2b0 * (float)uStack_790;
        fStack_e9c = uStack_2b0._4_4_ * uStack_790._4_4_;
        fVar39 = local_ea8 + fVar39;
        fVar40 = fStack_ea4 + fVar40;
        fVar41 = fStack_ea0 + fVar41;
        fVar42 = fStack_e9c + fVar42;
        local_f58 = CONCAT44(fVar40,fVar39);
        uStack_f50 = CONCAT44(fVar42,fVar41);
        local_f18 = (float)local_328 * (float)local_b88;
        fStack_f14 = local_328._4_4_ * local_b88._4_4_;
        fStack_f10 = (float)uStack_320 * (float)uStack_b80;
        fStack_f0c = uStack_320._4_4_ * uStack_b80._4_4_;
        fVar39 = local_f18 + fVar39;
        fVar40 = fStack_f14 + fVar40;
        fVar41 = fStack_f10 + fVar41;
        fVar42 = fStack_f0c + fVar42;
        local_fc8 = CONCAT44(fVar40,fVar39);
        uStack_fc0 = CONCAT44(fVar42,fVar41);
        local_f78._0_4_ = (float)local_16b8;
        local_f78._4_4_ = (float)((ulong)local_16b8 >> 0x20);
        uStack_f70._0_4_ = (float)uStack_16b0;
        uStack_f70._4_4_ = (float)((ulong)uStack_16b0 >> 0x20);
        local_f88 = (float)local_398 * (float)local_f78;
        fStack_f84 = local_398._4_4_ * local_f78._4_4_;
        fStack_f80 = (float)uStack_390 * (float)uStack_f70;
        fStack_f7c = uStack_390._4_4_ * uStack_f70._4_4_;
        local_3b98 = CONCAT44(fStack_f84 + fVar40,local_f88 + fVar39);
        uStack_3b90 = CONCAT44(fStack_f7c + fVar42,fStack_f80 + fVar41);
        local_3de0 = local_4098 + 0x18;
        local_1808 = *(undefined8 *)local_3de0;
        uStack_1800 = *(undefined8 *)(local_4098 + 0x1a);
        local_3de8 = local_40a0 + 0x18;
        local_1958 = *(undefined8 *)local_3de8;
        uStack_1950 = *(undefined8 *)(local_40a0 + 0x1a);
        local_3df0 = local_40a8 + 0x18;
        local_1aa8 = *(undefined8 *)local_3df0;
        uStack_1aa0 = *(undefined8 *)(local_40a8 + 0x1a);
        local_3b80 = local_4048 + 0xc;
        *(undefined8 *)local_3b80 = local_3b98;
        *(undefined8 *)(local_4048 + 0xe) = uStack_3b90;
        local_1038 = local_4028;
        uStack_1030 = uStack_4020;
        local_ff8 = (float)local_18 * (float)local_8e8;
        fStack_ff4 = local_18._4_4_ * local_8e8._4_4_;
        fStack_ff0 = (float)uStack_10 * (float)uStack_8e0;
        fStack_fec = uStack_10._4_4_ * uStack_8e0._4_4_;
        local_1008 = local_4028;
        uStack_1000 = uStack_4020;
        local_10a8 = CONCAT44(fStack_ff4 + local_48._4_4_,local_ff8 + (float)local_48);
        uStack_10a0 = CONCAT44(fStack_fec + uStack_40._4_4_,fStack_ff0 + (float)uStack_40);
        local_1068 = (float)local_88 * (float)local_cd8;
        fStack_1064 = local_88._4_4_ * local_cd8._4_4_;
        fStack_1060 = (float)uStack_80 * (float)uStack_cd0;
        fStack_105c = uStack_80._4_4_ * uStack_cd0._4_4_;
        fVar39 = local_1068 + local_ff8 + (float)local_48;
        fVar40 = fStack_1064 + fStack_ff4 + local_48._4_4_;
        fVar41 = fStack_1060 + fStack_ff0 + (float)uStack_40;
        fVar42 = fStack_105c + fStack_fec + uStack_40._4_4_;
        local_1118 = CONCAT44(fVar40,fVar39);
        uStack_1110 = CONCAT44(fVar42,fVar41);
        local_10c8._0_4_ = (float)local_1808;
        local_10c8._4_4_ = (float)((ulong)local_1808 >> 0x20);
        uStack_10c0._0_4_ = (float)uStack_1800;
        uStack_10c0._4_4_ = (float)((ulong)uStack_1800 >> 0x20);
        local_10d8 = (float)local_f8 * (float)local_10c8;
        fStack_10d4 = local_f8._4_4_ * local_10c8._4_4_;
        fStack_10d0 = (float)uStack_f0 * (float)uStack_10c0;
        fStack_10cc = uStack_f0._4_4_ * uStack_10c0._4_4_;
        fVar39 = local_10d8 + fVar39;
        fVar40 = fStack_10d4 + fVar40;
        fVar41 = fStack_10d0 + fVar41;
        fVar42 = fStack_10cc + fVar42;
        local_1188 = CONCAT44(fVar40,fVar39);
        uStack_1180 = CONCAT44(fVar42,fVar41);
        local_1148 = (float)local_168 * (float)local_a38;
        fStack_1144 = local_168._4_4_ * local_a38._4_4_;
        fStack_1140 = (float)uStack_160 * (float)uStack_a30;
        fStack_113c = uStack_160._4_4_ * uStack_a30._4_4_;
        fVar39 = local_1148 + fVar39;
        fVar40 = fStack_1144 + fVar40;
        fVar41 = fStack_1140 + fVar41;
        fVar42 = fStack_113c + fVar42;
        local_11f8 = CONCAT44(fVar40,fVar39);
        uStack_11f0 = CONCAT44(fVar42,fVar41);
        local_11b8 = (float)local_1d8 * (float)local_e28;
        fStack_11b4 = local_1d8._4_4_ * local_e28._4_4_;
        fStack_11b0 = (float)uStack_1d0 * (float)uStack_e20;
        fStack_11ac = uStack_1d0._4_4_ * uStack_e20._4_4_;
        fVar39 = local_11b8 + fVar39;
        fVar40 = fStack_11b4 + fVar40;
        fVar41 = fStack_11b0 + fVar41;
        fVar42 = fStack_11ac + fVar42;
        local_1268 = CONCAT44(fVar40,fVar39);
        uStack_1260 = CONCAT44(fVar42,fVar41);
        local_1218._0_4_ = (float)local_1958;
        local_1218._4_4_ = (float)((ulong)local_1958 >> 0x20);
        uStack_1210._0_4_ = (float)uStack_1950;
        uStack_1210._4_4_ = (float)((ulong)uStack_1950 >> 0x20);
        local_1228 = (float)local_248 * (float)local_1218;
        fStack_1224 = local_248._4_4_ * local_1218._4_4_;
        fStack_1220 = (float)uStack_240 * (float)uStack_1210;
        fStack_121c = uStack_240._4_4_ * uStack_1210._4_4_;
        fVar39 = local_1228 + fVar39;
        fVar40 = fStack_1224 + fVar40;
        fVar41 = fStack_1220 + fVar41;
        fVar42 = fStack_121c + fVar42;
        local_12d8 = CONCAT44(fVar40,fVar39);
        uStack_12d0 = CONCAT44(fVar42,fVar41);
        local_1298 = (float)local_2b8 * (float)local_b88;
        fStack_1294 = local_2b8._4_4_ * local_b88._4_4_;
        fStack_1290 = (float)uStack_2b0 * (float)uStack_b80;
        fStack_128c = uStack_2b0._4_4_ * uStack_b80._4_4_;
        fVar39 = local_1298 + fVar39;
        fVar40 = fStack_1294 + fVar40;
        fVar41 = fStack_1290 + fVar41;
        fVar42 = fStack_128c + fVar42;
        local_1348 = CONCAT44(fVar40,fVar39);
        uStack_1340 = CONCAT44(fVar42,fVar41);
        local_1308 = (float)local_328 * (float)local_f78;
        fStack_1304 = local_328._4_4_ * local_f78._4_4_;
        fStack_1300 = (float)uStack_320 * (float)uStack_f70;
        fStack_12fc = uStack_320._4_4_ * uStack_f70._4_4_;
        fVar39 = local_1308 + fVar39;
        fVar40 = fStack_1304 + fVar40;
        fVar41 = fStack_1300 + fVar41;
        fVar42 = fStack_12fc + fVar42;
        local_13b8 = CONCAT44(fVar40,fVar39);
        uStack_13b0 = CONCAT44(fVar42,fVar41);
        local_1368._0_4_ = (float)local_1aa8;
        local_1368._4_4_ = (float)((ulong)local_1aa8 >> 0x20);
        uStack_1360._0_4_ = (float)uStack_1aa0;
        uStack_1360._4_4_ = (float)((ulong)uStack_1aa0 >> 0x20);
        local_1378 = (float)local_398 * (float)local_1368;
        fStack_1374 = local_398._4_4_ * local_1368._4_4_;
        fStack_1370 = (float)uStack_390 * (float)uStack_1360;
        fStack_136c = uStack_390._4_4_ * uStack_1360._4_4_;
        local_3bb8 = CONCAT44(fStack_1374 + fVar40,local_1378 + fVar39);
        uStack_3bb0 = CONCAT44(fStack_136c + fVar42,fStack_1370 + fVar41);
        local_3df8 = local_4098 + 0x1c;
        local_1bf8 = *(undefined8 *)local_3df8;
        uStack_1bf0 = *(undefined8 *)(local_4098 + 0x1e);
        local_3e00 = local_40a0 + 0x1c;
        local_1d48 = *(undefined8 *)local_3e00;
        uStack_1d40 = *(undefined8 *)(local_40a0 + 0x1e);
        local_3e08 = local_40a8 + 0x1c;
        local_1e98 = *(undefined8 *)local_3e08;
        uStack_1e90 = *(undefined8 *)(local_40a8 + 0x1e);
        local_3ba0 = local_4048 + 0x10;
        *(undefined8 *)local_3ba0 = local_3bb8;
        *(undefined8 *)(local_4048 + 0x12) = uStack_3bb0;
        local_1428 = local_4028;
        uStack_1420 = uStack_4020;
        local_13e8 = (float)local_18 * (float)local_cd8;
        fStack_13e4 = local_18._4_4_ * local_cd8._4_4_;
        fStack_13e0 = (float)uStack_10 * (float)uStack_cd0;
        fStack_13dc = uStack_10._4_4_ * uStack_cd0._4_4_;
        local_13f8 = local_4028;
        uStack_13f0 = uStack_4020;
        local_1498 = CONCAT44(fStack_13e4 + local_48._4_4_,local_13e8 + (float)local_48);
        uStack_1490 = CONCAT44(fStack_13dc + uStack_40._4_4_,fStack_13e0 + (float)uStack_40);
        local_1458 = (float)local_88 * (float)local_10c8;
        fStack_1454 = local_88._4_4_ * local_10c8._4_4_;
        fStack_1450 = (float)uStack_80 * (float)uStack_10c0;
        fStack_144c = uStack_80._4_4_ * uStack_10c0._4_4_;
        fVar39 = local_1458 + local_13e8 + (float)local_48;
        fVar40 = fStack_1454 + fStack_13e4 + local_48._4_4_;
        fVar41 = fStack_1450 + fStack_13e0 + (float)uStack_40;
        fVar42 = fStack_144c + fStack_13dc + uStack_40._4_4_;
        local_1508 = CONCAT44(fVar40,fVar39);
        uStack_1500 = CONCAT44(fVar42,fVar41);
        local_14b8._0_4_ = (float)local_1bf8;
        local_14b8._4_4_ = (float)((ulong)local_1bf8 >> 0x20);
        uStack_14b0._0_4_ = (float)uStack_1bf0;
        uStack_14b0._4_4_ = (float)((ulong)uStack_1bf0 >> 0x20);
        local_14c8 = (float)local_f8 * (float)local_14b8;
        fStack_14c4 = local_f8._4_4_ * local_14b8._4_4_;
        fStack_14c0 = (float)uStack_f0 * (float)uStack_14b0;
        fStack_14bc = uStack_f0._4_4_ * uStack_14b0._4_4_;
        fVar39 = local_14c8 + fVar39;
        fVar40 = fStack_14c4 + fVar40;
        fVar41 = fStack_14c0 + fVar41;
        fVar42 = fStack_14bc + fVar42;
        local_1578 = CONCAT44(fVar40,fVar39);
        uStack_1570 = CONCAT44(fVar42,fVar41);
        local_1538 = (float)local_168 * (float)local_e28;
        fStack_1534 = local_168._4_4_ * local_e28._4_4_;
        fStack_1530 = (float)uStack_160 * (float)uStack_e20;
        fStack_152c = uStack_160._4_4_ * uStack_e20._4_4_;
        fVar39 = local_1538 + fVar39;
        fVar40 = fStack_1534 + fVar40;
        fVar41 = fStack_1530 + fVar41;
        fVar42 = fStack_152c + fVar42;
        local_15e8 = CONCAT44(fVar40,fVar39);
        uStack_15e0 = CONCAT44(fVar42,fVar41);
        local_15a8 = (float)local_1d8 * (float)local_1218;
        fStack_15a4 = local_1d8._4_4_ * local_1218._4_4_;
        fStack_15a0 = (float)uStack_1d0 * (float)uStack_1210;
        fStack_159c = uStack_1d0._4_4_ * uStack_1210._4_4_;
        fVar39 = local_15a8 + fVar39;
        fVar40 = fStack_15a4 + fVar40;
        fVar41 = fStack_15a0 + fVar41;
        fVar42 = fStack_159c + fVar42;
        local_1658 = CONCAT44(fVar40,fVar39);
        uStack_1650 = CONCAT44(fVar42,fVar41);
        local_1608._0_4_ = (float)local_1d48;
        local_1608._4_4_ = (float)((ulong)local_1d48 >> 0x20);
        uStack_1600._0_4_ = (float)uStack_1d40;
        uStack_1600._4_4_ = (float)((ulong)uStack_1d40 >> 0x20);
        local_1618 = (float)local_248 * (float)local_1608;
        fStack_1614 = local_248._4_4_ * local_1608._4_4_;
        fStack_1610 = (float)uStack_240 * (float)uStack_1600;
        fStack_160c = uStack_240._4_4_ * uStack_1600._4_4_;
        fVar39 = local_1618 + fVar39;
        fVar40 = fStack_1614 + fVar40;
        fVar41 = fStack_1610 + fVar41;
        fVar42 = fStack_160c + fVar42;
        local_16c8 = CONCAT44(fVar40,fVar39);
        uStack_16c0 = CONCAT44(fVar42,fVar41);
        local_1688 = (float)local_2b8 * (float)local_f78;
        fStack_1684 = local_2b8._4_4_ * local_f78._4_4_;
        fStack_1680 = (float)uStack_2b0 * (float)uStack_f70;
        fStack_167c = uStack_2b0._4_4_ * uStack_f70._4_4_;
        fVar39 = local_1688 + fVar39;
        fVar40 = fStack_1684 + fVar40;
        fVar41 = fStack_1680 + fVar41;
        fVar42 = fStack_167c + fVar42;
        local_1738 = CONCAT44(fVar40,fVar39);
        uStack_1730 = CONCAT44(fVar42,fVar41);
        local_16f8 = (float)local_328 * (float)local_1368;
        fStack_16f4 = local_328._4_4_ * local_1368._4_4_;
        fStack_16f0 = (float)uStack_320 * (float)uStack_1360;
        fStack_16ec = uStack_320._4_4_ * uStack_1360._4_4_;
        fVar39 = local_16f8 + fVar39;
        fVar40 = fStack_16f4 + fVar40;
        fVar41 = fStack_16f0 + fVar41;
        fVar42 = fStack_16ec + fVar42;
        local_17a8 = CONCAT44(fVar40,fVar39);
        uStack_17a0 = CONCAT44(fVar42,fVar41);
        local_1758._0_4_ = (float)local_1e98;
        local_1758._4_4_ = (float)((ulong)local_1e98 >> 0x20);
        uStack_1750._0_4_ = (float)uStack_1e90;
        uStack_1750._4_4_ = (float)((ulong)uStack_1e90 >> 0x20);
        local_1768 = (float)local_398 * (float)local_1758;
        fStack_1764 = local_398._4_4_ * local_1758._4_4_;
        fStack_1760 = (float)uStack_390 * (float)uStack_1750;
        fStack_175c = uStack_390._4_4_ * uStack_1750._4_4_;
        local_3bd8 = CONCAT44(fStack_1764 + fVar40,local_1768 + fVar39);
        uStack_3bd0 = CONCAT44(fStack_175c + fVar42,fStack_1760 + fVar41);
        local_3e10 = local_4098 + 0x20;
        local_1c68 = *(undefined8 *)local_3e10;
        uStack_1c60 = *(undefined8 *)(local_4098 + 0x22);
        local_3e18 = local_40a0 + 0x20;
        local_1db8 = *(undefined8 *)local_3e18;
        uStack_1db0 = *(undefined8 *)(local_40a0 + 0x22);
        local_3e20 = local_40a8 + 0x20;
        local_1f08 = *(undefined8 *)local_3e20;
        uStack_1f00 = *(undefined8 *)(local_40a8 + 0x22);
        local_3bc0 = local_4048 + 0x14;
        *(undefined8 *)local_3bc0 = local_3bd8;
        *(undefined8 *)(local_4048 + 0x16) = uStack_3bd0;
        local_1818 = local_4028;
        uStack_1810 = uStack_4020;
        local_17d8 = (float)local_18 * (float)local_10c8;
        fStack_17d4 = local_18._4_4_ * local_10c8._4_4_;
        fStack_17d0 = (float)uStack_10 * (float)uStack_10c0;
        fStack_17cc = uStack_10._4_4_ * uStack_10c0._4_4_;
        local_17e8 = local_4028;
        uStack_17e0 = uStack_4020;
        local_1888 = CONCAT44(fStack_17d4 + local_48._4_4_,local_17d8 + (float)local_48);
        uStack_1880 = CONCAT44(fStack_17cc + uStack_40._4_4_,fStack_17d0 + (float)uStack_40);
        local_1848 = (float)local_88 * (float)local_14b8;
        fStack_1844 = local_88._4_4_ * local_14b8._4_4_;
        fStack_1840 = (float)uStack_80 * (float)uStack_14b0;
        fStack_183c = uStack_80._4_4_ * uStack_14b0._4_4_;
        fVar39 = local_1848 + local_17d8 + (float)local_48;
        fVar40 = fStack_1844 + fStack_17d4 + local_48._4_4_;
        fVar41 = fStack_1840 + fStack_17d0 + (float)uStack_40;
        fVar42 = fStack_183c + fStack_17cc + uStack_40._4_4_;
        local_18f8 = CONCAT44(fVar40,fVar39);
        uStack_18f0 = CONCAT44(fVar42,fVar41);
        local_18a8._0_4_ = (float)local_1c68;
        local_18a8._4_4_ = (float)((ulong)local_1c68 >> 0x20);
        uStack_18a0._0_4_ = (float)uStack_1c60;
        uStack_18a0._4_4_ = (float)((ulong)uStack_1c60 >> 0x20);
        local_18b8 = (float)local_f8 * (float)local_18a8;
        fStack_18b4 = local_f8._4_4_ * local_18a8._4_4_;
        fStack_18b0 = (float)uStack_f0 * (float)uStack_18a0;
        fStack_18ac = uStack_f0._4_4_ * uStack_18a0._4_4_;
        fVar39 = local_18b8 + fVar39;
        fVar40 = fStack_18b4 + fVar40;
        fVar41 = fStack_18b0 + fVar41;
        fVar42 = fStack_18ac + fVar42;
        local_1968 = CONCAT44(fVar40,fVar39);
        uStack_1960 = CONCAT44(fVar42,fVar41);
        local_1928 = (float)local_168 * (float)local_1218;
        fStack_1924 = local_168._4_4_ * local_1218._4_4_;
        fStack_1920 = (float)uStack_160 * (float)uStack_1210;
        fStack_191c = uStack_160._4_4_ * uStack_1210._4_4_;
        fVar39 = local_1928 + fVar39;
        fVar40 = fStack_1924 + fVar40;
        fVar41 = fStack_1920 + fVar41;
        fVar42 = fStack_191c + fVar42;
        local_19d8 = CONCAT44(fVar40,fVar39);
        uStack_19d0 = CONCAT44(fVar42,fVar41);
        local_1998 = (float)local_1d8 * (float)local_1608;
        fStack_1994 = local_1d8._4_4_ * local_1608._4_4_;
        fStack_1990 = (float)uStack_1d0 * (float)uStack_1600;
        fStack_198c = uStack_1d0._4_4_ * uStack_1600._4_4_;
        fVar39 = local_1998 + fVar39;
        fVar40 = fStack_1994 + fVar40;
        fVar41 = fStack_1990 + fVar41;
        fVar42 = fStack_198c + fVar42;
        local_1a48 = CONCAT44(fVar40,fVar39);
        uStack_1a40 = CONCAT44(fVar42,fVar41);
        local_19f8._0_4_ = (float)local_1db8;
        local_19f8._4_4_ = (float)((ulong)local_1db8 >> 0x20);
        uStack_19f0._0_4_ = (float)uStack_1db0;
        uStack_19f0._4_4_ = (float)((ulong)uStack_1db0 >> 0x20);
        local_1a08 = (float)local_248 * (float)local_19f8;
        fStack_1a04 = local_248._4_4_ * local_19f8._4_4_;
        fStack_1a00 = (float)uStack_240 * (float)uStack_19f0;
        fStack_19fc = uStack_240._4_4_ * uStack_19f0._4_4_;
        fVar39 = local_1a08 + fVar39;
        fVar40 = fStack_1a04 + fVar40;
        fVar41 = fStack_1a00 + fVar41;
        fVar42 = fStack_19fc + fVar42;
        local_1ab8 = CONCAT44(fVar40,fVar39);
        uStack_1ab0 = CONCAT44(fVar42,fVar41);
        local_1a78 = (float)local_2b8 * (float)local_1368;
        fStack_1a74 = local_2b8._4_4_ * local_1368._4_4_;
        fStack_1a70 = (float)uStack_2b0 * (float)uStack_1360;
        fStack_1a6c = uStack_2b0._4_4_ * uStack_1360._4_4_;
        fVar39 = local_1a78 + fVar39;
        fVar40 = fStack_1a74 + fVar40;
        fVar41 = fStack_1a70 + fVar41;
        fVar42 = fStack_1a6c + fVar42;
        local_1b28 = CONCAT44(fVar40,fVar39);
        uStack_1b20 = CONCAT44(fVar42,fVar41);
        local_1ae8 = (float)local_328 * (float)local_1758;
        fStack_1ae4 = local_328._4_4_ * local_1758._4_4_;
        fStack_1ae0 = (float)uStack_320 * (float)uStack_1750;
        fStack_1adc = uStack_320._4_4_ * uStack_1750._4_4_;
        fVar39 = local_1ae8 + fVar39;
        fVar40 = fStack_1ae4 + fVar40;
        fVar41 = fStack_1ae0 + fVar41;
        fVar42 = fStack_1adc + fVar42;
        local_1b98 = CONCAT44(fVar40,fVar39);
        uStack_1b90 = CONCAT44(fVar42,fVar41);
        local_1b48._0_4_ = (float)local_1f08;
        local_1b48._4_4_ = (float)((ulong)local_1f08 >> 0x20);
        uStack_1b40._0_4_ = (float)uStack_1f00;
        uStack_1b40._4_4_ = (float)((ulong)uStack_1f00 >> 0x20);
        local_1b58 = (float)local_398 * (float)local_1b48;
        fStack_1b54 = local_398._4_4_ * local_1b48._4_4_;
        fStack_1b50 = (float)uStack_390 * (float)uStack_1b40;
        fStack_1b4c = uStack_390._4_4_ * uStack_1b40._4_4_;
        local_3bf8 = CONCAT44(fStack_1b54 + fVar40,local_1b58 + fVar39);
        uStack_3bf0 = CONCAT44(fStack_1b4c + fVar42,fStack_1b50 + fVar41);
        local_3e28 = local_4098 + 0x24;
        local_1cd8 = *(undefined8 *)local_3e28;
        uStack_1cd0 = *(undefined8 *)(local_4098 + 0x26);
        local_3e30 = local_40a0 + 0x24;
        local_1e28 = *(undefined8 *)local_3e30;
        uStack_1e20 = *(undefined8 *)(local_40a0 + 0x26);
        local_3e38 = local_40a8 + 0x24;
        local_1f78 = *(undefined8 *)local_3e38;
        uStack_1f70 = *(undefined8 *)(local_40a8 + 0x26);
        local_3be0 = local_4048 + 0x18;
        *(undefined8 *)local_3be0 = local_3bf8;
        *(undefined8 *)(local_4048 + 0x1a) = uStack_3bf0;
        local_1c08 = local_4028;
        uStack_1c00 = uStack_4020;
        local_1bc8 = (float)local_18 * (float)local_14b8;
        fStack_1bc4 = local_18._4_4_ * local_14b8._4_4_;
        fStack_1bc0 = (float)uStack_10 * (float)uStack_14b0;
        fStack_1bbc = uStack_10._4_4_ * uStack_14b0._4_4_;
        local_1bd8 = local_4028;
        uStack_1bd0 = uStack_4020;
        local_1c78 = CONCAT44(fStack_1bc4 + local_48._4_4_,local_1bc8 + (float)local_48);
        uStack_1c70 = CONCAT44(fStack_1bbc + uStack_40._4_4_,fStack_1bc0 + (float)uStack_40);
        local_1c38 = (float)local_88 * (float)local_18a8;
        fStack_1c34 = local_88._4_4_ * local_18a8._4_4_;
        fStack_1c30 = (float)uStack_80 * (float)uStack_18a0;
        fStack_1c2c = uStack_80._4_4_ * uStack_18a0._4_4_;
        fVar39 = local_1c38 + local_1bc8 + (float)local_48;
        fVar40 = fStack_1c34 + fStack_1bc4 + local_48._4_4_;
        fVar41 = fStack_1c30 + fStack_1bc0 + (float)uStack_40;
        fVar42 = fStack_1c2c + fStack_1bbc + uStack_40._4_4_;
        local_1ce8 = CONCAT44(fVar40,fVar39);
        uStack_1ce0 = CONCAT44(fVar42,fVar41);
        local_1c98._0_4_ = (float)local_1cd8;
        local_1c98._4_4_ = (float)((ulong)local_1cd8 >> 0x20);
        uStack_1c90._0_4_ = (float)uStack_1cd0;
        uStack_1c90._4_4_ = (float)((ulong)uStack_1cd0 >> 0x20);
        local_1ca8 = (float)local_f8 * (float)local_1c98;
        fStack_1ca4 = local_f8._4_4_ * local_1c98._4_4_;
        fStack_1ca0 = (float)uStack_f0 * (float)uStack_1c90;
        fStack_1c9c = uStack_f0._4_4_ * uStack_1c90._4_4_;
        fVar39 = local_1ca8 + fVar39;
        fVar40 = fStack_1ca4 + fVar40;
        fVar41 = fStack_1ca0 + fVar41;
        fVar42 = fStack_1c9c + fVar42;
        local_1d58 = CONCAT44(fVar40,fVar39);
        uStack_1d50 = CONCAT44(fVar42,fVar41);
        local_1d18 = (float)local_168 * (float)local_1608;
        fStack_1d14 = local_168._4_4_ * local_1608._4_4_;
        fStack_1d10 = (float)uStack_160 * (float)uStack_1600;
        fStack_1d0c = uStack_160._4_4_ * uStack_1600._4_4_;
        fVar39 = local_1d18 + fVar39;
        fVar40 = fStack_1d14 + fVar40;
        fVar41 = fStack_1d10 + fVar41;
        fVar42 = fStack_1d0c + fVar42;
        local_1dc8 = CONCAT44(fVar40,fVar39);
        uStack_1dc0 = CONCAT44(fVar42,fVar41);
        local_1d88 = (float)local_1d8 * (float)local_19f8;
        fStack_1d84 = local_1d8._4_4_ * local_19f8._4_4_;
        fStack_1d80 = (float)uStack_1d0 * (float)uStack_19f0;
        fStack_1d7c = uStack_1d0._4_4_ * uStack_19f0._4_4_;
        fVar39 = local_1d88 + fVar39;
        fVar40 = fStack_1d84 + fVar40;
        fVar41 = fStack_1d80 + fVar41;
        fVar42 = fStack_1d7c + fVar42;
        local_1e38 = CONCAT44(fVar40,fVar39);
        uStack_1e30 = CONCAT44(fVar42,fVar41);
        local_1de8._0_4_ = (float)local_1e28;
        local_1de8._4_4_ = (float)((ulong)local_1e28 >> 0x20);
        uStack_1de0._0_4_ = (float)uStack_1e20;
        uStack_1de0._4_4_ = (float)((ulong)uStack_1e20 >> 0x20);
        local_1df8 = (float)local_248 * (float)local_1de8;
        fStack_1df4 = local_248._4_4_ * local_1de8._4_4_;
        fStack_1df0 = (float)uStack_240 * (float)uStack_1de0;
        fStack_1dec = uStack_240._4_4_ * uStack_1de0._4_4_;
        fVar39 = local_1df8 + fVar39;
        fVar40 = fStack_1df4 + fVar40;
        fVar41 = fStack_1df0 + fVar41;
        fVar42 = fStack_1dec + fVar42;
        local_1ea8 = CONCAT44(fVar40,fVar39);
        uStack_1ea0 = CONCAT44(fVar42,fVar41);
        local_1e68 = (float)local_2b8 * (float)local_1758;
        fStack_1e64 = local_2b8._4_4_ * local_1758._4_4_;
        fStack_1e60 = (float)uStack_2b0 * (float)uStack_1750;
        fStack_1e5c = uStack_2b0._4_4_ * uStack_1750._4_4_;
        fVar39 = local_1e68 + fVar39;
        fVar40 = fStack_1e64 + fVar40;
        fVar41 = fStack_1e60 + fVar41;
        fVar42 = fStack_1e5c + fVar42;
        local_1f18 = CONCAT44(fVar40,fVar39);
        uStack_1f10 = CONCAT44(fVar42,fVar41);
        local_1ed8 = (float)local_328 * (float)local_1b48;
        fStack_1ed4 = local_328._4_4_ * local_1b48._4_4_;
        fStack_1ed0 = (float)uStack_320 * (float)uStack_1b40;
        fStack_1ecc = uStack_320._4_4_ * uStack_1b40._4_4_;
        fVar39 = local_1ed8 + fVar39;
        fVar40 = fStack_1ed4 + fVar40;
        fVar41 = fStack_1ed0 + fVar41;
        fVar42 = fStack_1ecc + fVar42;
        local_1f88 = CONCAT44(fVar40,fVar39);
        uStack_1f80 = CONCAT44(fVar42,fVar41);
        local_1f38._0_4_ = (float)local_1f78;
        local_1f38._4_4_ = (float)((ulong)local_1f78 >> 0x20);
        uStack_1f30._0_4_ = (float)uStack_1f70;
        uStack_1f30._4_4_ = (float)((ulong)uStack_1f70 >> 0x20);
        local_1f48._0_4_ = (float)local_398 * (float)local_1f38;
        local_1f48._4_4_ = local_398._4_4_ * local_1f38._4_4_;
        local_1f48._8_4_ = (float)uStack_390 * (float)uStack_1f30;
        local_1f48._12_4_ = uStack_390._4_4_ * uStack_1f30._4_4_;
        local_3c18 = CONCAT44(local_1f48._4_4_ + fVar40,local_1f48._0_4_ + fVar39);
        uStack_3c10 = CONCAT44(local_1f48._12_4_ + fVar42,local_1f48._8_4_ + fVar41);
        local_3c00 = local_4048 + 0x1c;
        *(undefined8 *)local_3c00 = local_3c18;
        *(undefined8 *)(local_4048 + 0x1e) = uStack_3c10;
        local_4098 = local_4098 + 0x20;
        local_40a0 = local_40a0 + 0x20;
        local_40a8 = local_40a8 + 0x20;
        local_4048 = local_4048 + 0x20;
        local_4140 = local_4140 + 8;
        local_1f68 = uVar17;
        uStack_1f60 = uVar18;
        local_1f58 = local_1f88;
        uStack_1f50 = uStack_1f80;
        local_1f38 = local_1f78;
        uStack_1f30 = uStack_1f70;
        local_1f28 = uVar17;
        uStack_1f20 = uVar18;
        local_1ef8 = uVar15;
        uStack_1ef0 = uVar16;
        local_1ee8 = local_1f18;
        uStack_1ee0 = uStack_1f10;
        local_1ec8 = local_1f08;
        uStack_1ec0 = uStack_1f00;
        local_1eb8 = uVar15;
        uStack_1eb0 = uVar16;
        local_1e88 = uVar13;
        uStack_1e80 = uVar14;
        local_1e78 = local_1ea8;
        uStack_1e70 = uStack_1ea0;
        local_1e58 = local_1e98;
        uStack_1e50 = uStack_1e90;
        local_1e48 = uVar13;
        uStack_1e40 = uVar14;
        local_1e18 = uVar11;
        uStack_1e10 = uVar12;
        local_1e08 = local_1e38;
        uStack_1e00 = uStack_1e30;
        local_1de8 = local_1e28;
        uStack_1de0 = uStack_1e20;
        local_1dd8 = uVar11;
        uStack_1dd0 = uVar12;
        local_1da8 = uVar9;
        uStack_1da0 = uVar10;
        local_1d98 = local_1dc8;
        uStack_1d90 = uStack_1dc0;
        local_1d78 = local_1db8;
        uStack_1d70 = uStack_1db0;
        local_1d68 = uVar9;
        uStack_1d60 = uVar10;
        local_1d38 = uVar7;
        uStack_1d30 = uVar8;
        local_1d28 = local_1d58;
        uStack_1d20 = uStack_1d50;
        local_1d08 = local_1d48;
        uStack_1d00 = uStack_1d40;
        local_1cf8 = uVar7;
        uStack_1cf0 = uVar8;
        local_1cc8 = uVar5;
        uStack_1cc0 = uVar6;
        local_1cb8 = local_1ce8;
        uStack_1cb0 = uStack_1ce0;
        local_1c98 = local_1cd8;
        uStack_1c90 = uStack_1cd0;
        local_1c88 = uVar5;
        uStack_1c80 = uVar6;
        local_1c58 = uVar3;
        uStack_1c50 = uVar4;
        local_1c48 = local_1c78;
        uStack_1c40 = uStack_1c70;
        local_1c28 = local_1c68;
        uStack_1c20 = uStack_1c60;
        local_1c18 = uVar3;
        uStack_1c10 = uVar4;
        local_1be8 = uVar1;
        uStack_1be0 = uVar2;
        local_1bb8 = local_1bf8;
        uStack_1bb0 = uStack_1bf0;
        local_1ba8 = uVar1;
        uStack_1ba0 = uVar2;
        local_1b88 = local_1f08;
        uStack_1b80 = uStack_1f00;
        local_1b78 = uVar17;
        uStack_1b70 = uVar18;
        local_1b68 = local_1b98;
        uStack_1b60 = uStack_1b90;
        local_1b48 = local_1f08;
        uStack_1b40 = uStack_1f00;
        local_1b38 = uVar17;
        uStack_1b30 = uVar18;
        local_1b18 = local_1e98;
        uStack_1b10 = uStack_1e90;
        local_1b08 = uVar15;
        uStack_1b00 = uVar16;
        local_1af8 = local_1b28;
        uStack_1af0 = uStack_1b20;
        local_1ad8 = local_1e98;
        uStack_1ad0 = uStack_1e90;
        local_1ac8 = uVar15;
        uStack_1ac0 = uVar16;
        local_1a98 = uVar13;
        uStack_1a90 = uVar14;
        local_1a88 = local_1ab8;
        uStack_1a80 = uStack_1ab0;
        local_1a68 = local_1aa8;
        uStack_1a60 = uStack_1aa0;
        local_1a58 = uVar13;
        uStack_1a50 = uVar14;
        local_1a38 = local_1db8;
        uStack_1a30 = uStack_1db0;
        local_1a28 = uVar11;
        uStack_1a20 = uVar12;
        local_1a18 = local_1a48;
        uStack_1a10 = uStack_1a40;
        local_19f8 = local_1db8;
        uStack_19f0 = uStack_1db0;
        local_19e8 = uVar11;
        uStack_19e0 = uVar12;
        local_19c8 = local_1d48;
        uStack_19c0 = uStack_1d40;
        local_19b8 = uVar9;
        uStack_19b0 = uVar10;
        local_19a8 = local_19d8;
        uStack_19a0 = uStack_19d0;
        local_1988 = local_1d48;
        uStack_1980 = uStack_1d40;
        local_1978 = uVar9;
        uStack_1970 = uVar10;
        local_1948 = uVar7;
        uStack_1940 = uVar8;
        local_1938 = local_1968;
        uStack_1930 = uStack_1960;
        local_1918 = local_1958;
        uStack_1910 = uStack_1950;
        local_1908 = uVar7;
        uStack_1900 = uVar8;
        local_18e8 = local_1c68;
        uStack_18e0 = uStack_1c60;
        local_18d8 = uVar5;
        uStack_18d0 = uVar6;
        local_18c8 = local_18f8;
        uStack_18c0 = uStack_18f0;
        local_18a8 = local_1c68;
        uStack_18a0 = uStack_1c60;
        local_1898 = uVar5;
        uStack_1890 = uVar6;
        local_1878 = local_1bf8;
        uStack_1870 = uStack_1bf0;
        local_1868 = uVar3;
        uStack_1860 = uVar4;
        local_1858 = local_1888;
        uStack_1850 = uStack_1880;
        local_1838 = local_1bf8;
        uStack_1830 = uStack_1bf0;
        local_1828 = uVar3;
        uStack_1820 = uVar4;
        local_17f8 = uVar1;
        uStack_17f0 = uVar2;
        local_17c8 = local_1808;
        uStack_17c0 = uStack_1800;
        local_17b8 = uVar1;
        uStack_17b0 = uVar2;
        local_1798 = local_1e98;
        uStack_1790 = uStack_1e90;
        local_1788 = uVar17;
        uStack_1780 = uVar18;
        local_1778 = local_17a8;
        uStack_1770 = uStack_17a0;
        local_1758 = local_1e98;
        uStack_1750 = uStack_1e90;
        local_1748 = uVar17;
        uStack_1740 = uVar18;
        local_1728 = local_1aa8;
        uStack_1720 = uStack_1aa0;
        local_1718 = uVar15;
        uStack_1710 = uVar16;
        local_1708 = local_1738;
        uStack_1700 = uStack_1730;
        local_16e8 = local_1aa8;
        uStack_16e0 = uStack_1aa0;
        local_16d8 = uVar15;
        uStack_16d0 = uVar16;
        local_16a8 = uVar13;
        uStack_16a0 = uVar14;
        local_1698 = local_16c8;
        uStack_1690 = uStack_16c0;
        local_1678 = local_16b8;
        uStack_1670 = uStack_16b0;
        local_1668 = uVar13;
        uStack_1660 = uVar14;
        local_1648 = local_1d48;
        uStack_1640 = uStack_1d40;
        local_1638 = uVar11;
        uStack_1630 = uVar12;
        local_1628 = local_1658;
        uStack_1620 = uStack_1650;
        local_1608 = local_1d48;
        uStack_1600 = uStack_1d40;
        local_15f8 = uVar11;
        uStack_15f0 = uVar12;
        local_15d8 = local_1958;
        uStack_15d0 = uStack_1950;
        local_15c8 = uVar9;
        uStack_15c0 = uVar10;
        local_15b8 = local_15e8;
        uStack_15b0 = uStack_15e0;
        local_1598 = local_1958;
        uStack_1590 = uStack_1950;
        local_1588 = uVar9;
        uStack_1580 = uVar10;
        local_1558 = uVar7;
        uStack_1550 = uVar8;
        local_1548 = local_1578;
        uStack_1540 = uStack_1570;
        local_1528 = local_1568;
        uStack_1520 = uStack_1560;
        local_1518 = uVar7;
        uStack_1510 = uVar8;
        local_14f8 = local_1bf8;
        uStack_14f0 = uStack_1bf0;
        local_14e8 = uVar5;
        uStack_14e0 = uVar6;
        local_14d8 = local_1508;
        uStack_14d0 = uStack_1500;
        local_14b8 = local_1bf8;
        uStack_14b0 = uStack_1bf0;
        local_14a8 = uVar5;
        uStack_14a0 = uVar6;
        local_1488 = local_1808;
        uStack_1480 = uStack_1800;
        local_1478 = uVar3;
        uStack_1470 = uVar4;
        local_1468 = local_1498;
        uStack_1460 = uStack_1490;
        local_1448 = local_1808;
        uStack_1440 = uStack_1800;
        local_1438 = uVar3;
        uStack_1430 = uVar4;
        local_1408 = uVar1;
        uStack_1400 = uVar2;
        local_13d8 = local_1418;
        uStack_13d0 = uStack_1410;
        local_13c8 = uVar1;
        uStack_13c0 = uVar2;
        local_13a8 = local_1aa8;
        uStack_13a0 = uStack_1aa0;
        local_1398 = uVar17;
        uStack_1390 = uVar18;
        local_1388 = local_13b8;
        uStack_1380 = uStack_13b0;
        local_1368 = local_1aa8;
        uStack_1360 = uStack_1aa0;
        local_1358 = uVar17;
        uStack_1350 = uVar18;
        local_1338 = local_16b8;
        uStack_1330 = uStack_16b0;
        local_1328 = uVar15;
        uStack_1320 = uVar16;
        local_1318 = local_1348;
        uStack_1310 = uStack_1340;
        local_12f8 = local_16b8;
        uStack_12f0 = uStack_16b0;
        local_12e8 = uVar15;
        uStack_12e0 = uVar16;
        local_12b8 = uVar13;
        uStack_12b0 = uVar14;
        local_12a8 = local_12d8;
        uStack_12a0 = uStack_12d0;
        local_1288 = local_12c8;
        uStack_1280 = uStack_12c0;
        local_1278 = uVar13;
        uStack_1270 = uVar14;
        local_1258 = local_1958;
        uStack_1250 = uStack_1950;
        local_1248 = uVar11;
        uStack_1240 = uVar12;
        local_1238 = local_1268;
        uStack_1230 = uStack_1260;
        local_1218 = local_1958;
        uStack_1210 = uStack_1950;
        local_1208 = uVar11;
        uStack_1200 = uVar12;
        local_11e8 = local_1568;
        uStack_11e0 = uStack_1560;
        local_11d8 = uVar9;
        uStack_11d0 = uVar10;
        local_11c8 = local_11f8;
        uStack_11c0 = uStack_11f0;
        local_11a8 = local_1568;
        uStack_11a0 = uStack_1560;
        local_1198 = uVar9;
        uStack_1190 = uVar10;
        local_1168 = uVar7;
        uStack_1160 = uVar8;
        local_1158 = local_1188;
        uStack_1150 = uStack_1180;
        local_1138 = local_1178;
        uStack_1130 = uStack_1170;
        local_1128 = uVar7;
        uStack_1120 = uVar8;
        local_1108 = local_1808;
        uStack_1100 = uStack_1800;
        local_10f8 = uVar5;
        uStack_10f0 = uVar6;
        local_10e8 = local_1118;
        uStack_10e0 = uStack_1110;
        local_10c8 = local_1808;
        uStack_10c0 = uStack_1800;
        local_10b8 = uVar5;
        uStack_10b0 = uVar6;
        local_1098 = local_1418;
        uStack_1090 = uStack_1410;
        local_1088 = uVar3;
        uStack_1080 = uVar4;
        local_1078 = local_10a8;
        uStack_1070 = uStack_10a0;
        local_1058 = local_1418;
        uStack_1050 = uStack_1410;
        local_1048 = uVar3;
        uStack_1040 = uVar4;
        local_1018 = uVar1;
        uStack_1010 = uVar2;
        local_fe8 = local_1028;
        uStack_fe0 = uStack_1020;
        local_fd8 = uVar1;
        uStack_fd0 = uVar2;
        local_fb8 = local_16b8;
        uStack_fb0 = uStack_16b0;
        local_fa8 = uVar17;
        uStack_fa0 = uVar18;
        local_f98 = local_fc8;
        uStack_f90 = uStack_fc0;
        local_f78 = local_16b8;
        uStack_f70 = uStack_16b0;
        local_f68 = uVar17;
        uStack_f60 = uVar18;
        local_f48 = local_12c8;
        uStack_f40 = uStack_12c0;
        local_f38 = uVar15;
        uStack_f30 = uVar16;
        local_f28 = local_f58;
        uStack_f20 = uStack_f50;
        local_f08 = local_12c8;
        uStack_f00 = uStack_12c0;
        local_ef8 = uVar15;
        uStack_ef0 = uVar16;
        local_ec8 = uVar13;
        uStack_ec0 = uVar14;
        local_eb8 = local_ee8;
        uStack_eb0 = uStack_ee0;
        local_e98 = local_ed8;
        uStack_e90 = uStack_ed0;
        local_e88 = uVar13;
        uStack_e80 = uVar14;
        local_e68 = local_1568;
        uStack_e60 = uStack_1560;
        local_e58 = uVar11;
        uStack_e50 = uVar12;
        local_e48 = local_e78;
        uStack_e40 = uStack_e70;
        local_e28 = local_1568;
        uStack_e20 = uStack_1560;
        local_e18 = uVar11;
        uStack_e10 = uVar12;
        local_df8 = local_1178;
        uStack_df0 = uStack_1170;
        local_de8 = uVar9;
        uStack_de0 = uVar10;
        local_dd8 = local_e08;
        uStack_dd0 = uStack_e00;
        local_db8 = local_1178;
        uStack_db0 = uStack_1170;
        local_da8 = uVar9;
        uStack_da0 = uVar10;
        local_d78 = uVar7;
        uStack_d70 = uVar8;
        local_d68 = local_d98;
        uStack_d60 = uStack_d90;
        local_d48 = local_d88;
        uStack_d40 = uStack_d80;
        local_d38 = uVar7;
        uStack_d30 = uVar8;
        local_d18 = local_1418;
        uStack_d10 = uStack_1410;
        local_d08 = uVar5;
        uStack_d00 = uVar6;
        local_cf8 = local_d28;
        uStack_cf0 = uStack_d20;
        local_cd8 = local_1418;
        uStack_cd0 = uStack_1410;
        local_cc8 = uVar5;
        uStack_cc0 = uVar6;
        local_ca8 = local_1028;
        uStack_ca0 = uStack_1020;
        local_c98 = uVar3;
        uStack_c90 = uVar4;
        local_c88 = local_cb8;
        uStack_c80 = uStack_cb0;
        local_c68 = local_1028;
        uStack_c60 = uStack_1020;
        local_c58 = uVar3;
        uStack_c50 = uVar4;
        local_c28 = uVar1;
        uStack_c20 = uVar2;
        local_bf8 = local_c38;
        uStack_bf0 = uStack_c30;
        local_be8 = uVar1;
        uStack_be0 = uVar2;
        local_bc8 = local_12c8;
        uStack_bc0 = uStack_12c0;
        local_bb8 = uVar17;
        uStack_bb0 = uVar18;
        local_ba8 = local_bd8;
        uStack_ba0 = uStack_bd0;
        local_b88 = local_12c8;
        uStack_b80 = uStack_12c0;
        local_b78 = uVar17;
        uStack_b70 = uVar18;
        local_b58 = local_ed8;
        uStack_b50 = uStack_ed0;
        local_b48 = uVar15;
        uStack_b40 = uVar16;
        local_b38 = local_b68;
        uStack_b30 = uStack_b60;
        local_b18 = local_ed8;
        uStack_b10 = uStack_ed0;
        local_b08 = uVar15;
        uStack_b00 = uVar16;
        local_ad8 = uVar13;
        uStack_ad0 = uVar14;
        local_ac8 = local_af8;
        uStack_ac0 = uStack_af0;
        local_aa8 = local_ae8;
        uStack_aa0 = uStack_ae0;
        local_a98 = uVar13;
        uStack_a90 = uVar14;
        local_a78 = local_1178;
        uStack_a70 = uStack_1170;
        local_a68 = uVar11;
        uStack_a60 = uVar12;
        local_a58 = local_a88;
        uStack_a50 = uStack_a80;
        local_a38 = local_1178;
        uStack_a30 = uStack_1170;
        local_a28 = uVar11;
        uStack_a20 = uVar12;
        local_a08 = local_d88;
        uStack_a00 = uStack_d80;
        local_9f8 = uVar9;
        uStack_9f0 = uVar10;
        local_9e8 = local_a18;
        uStack_9e0 = uStack_a10;
        local_9c8 = local_d88;
        uStack_9c0 = uStack_d80;
        local_9b8 = uVar9;
        uStack_9b0 = uVar10;
        local_988 = uVar7;
        uStack_980 = uVar8;
        local_978 = local_9a8;
        uStack_970 = uStack_9a0;
        local_958 = local_998;
        uStack_950 = uStack_990;
        local_948 = uVar7;
        uStack_940 = uVar8;
        local_928 = local_1028;
        uStack_920 = uStack_1020;
        local_918 = uVar5;
        uStack_910 = uVar6;
        local_908 = local_938;
        uStack_900 = uStack_930;
        local_8e8 = local_1028;
        uStack_8e0 = uStack_1020;
        local_8d8 = uVar5;
        uStack_8d0 = uVar6;
        local_8b8 = local_c38;
        uStack_8b0 = uStack_c30;
        local_8a8 = uVar3;
        uStack_8a0 = uVar4;
        local_898 = local_8c8;
        uStack_890 = uStack_8c0;
        local_878 = local_c38;
        uStack_870 = uStack_c30;
        local_868 = uVar3;
        uStack_860 = uVar4;
        local_838 = uVar1;
        uStack_830 = uVar2;
        local_808 = local_848;
        uStack_800 = uStack_840;
        local_7f8 = uVar1;
        uStack_7f0 = uVar2;
        local_7d8 = local_ed8;
        uStack_7d0 = uStack_ed0;
        local_7c8 = uVar17;
        uStack_7c0 = uVar18;
        local_7b8 = local_7e8;
        uStack_7b0 = uStack_7e0;
        local_798 = local_ed8;
        uStack_790 = uStack_ed0;
        local_788 = uVar17;
        uStack_780 = uVar18;
        local_768 = local_ae8;
        uStack_760 = uStack_ae0;
        local_758 = uVar15;
        uStack_750 = uVar16;
        local_748 = local_778;
        uStack_740 = uStack_770;
        local_728 = local_ae8;
        uStack_720 = uStack_ae0;
        local_718 = uVar15;
        uStack_710 = uVar16;
        local_6e8 = uVar13;
        uStack_6e0 = uVar14;
        local_6d8 = local_708;
        uStack_6d0 = uStack_700;
        local_6b8 = local_6f8;
        uStack_6b0 = uStack_6f0;
        local_6a8 = uVar13;
        uStack_6a0 = uVar14;
        local_688 = local_d88;
        uStack_680 = uStack_d80;
        local_678 = uVar11;
        uStack_670 = uVar12;
        local_668 = local_698;
        uStack_660 = uStack_690;
        local_648 = local_d88;
        uStack_640 = uStack_d80;
        local_638 = uVar11;
        uStack_630 = uVar12;
        local_618 = local_998;
        uStack_610 = uStack_990;
        local_608 = uVar9;
        uStack_600 = uVar10;
        local_5f8 = local_628;
        uStack_5f0 = uStack_620;
        local_5d8 = local_998;
        uStack_5d0 = uStack_990;
        local_5c8 = uVar9;
        uStack_5c0 = uVar10;
        local_598 = uVar7;
        uStack_590 = uVar8;
        local_588 = local_5b8;
        uStack_580 = uStack_5b0;
        local_568 = local_5a8;
        uStack_560 = uStack_5a0;
        local_558 = uVar7;
        uStack_550 = uVar8;
        local_538 = local_c38;
        uStack_530 = uStack_c30;
        local_528 = uVar5;
        uStack_520 = uVar6;
        local_518 = local_548;
        uStack_510 = uStack_540;
        local_4f8 = local_c38;
        uStack_4f0 = uStack_c30;
        local_4e8 = uVar5;
        uStack_4e0 = uVar6;
        local_4c8 = local_848;
        uStack_4c0 = uStack_840;
        local_4b8 = uVar3;
        uStack_4b0 = uVar4;
        local_4a8 = local_4d8;
        uStack_4a0 = uStack_4d0;
        local_488 = local_848;
        uStack_480 = uStack_840;
        local_478 = uVar3;
        uStack_470 = uVar4;
        local_448 = uVar1;
        uStack_440 = uVar2;
        local_418 = local_458;
        uStack_410 = uStack_450;
        local_408 = uVar1;
        uStack_400 = uVar2;
        local_3e8 = local_ae8;
        uStack_3e0 = uStack_ae0;
        local_3d8 = uVar17;
        uStack_3d0 = uVar18;
        local_3c8 = local_3f8;
        uStack_3c0 = uStack_3f0;
        local_3a8 = local_ae8;
        uStack_3a0 = uStack_ae0;
        local_398 = uVar17;
        uStack_390 = uVar18;
        local_378 = local_6f8;
        uStack_370 = uStack_6f0;
        local_368 = uVar15;
        uStack_360 = uVar16;
        local_358 = local_388;
        uStack_350 = uStack_380;
        local_338 = local_6f8;
        uStack_330 = uStack_6f0;
        local_328 = uVar15;
        uStack_320 = uVar16;
        local_2f8 = uVar13;
        uStack_2f0 = uVar14;
        local_2e8 = local_318;
        uStack_2e0 = uStack_310;
        local_2c8 = local_308;
        uStack_2c0 = uStack_300;
        local_2b8 = uVar13;
        uStack_2b0 = uVar14;
        local_298 = local_998;
        uStack_290 = uStack_990;
        local_288 = uVar11;
        uStack_280 = uVar12;
        local_278 = local_2a8;
        uStack_270 = uStack_2a0;
        local_258 = local_998;
        uStack_250 = uStack_990;
        local_248 = uVar11;
        uStack_240 = uVar12;
        local_228 = local_5a8;
        uStack_220 = uStack_5a0;
        local_218 = uVar9;
        uStack_210 = uVar10;
        local_208 = local_238;
        uStack_200 = uStack_230;
        local_1e8 = local_5a8;
        uStack_1e0 = uStack_5a0;
        local_1d8 = uVar9;
        uStack_1d0 = uVar10;
        local_1a8 = uVar7;
        uStack_1a0 = uVar8;
        local_198 = local_1c8;
        uStack_190 = uStack_1c0;
        local_178 = local_1b8;
        uStack_170 = uStack_1b0;
        local_168 = uVar7;
        uStack_160 = uVar8;
        local_148 = local_848;
        uStack_140 = uStack_840;
        local_138 = uVar5;
        uStack_130 = uVar6;
        local_128 = local_158;
        uStack_120 = uStack_150;
        local_108 = local_848;
        uStack_100 = uStack_840;
        local_f8 = uVar5;
        uStack_f0 = uVar6;
        local_d8 = local_458;
        uStack_d0 = uStack_450;
        local_c8 = uVar3;
        uStack_c0 = uVar4;
        local_b8 = local_e8;
        uStack_b0 = uStack_e0;
        local_98 = local_458;
        uStack_90 = uStack_450;
        local_88 = uVar3;
        uStack_80 = uVar4;
        local_58 = uVar1;
        uStack_50 = uVar2;
        local_48 = local_4028;
        uStack_40 = uStack_4020;
        local_28 = local_68;
        uStack_20 = uStack_60;
        local_18 = uVar1;
        uStack_10 = uVar2;
      }
      for (; local_4140 + 3 < local_3fb4; local_4140 = local_4140 + 4) {
        local_3e40 = local_4098;
        local_1fe8 = *(undefined8 *)local_4098;
        uStack_1fe0 = *(undefined8 *)(local_4098 + 2);
        local_3e48 = local_4098 + 4;
        local_23d8 = *(undefined8 *)local_3e48;
        uStack_23d0 = *(undefined8 *)(local_4098 + 6);
        local_3e50 = local_4098 + 8;
        local_27c8 = *(undefined8 *)local_3e50;
        uStack_27c0 = *(undefined8 *)(local_4098 + 10);
        local_3e58 = local_40a0;
        local_2138 = *(undefined8 *)local_40a0;
        uStack_2130 = *(undefined8 *)(local_40a0 + 2);
        local_3e60 = local_40a0 + 4;
        local_2528 = *(undefined8 *)local_3e60;
        uStack_2520 = *(undefined8 *)(local_40a0 + 6);
        local_3e68 = local_40a0 + 8;
        local_2918 = *(undefined8 *)local_3e68;
        uStack_2910 = *(undefined8 *)(local_40a0 + 10);
        local_3e70 = local_40a8;
        local_2288 = *(undefined8 *)local_40a8;
        uStack_2280 = *(undefined8 *)(local_40a8 + 2);
        local_3e78 = local_40a8 + 4;
        local_2678 = *(undefined8 *)local_3e78;
        uStack_2670 = *(undefined8 *)(local_40a8 + 6);
        local_3e80 = local_40a8 + 8;
        local_2a68 = *(undefined8 *)local_3e80;
        uStack_2a60 = *(undefined8 *)(local_40a8 + 10);
        local_1ff8 = local_4028;
        uStack_1ff0 = uStack_4020;
        local_1fa8._0_4_ = (float)local_1fe8;
        local_1fa8._4_4_ = (float)((ulong)local_1fe8 >> 0x20);
        uStack_1fa0._0_4_ = (float)uStack_1fe0;
        uStack_1fa0._4_4_ = (float)((ulong)uStack_1fe0 >> 0x20);
        local_1fb8 = (float)local_18 * (float)local_1fa8;
        fStack_1fb4 = local_18._4_4_ * local_1fa8._4_4_;
        fStack_1fb0 = (float)uStack_10 * (float)uStack_1fa0;
        fStack_1fac = uStack_10._4_4_ * uStack_1fa0._4_4_;
        local_1fc8 = local_4028;
        uStack_1fc0 = uStack_4020;
        local_2068 = CONCAT44(fStack_1fb4 + local_48._4_4_,local_1fb8 + (float)local_48);
        uStack_2060 = CONCAT44(fStack_1fac + uStack_40._4_4_,fStack_1fb0 + (float)uStack_40);
        local_2018._0_4_ = (float)local_23d8;
        local_2018._4_4_ = (float)((ulong)local_23d8 >> 0x20);
        uStack_2010._0_4_ = (float)uStack_23d0;
        uStack_2010._4_4_ = (float)((ulong)uStack_23d0 >> 0x20);
        local_2028 = (float)local_88 * (float)local_2018;
        fStack_2024 = local_88._4_4_ * local_2018._4_4_;
        fStack_2020 = (float)uStack_80 * (float)uStack_2010;
        fStack_201c = uStack_80._4_4_ * uStack_2010._4_4_;
        fVar39 = local_2028 + local_1fb8 + (float)local_48;
        fVar40 = fStack_2024 + fStack_1fb4 + local_48._4_4_;
        fVar41 = fStack_2020 + fStack_1fb0 + (float)uStack_40;
        fVar42 = fStack_201c + fStack_1fac + uStack_40._4_4_;
        local_20d8 = CONCAT44(fVar40,fVar39);
        uStack_20d0 = CONCAT44(fVar42,fVar41);
        local_2088._0_4_ = (float)local_27c8;
        local_2088._4_4_ = (float)((ulong)local_27c8 >> 0x20);
        uStack_2080._0_4_ = (float)uStack_27c0;
        uStack_2080._4_4_ = (float)((ulong)uStack_27c0 >> 0x20);
        local_2098 = (float)local_f8 * (float)local_2088;
        fStack_2094 = local_f8._4_4_ * local_2088._4_4_;
        fStack_2090 = (float)uStack_f0 * (float)uStack_2080;
        fStack_208c = uStack_f0._4_4_ * uStack_2080._4_4_;
        fVar39 = local_2098 + fVar39;
        fVar40 = fStack_2094 + fVar40;
        fVar41 = fStack_2090 + fVar41;
        fVar42 = fStack_208c + fVar42;
        local_2148 = CONCAT44(fVar40,fVar39);
        uStack_2140 = CONCAT44(fVar42,fVar41);
        local_20f8._0_4_ = (float)local_2138;
        local_20f8._4_4_ = (float)((ulong)local_2138 >> 0x20);
        uStack_20f0._0_4_ = (float)uStack_2130;
        uStack_20f0._4_4_ = (float)((ulong)uStack_2130 >> 0x20);
        local_2108 = (float)local_168 * (float)local_20f8;
        fStack_2104 = local_168._4_4_ * local_20f8._4_4_;
        fStack_2100 = (float)uStack_160 * (float)uStack_20f0;
        fStack_20fc = uStack_160._4_4_ * uStack_20f0._4_4_;
        fVar39 = local_2108 + fVar39;
        fVar40 = fStack_2104 + fVar40;
        fVar41 = fStack_2100 + fVar41;
        fVar42 = fStack_20fc + fVar42;
        local_21b8 = CONCAT44(fVar40,fVar39);
        uStack_21b0 = CONCAT44(fVar42,fVar41);
        local_2168._0_4_ = (float)local_2528;
        local_2168._4_4_ = (float)((ulong)local_2528 >> 0x20);
        uStack_2160._0_4_ = (float)uStack_2520;
        uStack_2160._4_4_ = (float)((ulong)uStack_2520 >> 0x20);
        local_2178 = (float)local_1d8 * (float)local_2168;
        fStack_2174 = local_1d8._4_4_ * local_2168._4_4_;
        fStack_2170 = (float)uStack_1d0 * (float)uStack_2160;
        fStack_216c = uStack_1d0._4_4_ * uStack_2160._4_4_;
        fVar39 = local_2178 + fVar39;
        fVar40 = fStack_2174 + fVar40;
        fVar41 = fStack_2170 + fVar41;
        fVar42 = fStack_216c + fVar42;
        local_2228 = CONCAT44(fVar40,fVar39);
        uStack_2220 = CONCAT44(fVar42,fVar41);
        local_21d8._0_4_ = (float)local_2918;
        local_21d8._4_4_ = (float)((ulong)local_2918 >> 0x20);
        uStack_21d0._0_4_ = (float)uStack_2910;
        uStack_21d0._4_4_ = (float)((ulong)uStack_2910 >> 0x20);
        local_21e8 = (float)local_248 * (float)local_21d8;
        fStack_21e4 = local_248._4_4_ * local_21d8._4_4_;
        fStack_21e0 = (float)uStack_240 * (float)uStack_21d0;
        fStack_21dc = uStack_240._4_4_ * uStack_21d0._4_4_;
        fVar39 = local_21e8 + fVar39;
        fVar40 = fStack_21e4 + fVar40;
        fVar41 = fStack_21e0 + fVar41;
        fVar42 = fStack_21dc + fVar42;
        local_2298 = CONCAT44(fVar40,fVar39);
        uStack_2290 = CONCAT44(fVar42,fVar41);
        local_2248._0_4_ = (float)local_2288;
        local_2248._4_4_ = (float)((ulong)local_2288 >> 0x20);
        uStack_2240._0_4_ = (float)uStack_2280;
        uStack_2240._4_4_ = (float)((ulong)uStack_2280 >> 0x20);
        local_2258 = (float)local_2b8 * (float)local_2248;
        fStack_2254 = local_2b8._4_4_ * local_2248._4_4_;
        fStack_2250 = (float)uStack_2b0 * (float)uStack_2240;
        fStack_224c = uStack_2b0._4_4_ * uStack_2240._4_4_;
        fVar39 = local_2258 + fVar39;
        fVar40 = fStack_2254 + fVar40;
        fVar41 = fStack_2250 + fVar41;
        fVar42 = fStack_224c + fVar42;
        local_2308 = CONCAT44(fVar40,fVar39);
        uStack_2300 = CONCAT44(fVar42,fVar41);
        local_22b8._0_4_ = (float)local_2678;
        local_22b8._4_4_ = (float)((ulong)local_2678 >> 0x20);
        uStack_22b0._0_4_ = (float)uStack_2670;
        uStack_22b0._4_4_ = (float)((ulong)uStack_2670 >> 0x20);
        local_22c8 = (float)local_328 * (float)local_22b8;
        fStack_22c4 = local_328._4_4_ * local_22b8._4_4_;
        fStack_22c0 = (float)uStack_320 * (float)uStack_22b0;
        fStack_22bc = uStack_320._4_4_ * uStack_22b0._4_4_;
        fVar39 = local_22c8 + fVar39;
        fVar40 = fStack_22c4 + fVar40;
        fVar41 = fStack_22c0 + fVar41;
        fVar42 = fStack_22bc + fVar42;
        local_2378 = CONCAT44(fVar40,fVar39);
        uStack_2370 = CONCAT44(fVar42,fVar41);
        local_2328._0_4_ = (float)local_2a68;
        local_2328._4_4_ = (float)((ulong)local_2a68 >> 0x20);
        uStack_2320._0_4_ = (float)uStack_2a60;
        uStack_2320._4_4_ = (float)((ulong)uStack_2a60 >> 0x20);
        local_2338 = (float)local_398 * (float)local_2328;
        fStack_2334 = local_398._4_4_ * local_2328._4_4_;
        fStack_2330 = (float)uStack_390 * (float)uStack_2320;
        fStack_232c = uStack_390._4_4_ * uStack_2320._4_4_;
        local_3c38 = CONCAT44(fStack_2334 + fVar40,local_2338 + fVar39);
        uStack_3c30 = CONCAT44(fStack_232c + fVar42,fStack_2330 + fVar41);
        local_3e88 = local_4098 + 0xc;
        local_2bb8 = *(undefined8 *)local_3e88;
        uStack_2bb0 = *(undefined8 *)(local_4098 + 0xe);
        local_3e90 = local_40a0 + 0xc;
        local_2d08 = *(undefined8 *)local_3e90;
        uStack_2d00 = *(undefined8 *)(local_40a0 + 0xe);
        local_3e98 = local_40a8 + 0xc;
        local_2e58 = *(undefined8 *)local_3e98;
        uStack_2e50 = *(undefined8 *)(local_40a8 + 0xe);
        local_3c20 = local_4048;
        *(undefined8 *)local_4048 = local_3c38;
        *(undefined8 *)(local_4048 + 2) = uStack_3c30;
        local_23e8 = local_4028;
        uStack_23e0 = uStack_4020;
        local_23a8 = (float)local_18 * (float)local_2018;
        fStack_23a4 = local_18._4_4_ * local_2018._4_4_;
        fStack_23a0 = (float)uStack_10 * (float)uStack_2010;
        fStack_239c = uStack_10._4_4_ * uStack_2010._4_4_;
        local_23b8 = local_4028;
        uStack_23b0 = uStack_4020;
        local_2458 = CONCAT44(fStack_23a4 + local_48._4_4_,local_23a8 + (float)local_48);
        uStack_2450 = CONCAT44(fStack_239c + uStack_40._4_4_,fStack_23a0 + (float)uStack_40);
        local_2418 = (float)local_88 * (float)local_2088;
        fStack_2414 = local_88._4_4_ * local_2088._4_4_;
        fStack_2410 = (float)uStack_80 * (float)uStack_2080;
        fStack_240c = uStack_80._4_4_ * uStack_2080._4_4_;
        fVar39 = local_2418 + local_23a8 + (float)local_48;
        fVar40 = fStack_2414 + fStack_23a4 + local_48._4_4_;
        fVar41 = fStack_2410 + fStack_23a0 + (float)uStack_40;
        fVar42 = fStack_240c + fStack_239c + uStack_40._4_4_;
        local_24c8 = CONCAT44(fVar40,fVar39);
        uStack_24c0 = CONCAT44(fVar42,fVar41);
        local_2478._0_4_ = (float)local_2bb8;
        local_2478._4_4_ = (float)((ulong)local_2bb8 >> 0x20);
        uStack_2470._0_4_ = (float)uStack_2bb0;
        uStack_2470._4_4_ = (float)((ulong)uStack_2bb0 >> 0x20);
        local_2488 = (float)local_f8 * (float)local_2478;
        fStack_2484 = local_f8._4_4_ * local_2478._4_4_;
        fStack_2480 = (float)uStack_f0 * (float)uStack_2470;
        fStack_247c = uStack_f0._4_4_ * uStack_2470._4_4_;
        fVar39 = local_2488 + fVar39;
        fVar40 = fStack_2484 + fVar40;
        fVar41 = fStack_2480 + fVar41;
        fVar42 = fStack_247c + fVar42;
        local_2538 = CONCAT44(fVar40,fVar39);
        uStack_2530 = CONCAT44(fVar42,fVar41);
        local_24f8 = (float)local_168 * (float)local_2168;
        fStack_24f4 = local_168._4_4_ * local_2168._4_4_;
        fStack_24f0 = (float)uStack_160 * (float)uStack_2160;
        fStack_24ec = uStack_160._4_4_ * uStack_2160._4_4_;
        fVar39 = local_24f8 + fVar39;
        fVar40 = fStack_24f4 + fVar40;
        fVar41 = fStack_24f0 + fVar41;
        fVar42 = fStack_24ec + fVar42;
        local_25a8 = CONCAT44(fVar40,fVar39);
        uStack_25a0 = CONCAT44(fVar42,fVar41);
        local_2568 = (float)local_1d8 * (float)local_21d8;
        fStack_2564 = local_1d8._4_4_ * local_21d8._4_4_;
        fStack_2560 = (float)uStack_1d0 * (float)uStack_21d0;
        fStack_255c = uStack_1d0._4_4_ * uStack_21d0._4_4_;
        fVar39 = local_2568 + fVar39;
        fVar40 = fStack_2564 + fVar40;
        fVar41 = fStack_2560 + fVar41;
        fVar42 = fStack_255c + fVar42;
        local_2618 = CONCAT44(fVar40,fVar39);
        uStack_2610 = CONCAT44(fVar42,fVar41);
        local_25c8._0_4_ = (float)local_2d08;
        local_25c8._4_4_ = (float)((ulong)local_2d08 >> 0x20);
        uStack_25c0._0_4_ = (float)uStack_2d00;
        uStack_25c0._4_4_ = (float)((ulong)uStack_2d00 >> 0x20);
        local_25d8 = (float)local_248 * (float)local_25c8;
        fStack_25d4 = local_248._4_4_ * local_25c8._4_4_;
        fStack_25d0 = (float)uStack_240 * (float)uStack_25c0;
        fStack_25cc = uStack_240._4_4_ * uStack_25c0._4_4_;
        fVar39 = local_25d8 + fVar39;
        fVar40 = fStack_25d4 + fVar40;
        fVar41 = fStack_25d0 + fVar41;
        fVar42 = fStack_25cc + fVar42;
        local_2688 = CONCAT44(fVar40,fVar39);
        uStack_2680 = CONCAT44(fVar42,fVar41);
        local_2648 = (float)local_2b8 * (float)local_22b8;
        fStack_2644 = local_2b8._4_4_ * local_22b8._4_4_;
        fStack_2640 = (float)uStack_2b0 * (float)uStack_22b0;
        fStack_263c = uStack_2b0._4_4_ * uStack_22b0._4_4_;
        fVar39 = local_2648 + fVar39;
        fVar40 = fStack_2644 + fVar40;
        fVar41 = fStack_2640 + fVar41;
        fVar42 = fStack_263c + fVar42;
        local_26f8 = CONCAT44(fVar40,fVar39);
        uStack_26f0 = CONCAT44(fVar42,fVar41);
        local_26b8 = (float)local_328 * (float)local_2328;
        fStack_26b4 = local_328._4_4_ * local_2328._4_4_;
        fStack_26b0 = (float)uStack_320 * (float)uStack_2320;
        fStack_26ac = uStack_320._4_4_ * uStack_2320._4_4_;
        fVar39 = local_26b8 + fVar39;
        fVar40 = fStack_26b4 + fVar40;
        fVar41 = fStack_26b0 + fVar41;
        fVar42 = fStack_26ac + fVar42;
        local_2768 = CONCAT44(fVar40,fVar39);
        uStack_2760 = CONCAT44(fVar42,fVar41);
        local_2718._0_4_ = (float)local_2e58;
        local_2718._4_4_ = (float)((ulong)local_2e58 >> 0x20);
        uStack_2710._0_4_ = (float)uStack_2e50;
        uStack_2710._4_4_ = (float)((ulong)uStack_2e50 >> 0x20);
        local_2728 = (float)local_398 * (float)local_2718;
        fStack_2724 = local_398._4_4_ * local_2718._4_4_;
        fStack_2720 = (float)uStack_390 * (float)uStack_2710;
        fStack_271c = uStack_390._4_4_ * uStack_2710._4_4_;
        local_3c58 = CONCAT44(fStack_2724 + fVar40,local_2728 + fVar39);
        uStack_3c50 = CONCAT44(fStack_271c + fVar42,fStack_2720 + fVar41);
        local_3ea0 = local_4098 + 0x10;
        local_2c28 = *(undefined8 *)local_3ea0;
        uStack_2c20 = *(undefined8 *)(local_4098 + 0x12);
        local_3ea8 = local_40a0 + 0x10;
        local_2d78 = *(undefined8 *)local_3ea8;
        uStack_2d70 = *(undefined8 *)(local_40a0 + 0x12);
        local_3eb0 = local_40a8 + 0x10;
        local_2ec8 = *(undefined8 *)local_3eb0;
        uStack_2ec0 = *(undefined8 *)(local_40a8 + 0x12);
        local_3c40 = local_4048 + 4;
        *(undefined8 *)local_3c40 = local_3c58;
        *(undefined8 *)(local_4048 + 6) = uStack_3c50;
        local_27d8 = local_4028;
        uStack_27d0 = uStack_4020;
        local_2798 = (float)local_18 * (float)local_2088;
        fStack_2794 = local_18._4_4_ * local_2088._4_4_;
        fStack_2790 = (float)uStack_10 * (float)uStack_2080;
        fStack_278c = uStack_10._4_4_ * uStack_2080._4_4_;
        local_27a8 = local_4028;
        uStack_27a0 = uStack_4020;
        local_2848 = CONCAT44(fStack_2794 + local_48._4_4_,local_2798 + (float)local_48);
        uStack_2840 = CONCAT44(fStack_278c + uStack_40._4_4_,fStack_2790 + (float)uStack_40);
        local_2808 = (float)local_88 * (float)local_2478;
        fStack_2804 = local_88._4_4_ * local_2478._4_4_;
        fStack_2800 = (float)uStack_80 * (float)uStack_2470;
        fStack_27fc = uStack_80._4_4_ * uStack_2470._4_4_;
        fVar39 = local_2808 + local_2798 + (float)local_48;
        fVar40 = fStack_2804 + fStack_2794 + local_48._4_4_;
        fVar41 = fStack_2800 + fStack_2790 + (float)uStack_40;
        fVar42 = fStack_27fc + fStack_278c + uStack_40._4_4_;
        local_28b8 = CONCAT44(fVar40,fVar39);
        uStack_28b0 = CONCAT44(fVar42,fVar41);
        local_2868._0_4_ = (float)local_2c28;
        local_2868._4_4_ = (float)((ulong)local_2c28 >> 0x20);
        uStack_2860._0_4_ = (float)uStack_2c20;
        uStack_2860._4_4_ = (float)((ulong)uStack_2c20 >> 0x20);
        local_2878 = (float)local_f8 * (float)local_2868;
        fStack_2874 = local_f8._4_4_ * local_2868._4_4_;
        fStack_2870 = (float)uStack_f0 * (float)uStack_2860;
        fStack_286c = uStack_f0._4_4_ * uStack_2860._4_4_;
        fVar39 = local_2878 + fVar39;
        fVar40 = fStack_2874 + fVar40;
        fVar41 = fStack_2870 + fVar41;
        fVar42 = fStack_286c + fVar42;
        local_2928 = CONCAT44(fVar40,fVar39);
        uStack_2920 = CONCAT44(fVar42,fVar41);
        local_28e8 = (float)local_168 * (float)local_21d8;
        fStack_28e4 = local_168._4_4_ * local_21d8._4_4_;
        fStack_28e0 = (float)uStack_160 * (float)uStack_21d0;
        fStack_28dc = uStack_160._4_4_ * uStack_21d0._4_4_;
        fVar39 = local_28e8 + fVar39;
        fVar40 = fStack_28e4 + fVar40;
        fVar41 = fStack_28e0 + fVar41;
        fVar42 = fStack_28dc + fVar42;
        local_2998 = CONCAT44(fVar40,fVar39);
        uStack_2990 = CONCAT44(fVar42,fVar41);
        local_2958 = (float)local_1d8 * (float)local_25c8;
        fStack_2954 = local_1d8._4_4_ * local_25c8._4_4_;
        fStack_2950 = (float)uStack_1d0 * (float)uStack_25c0;
        fStack_294c = uStack_1d0._4_4_ * uStack_25c0._4_4_;
        fVar39 = local_2958 + fVar39;
        fVar40 = fStack_2954 + fVar40;
        fVar41 = fStack_2950 + fVar41;
        fVar42 = fStack_294c + fVar42;
        local_2a08 = CONCAT44(fVar40,fVar39);
        uStack_2a00 = CONCAT44(fVar42,fVar41);
        local_29b8._0_4_ = (float)local_2d78;
        local_29b8._4_4_ = (float)((ulong)local_2d78 >> 0x20);
        uStack_29b0._0_4_ = (float)uStack_2d70;
        uStack_29b0._4_4_ = (float)((ulong)uStack_2d70 >> 0x20);
        local_29c8 = (float)local_248 * (float)local_29b8;
        fStack_29c4 = local_248._4_4_ * local_29b8._4_4_;
        fStack_29c0 = (float)uStack_240 * (float)uStack_29b0;
        fStack_29bc = uStack_240._4_4_ * uStack_29b0._4_4_;
        fVar39 = local_29c8 + fVar39;
        fVar40 = fStack_29c4 + fVar40;
        fVar41 = fStack_29c0 + fVar41;
        fVar42 = fStack_29bc + fVar42;
        local_2a78 = CONCAT44(fVar40,fVar39);
        uStack_2a70 = CONCAT44(fVar42,fVar41);
        local_2a38 = (float)local_2b8 * (float)local_2328;
        fStack_2a34 = local_2b8._4_4_ * local_2328._4_4_;
        fStack_2a30 = (float)uStack_2b0 * (float)uStack_2320;
        fStack_2a2c = uStack_2b0._4_4_ * uStack_2320._4_4_;
        fVar39 = local_2a38 + fVar39;
        fVar40 = fStack_2a34 + fVar40;
        fVar41 = fStack_2a30 + fVar41;
        fVar42 = fStack_2a2c + fVar42;
        local_2ae8 = CONCAT44(fVar40,fVar39);
        uStack_2ae0 = CONCAT44(fVar42,fVar41);
        local_2aa8 = (float)local_328 * (float)local_2718;
        fStack_2aa4 = local_328._4_4_ * local_2718._4_4_;
        fStack_2aa0 = (float)uStack_320 * (float)uStack_2710;
        fStack_2a9c = uStack_320._4_4_ * uStack_2710._4_4_;
        fVar39 = local_2aa8 + fVar39;
        fVar40 = fStack_2aa4 + fVar40;
        fVar41 = fStack_2aa0 + fVar41;
        fVar42 = fStack_2a9c + fVar42;
        local_2b58 = CONCAT44(fVar40,fVar39);
        uStack_2b50 = CONCAT44(fVar42,fVar41);
        local_2b08._0_4_ = (float)local_2ec8;
        local_2b08._4_4_ = (float)((ulong)local_2ec8 >> 0x20);
        uStack_2b00._0_4_ = (float)uStack_2ec0;
        uStack_2b00._4_4_ = (float)((ulong)uStack_2ec0 >> 0x20);
        local_2b18 = (float)local_398 * (float)local_2b08;
        fStack_2b14 = local_398._4_4_ * local_2b08._4_4_;
        fStack_2b10 = (float)uStack_390 * (float)uStack_2b00;
        fStack_2b0c = uStack_390._4_4_ * uStack_2b00._4_4_;
        local_3c78 = CONCAT44(fStack_2b14 + fVar40,local_2b18 + fVar39);
        uStack_3c70 = CONCAT44(fStack_2b0c + fVar42,fStack_2b10 + fVar41);
        local_3eb8 = local_4098 + 0x14;
        local_2c98 = *(undefined8 *)local_3eb8;
        uStack_2c90 = *(undefined8 *)(local_4098 + 0x16);
        local_3ec0 = local_40a0 + 0x14;
        local_2de8 = *(undefined8 *)local_3ec0;
        uStack_2de0 = *(undefined8 *)(local_40a0 + 0x16);
        local_3ec8 = local_40a8 + 0x14;
        local_2f38 = *(undefined8 *)local_3ec8;
        uStack_2f30 = *(undefined8 *)(local_40a8 + 0x16);
        local_3c60 = local_4048 + 8;
        *(undefined8 *)local_3c60 = local_3c78;
        *(undefined8 *)(local_4048 + 10) = uStack_3c70;
        local_2bc8 = local_4028;
        uStack_2bc0 = uStack_4020;
        local_2b88 = (float)local_18 * (float)local_2478;
        fStack_2b84 = local_18._4_4_ * local_2478._4_4_;
        fStack_2b80 = (float)uStack_10 * (float)uStack_2470;
        fStack_2b7c = uStack_10._4_4_ * uStack_2470._4_4_;
        local_2b98 = local_4028;
        uStack_2b90 = uStack_4020;
        local_2c38 = CONCAT44(fStack_2b84 + local_48._4_4_,local_2b88 + (float)local_48);
        uStack_2c30 = CONCAT44(fStack_2b7c + uStack_40._4_4_,fStack_2b80 + (float)uStack_40);
        local_2bf8 = (float)local_88 * (float)local_2868;
        fStack_2bf4 = local_88._4_4_ * local_2868._4_4_;
        fStack_2bf0 = (float)uStack_80 * (float)uStack_2860;
        fStack_2bec = uStack_80._4_4_ * uStack_2860._4_4_;
        fVar39 = local_2bf8 + local_2b88 + (float)local_48;
        fVar40 = fStack_2bf4 + fStack_2b84 + local_48._4_4_;
        fVar41 = fStack_2bf0 + fStack_2b80 + (float)uStack_40;
        fVar42 = fStack_2bec + fStack_2b7c + uStack_40._4_4_;
        local_2ca8 = CONCAT44(fVar40,fVar39);
        uStack_2ca0 = CONCAT44(fVar42,fVar41);
        local_2c58._0_4_ = (float)local_2c98;
        local_2c58._4_4_ = (float)((ulong)local_2c98 >> 0x20);
        uStack_2c50._0_4_ = (float)uStack_2c90;
        uStack_2c50._4_4_ = (float)((ulong)uStack_2c90 >> 0x20);
        local_2c68 = (float)local_f8 * (float)local_2c58;
        fStack_2c64 = local_f8._4_4_ * local_2c58._4_4_;
        fStack_2c60 = (float)uStack_f0 * (float)uStack_2c50;
        fStack_2c5c = uStack_f0._4_4_ * uStack_2c50._4_4_;
        fVar39 = local_2c68 + fVar39;
        fVar40 = fStack_2c64 + fVar40;
        fVar41 = fStack_2c60 + fVar41;
        fVar42 = fStack_2c5c + fVar42;
        local_2d18 = CONCAT44(fVar40,fVar39);
        uStack_2d10 = CONCAT44(fVar42,fVar41);
        local_2cd8 = (float)local_168 * (float)local_25c8;
        fStack_2cd4 = local_168._4_4_ * local_25c8._4_4_;
        fStack_2cd0 = (float)uStack_160 * (float)uStack_25c0;
        fStack_2ccc = uStack_160._4_4_ * uStack_25c0._4_4_;
        fVar39 = local_2cd8 + fVar39;
        fVar40 = fStack_2cd4 + fVar40;
        fVar41 = fStack_2cd0 + fVar41;
        fVar42 = fStack_2ccc + fVar42;
        local_2d88 = CONCAT44(fVar40,fVar39);
        uStack_2d80 = CONCAT44(fVar42,fVar41);
        local_2d48 = (float)local_1d8 * (float)local_29b8;
        fStack_2d44 = local_1d8._4_4_ * local_29b8._4_4_;
        fStack_2d40 = (float)uStack_1d0 * (float)uStack_29b0;
        fStack_2d3c = uStack_1d0._4_4_ * uStack_29b0._4_4_;
        fVar39 = local_2d48 + fVar39;
        fVar40 = fStack_2d44 + fVar40;
        fVar41 = fStack_2d40 + fVar41;
        fVar42 = fStack_2d3c + fVar42;
        local_2df8 = CONCAT44(fVar40,fVar39);
        uStack_2df0 = CONCAT44(fVar42,fVar41);
        local_2da8._0_4_ = (float)local_2de8;
        local_2da8._4_4_ = (float)((ulong)local_2de8 >> 0x20);
        uStack_2da0._0_4_ = (float)uStack_2de0;
        uStack_2da0._4_4_ = (float)((ulong)uStack_2de0 >> 0x20);
        local_2db8 = (float)local_248 * (float)local_2da8;
        fStack_2db4 = local_248._4_4_ * local_2da8._4_4_;
        fStack_2db0 = (float)uStack_240 * (float)uStack_2da0;
        fStack_2dac = uStack_240._4_4_ * uStack_2da0._4_4_;
        fVar39 = local_2db8 + fVar39;
        fVar40 = fStack_2db4 + fVar40;
        fVar41 = fStack_2db0 + fVar41;
        fVar42 = fStack_2dac + fVar42;
        local_2e68 = CONCAT44(fVar40,fVar39);
        uStack_2e60 = CONCAT44(fVar42,fVar41);
        local_2e28 = (float)local_2b8 * (float)local_2718;
        fStack_2e24 = local_2b8._4_4_ * local_2718._4_4_;
        fStack_2e20 = (float)uStack_2b0 * (float)uStack_2710;
        fStack_2e1c = uStack_2b0._4_4_ * uStack_2710._4_4_;
        fVar39 = local_2e28 + fVar39;
        fVar40 = fStack_2e24 + fVar40;
        fVar41 = fStack_2e20 + fVar41;
        fVar42 = fStack_2e1c + fVar42;
        local_2ed8 = CONCAT44(fVar40,fVar39);
        uStack_2ed0 = CONCAT44(fVar42,fVar41);
        local_2e98 = (float)local_328 * (float)local_2b08;
        fStack_2e94 = local_328._4_4_ * local_2b08._4_4_;
        fStack_2e90 = (float)uStack_320 * (float)uStack_2b00;
        fStack_2e8c = uStack_320._4_4_ * uStack_2b00._4_4_;
        fVar39 = local_2e98 + fVar39;
        fVar40 = fStack_2e94 + fVar40;
        fVar41 = fStack_2e90 + fVar41;
        fVar42 = fStack_2e8c + fVar42;
        local_2f48 = CONCAT44(fVar40,fVar39);
        uStack_2f40 = CONCAT44(fVar42,fVar41);
        local_2ef8._0_4_ = (float)local_2f38;
        local_2ef8._4_4_ = (float)((ulong)local_2f38 >> 0x20);
        uStack_2ef0._0_4_ = (float)uStack_2f30;
        uStack_2ef0._4_4_ = (float)((ulong)uStack_2f30 >> 0x20);
        local_2f08._0_4_ = (float)local_398 * (float)local_2ef8;
        local_2f08._4_4_ = local_398._4_4_ * local_2ef8._4_4_;
        local_2f08._8_4_ = (float)uStack_390 * (float)uStack_2ef0;
        local_2f08._12_4_ = uStack_390._4_4_ * uStack_2ef0._4_4_;
        local_3c98 = CONCAT44(local_2f08._4_4_ + fVar40,local_2f08._0_4_ + fVar39);
        uStack_3c90 = CONCAT44(local_2f08._12_4_ + fVar42,local_2f08._8_4_ + fVar41);
        local_3c80 = local_4048 + 0xc;
        *(undefined8 *)local_3c80 = local_3c98;
        *(undefined8 *)(local_4048 + 0xe) = uStack_3c90;
        local_4098 = local_4098 + 0x10;
        local_40a0 = local_40a0 + 0x10;
        local_40a8 = local_40a8 + 0x10;
        local_4048 = local_4048 + 0x10;
        local_2f28 = uVar17;
        uStack_2f20 = uVar18;
        local_2f18 = local_2f48;
        uStack_2f10 = uStack_2f40;
        local_2ef8 = local_2f38;
        uStack_2ef0 = uStack_2f30;
        local_2ee8 = uVar17;
        uStack_2ee0 = uVar18;
        local_2eb8 = uVar15;
        uStack_2eb0 = uVar16;
        local_2ea8 = local_2ed8;
        uStack_2ea0 = uStack_2ed0;
        local_2e88 = local_2ec8;
        uStack_2e80 = uStack_2ec0;
        local_2e78 = uVar15;
        uStack_2e70 = uVar16;
        local_2e48 = uVar13;
        uStack_2e40 = uVar14;
        local_2e38 = local_2e68;
        uStack_2e30 = uStack_2e60;
        local_2e18 = local_2e58;
        uStack_2e10 = uStack_2e50;
        local_2e08 = uVar13;
        uStack_2e00 = uVar14;
        local_2dd8 = uVar11;
        uStack_2dd0 = uVar12;
        local_2dc8 = local_2df8;
        uStack_2dc0 = uStack_2df0;
        local_2da8 = local_2de8;
        uStack_2da0 = uStack_2de0;
        local_2d98 = uVar11;
        uStack_2d90 = uVar12;
        local_2d68 = uVar9;
        uStack_2d60 = uVar10;
        local_2d58 = local_2d88;
        uStack_2d50 = uStack_2d80;
        local_2d38 = local_2d78;
        uStack_2d30 = uStack_2d70;
        local_2d28 = uVar9;
        uStack_2d20 = uVar10;
        local_2cf8 = uVar7;
        uStack_2cf0 = uVar8;
        local_2ce8 = local_2d18;
        uStack_2ce0 = uStack_2d10;
        local_2cc8 = local_2d08;
        uStack_2cc0 = uStack_2d00;
        local_2cb8 = uVar7;
        uStack_2cb0 = uVar8;
        local_2c88 = uVar5;
        uStack_2c80 = uVar6;
        local_2c78 = local_2ca8;
        uStack_2c70 = uStack_2ca0;
        local_2c58 = local_2c98;
        uStack_2c50 = uStack_2c90;
        local_2c48 = uVar5;
        uStack_2c40 = uVar6;
        local_2c18 = uVar3;
        uStack_2c10 = uVar4;
        local_2c08 = local_2c38;
        uStack_2c00 = uStack_2c30;
        local_2be8 = local_2c28;
        uStack_2be0 = uStack_2c20;
        local_2bd8 = uVar3;
        uStack_2bd0 = uVar4;
        local_2ba8 = uVar1;
        uStack_2ba0 = uVar2;
        local_2b78 = local_2bb8;
        uStack_2b70 = uStack_2bb0;
        local_2b68 = uVar1;
        uStack_2b60 = uVar2;
        local_2b48 = local_2ec8;
        uStack_2b40 = uStack_2ec0;
        local_2b38 = uVar17;
        uStack_2b30 = uVar18;
        local_2b28 = local_2b58;
        uStack_2b20 = uStack_2b50;
        local_2b08 = local_2ec8;
        uStack_2b00 = uStack_2ec0;
        local_2af8 = uVar17;
        uStack_2af0 = uVar18;
        local_2ad8 = local_2e58;
        uStack_2ad0 = uStack_2e50;
        local_2ac8 = uVar15;
        uStack_2ac0 = uVar16;
        local_2ab8 = local_2ae8;
        uStack_2ab0 = uStack_2ae0;
        local_2a98 = local_2e58;
        uStack_2a90 = uStack_2e50;
        local_2a88 = uVar15;
        uStack_2a80 = uVar16;
        local_2a58 = uVar13;
        uStack_2a50 = uVar14;
        local_2a48 = local_2a78;
        uStack_2a40 = uStack_2a70;
        local_2a28 = local_2a68;
        uStack_2a20 = uStack_2a60;
        local_2a18 = uVar13;
        uStack_2a10 = uVar14;
        local_29f8 = local_2d78;
        uStack_29f0 = uStack_2d70;
        local_29e8 = uVar11;
        uStack_29e0 = uVar12;
        local_29d8 = local_2a08;
        uStack_29d0 = uStack_2a00;
        local_29b8 = local_2d78;
        uStack_29b0 = uStack_2d70;
        local_29a8 = uVar11;
        uStack_29a0 = uVar12;
        local_2988 = local_2d08;
        uStack_2980 = uStack_2d00;
        local_2978 = uVar9;
        uStack_2970 = uVar10;
        local_2968 = local_2998;
        uStack_2960 = uStack_2990;
        local_2948 = local_2d08;
        uStack_2940 = uStack_2d00;
        local_2938 = uVar9;
        uStack_2930 = uVar10;
        local_2908 = uVar7;
        uStack_2900 = uVar8;
        local_28f8 = local_2928;
        uStack_28f0 = uStack_2920;
        local_28d8 = local_2918;
        uStack_28d0 = uStack_2910;
        local_28c8 = uVar7;
        uStack_28c0 = uVar8;
        local_28a8 = local_2c28;
        uStack_28a0 = uStack_2c20;
        local_2898 = uVar5;
        uStack_2890 = uVar6;
        local_2888 = local_28b8;
        uStack_2880 = uStack_28b0;
        local_2868 = local_2c28;
        uStack_2860 = uStack_2c20;
        local_2858 = uVar5;
        uStack_2850 = uVar6;
        local_2838 = local_2bb8;
        uStack_2830 = uStack_2bb0;
        local_2828 = uVar3;
        uStack_2820 = uVar4;
        local_2818 = local_2848;
        uStack_2810 = uStack_2840;
        local_27f8 = local_2bb8;
        uStack_27f0 = uStack_2bb0;
        local_27e8 = uVar3;
        uStack_27e0 = uVar4;
        local_27b8 = uVar1;
        uStack_27b0 = uVar2;
        local_2788 = local_27c8;
        uStack_2780 = uStack_27c0;
        local_2778 = uVar1;
        uStack_2770 = uVar2;
        local_2758 = local_2e58;
        uStack_2750 = uStack_2e50;
        local_2748 = uVar17;
        uStack_2740 = uVar18;
        local_2738 = local_2768;
        uStack_2730 = uStack_2760;
        local_2718 = local_2e58;
        uStack_2710 = uStack_2e50;
        local_2708 = uVar17;
        uStack_2700 = uVar18;
        local_26e8 = local_2a68;
        uStack_26e0 = uStack_2a60;
        local_26d8 = uVar15;
        uStack_26d0 = uVar16;
        local_26c8 = local_26f8;
        uStack_26c0 = uStack_26f0;
        local_26a8 = local_2a68;
        uStack_26a0 = uStack_2a60;
        local_2698 = uVar15;
        uStack_2690 = uVar16;
        local_2668 = uVar13;
        uStack_2660 = uVar14;
        local_2658 = local_2688;
        uStack_2650 = uStack_2680;
        local_2638 = local_2678;
        uStack_2630 = uStack_2670;
        local_2628 = uVar13;
        uStack_2620 = uVar14;
        local_2608 = local_2d08;
        uStack_2600 = uStack_2d00;
        local_25f8 = uVar11;
        uStack_25f0 = uVar12;
        local_25e8 = local_2618;
        uStack_25e0 = uStack_2610;
        local_25c8 = local_2d08;
        uStack_25c0 = uStack_2d00;
        local_25b8 = uVar11;
        uStack_25b0 = uVar12;
        local_2598 = local_2918;
        uStack_2590 = uStack_2910;
        local_2588 = uVar9;
        uStack_2580 = uVar10;
        local_2578 = local_25a8;
        uStack_2570 = uStack_25a0;
        local_2558 = local_2918;
        uStack_2550 = uStack_2910;
        local_2548 = uVar9;
        uStack_2540 = uVar10;
        local_2518 = uVar7;
        uStack_2510 = uVar8;
        local_2508 = local_2538;
        uStack_2500 = uStack_2530;
        local_24e8 = local_2528;
        uStack_24e0 = uStack_2520;
        local_24d8 = uVar7;
        uStack_24d0 = uVar8;
        local_24b8 = local_2bb8;
        uStack_24b0 = uStack_2bb0;
        local_24a8 = uVar5;
        uStack_24a0 = uVar6;
        local_2498 = local_24c8;
        uStack_2490 = uStack_24c0;
        local_2478 = local_2bb8;
        uStack_2470 = uStack_2bb0;
        local_2468 = uVar5;
        uStack_2460 = uVar6;
        local_2448 = local_27c8;
        uStack_2440 = uStack_27c0;
        local_2438 = uVar3;
        uStack_2430 = uVar4;
        local_2428 = local_2458;
        uStack_2420 = uStack_2450;
        local_2408 = local_27c8;
        uStack_2400 = uStack_27c0;
        local_23f8 = uVar3;
        uStack_23f0 = uVar4;
        local_23c8 = uVar1;
        uStack_23c0 = uVar2;
        local_2398 = local_23d8;
        uStack_2390 = uStack_23d0;
        local_2388 = uVar1;
        uStack_2380 = uVar2;
        local_2368 = local_2a68;
        uStack_2360 = uStack_2a60;
        local_2358 = uVar17;
        uStack_2350 = uVar18;
        local_2348 = local_2378;
        uStack_2340 = uStack_2370;
        local_2328 = local_2a68;
        uStack_2320 = uStack_2a60;
        local_2318 = uVar17;
        uStack_2310 = uVar18;
        local_22f8 = local_2678;
        uStack_22f0 = uStack_2670;
        local_22e8 = uVar15;
        uStack_22e0 = uVar16;
        local_22d8 = local_2308;
        uStack_22d0 = uStack_2300;
        local_22b8 = local_2678;
        uStack_22b0 = uStack_2670;
        local_22a8 = uVar15;
        uStack_22a0 = uVar16;
        local_2278 = uVar13;
        uStack_2270 = uVar14;
        local_2268 = local_2298;
        uStack_2260 = uStack_2290;
        local_2248 = local_2288;
        uStack_2240 = uStack_2280;
        local_2238 = uVar13;
        uStack_2230 = uVar14;
        local_2218 = local_2918;
        uStack_2210 = uStack_2910;
        local_2208 = uVar11;
        uStack_2200 = uVar12;
        local_21f8 = local_2228;
        uStack_21f0 = uStack_2220;
        local_21d8 = local_2918;
        uStack_21d0 = uStack_2910;
        local_21c8 = uVar11;
        uStack_21c0 = uVar12;
        local_21a8 = local_2528;
        uStack_21a0 = uStack_2520;
        local_2198 = uVar9;
        uStack_2190 = uVar10;
        local_2188 = local_21b8;
        uStack_2180 = uStack_21b0;
        local_2168 = local_2528;
        uStack_2160 = uStack_2520;
        local_2158 = uVar9;
        uStack_2150 = uVar10;
        local_2128 = uVar7;
        uStack_2120 = uVar8;
        local_2118 = local_2148;
        uStack_2110 = uStack_2140;
        local_20f8 = local_2138;
        uStack_20f0 = uStack_2130;
        local_20e8 = uVar7;
        uStack_20e0 = uVar8;
        local_20c8 = local_27c8;
        uStack_20c0 = uStack_27c0;
        local_20b8 = uVar5;
        uStack_20b0 = uVar6;
        local_20a8 = local_20d8;
        uStack_20a0 = uStack_20d0;
        local_2088 = local_27c8;
        uStack_2080 = uStack_27c0;
        local_2078 = uVar5;
        uStack_2070 = uVar6;
        local_2058 = local_23d8;
        uStack_2050 = uStack_23d0;
        local_2048 = uVar3;
        uStack_2040 = uVar4;
        local_2038 = local_2068;
        uStack_2030 = uStack_2060;
        local_2018 = local_23d8;
        uStack_2010 = uStack_23d0;
        local_2008 = uVar3;
        uStack_2000 = uVar4;
        local_1fd8 = uVar1;
        uStack_1fd0 = uVar2;
        local_1fa8 = local_1fe8;
        uStack_1fa0 = uStack_1fe0;
        local_1f98 = uVar1;
        uStack_1f90 = uVar2;
      }
      for (; local_4140 + 1 < local_3fb4; local_4140 = local_4140 + 2) {
        local_3ed0 = local_4098;
        local_2fa8 = *(undefined8 *)local_4098;
        uStack_2fa0 = *(undefined8 *)(local_4098 + 2);
        local_3ed8 = local_4098 + 4;
        local_3398 = *(undefined8 *)local_3ed8;
        uStack_3390 = *(undefined8 *)(local_4098 + 6);
        local_3ee0 = local_4098 + 8;
        local_3408 = *(undefined8 *)local_3ee0;
        uStack_3400 = *(undefined8 *)(local_4098 + 10);
        local_3ee8 = local_40a0;
        local_30f8 = *(undefined8 *)local_40a0;
        uStack_30f0 = *(undefined8 *)(local_40a0 + 2);
        local_3ef0 = local_40a0 + 4;
        local_34e8 = *(undefined8 *)local_3ef0;
        uStack_34e0 = *(undefined8 *)(local_40a0 + 6);
        local_3ef8 = local_40a0 + 8;
        local_3558 = *(undefined8 *)local_3ef8;
        uStack_3550 = *(undefined8 *)(local_40a0 + 10);
        local_3f00 = local_40a8;
        local_3248 = *(undefined8 *)local_40a8;
        uStack_3240 = *(undefined8 *)(local_40a8 + 2);
        local_3f08 = local_40a8 + 4;
        local_3638 = *(undefined8 *)local_3f08;
        uStack_3630 = *(undefined8 *)(local_40a8 + 6);
        local_3f10 = local_40a8 + 8;
        local_36a8 = *(undefined8 *)local_3f10;
        uStack_36a0 = *(undefined8 *)(local_40a8 + 10);
        local_2fb8 = local_4028;
        uStack_2fb0 = uStack_4020;
        local_2f68._0_4_ = (float)local_2fa8;
        local_2f68._4_4_ = (float)((ulong)local_2fa8 >> 0x20);
        uStack_2f60._0_4_ = (float)uStack_2fa0;
        uStack_2f60._4_4_ = (float)((ulong)uStack_2fa0 >> 0x20);
        local_2f78 = (float)local_18 * (float)local_2f68;
        fStack_2f74 = local_18._4_4_ * local_2f68._4_4_;
        fStack_2f70 = (float)uStack_10 * (float)uStack_2f60;
        fStack_2f6c = uStack_10._4_4_ * uStack_2f60._4_4_;
        local_2f88 = local_4028;
        uStack_2f80 = uStack_4020;
        local_3028 = CONCAT44(fStack_2f74 + local_48._4_4_,local_2f78 + (float)local_48);
        uStack_3020 = CONCAT44(fStack_2f6c + uStack_40._4_4_,fStack_2f70 + (float)uStack_40);
        local_2fd8._0_4_ = (float)local_3398;
        local_2fd8._4_4_ = (float)((ulong)local_3398 >> 0x20);
        uStack_2fd0._0_4_ = (float)uStack_3390;
        uStack_2fd0._4_4_ = (float)((ulong)uStack_3390 >> 0x20);
        local_2fe8 = (float)local_88 * (float)local_2fd8;
        fStack_2fe4 = local_88._4_4_ * local_2fd8._4_4_;
        fStack_2fe0 = (float)uStack_80 * (float)uStack_2fd0;
        fStack_2fdc = uStack_80._4_4_ * uStack_2fd0._4_4_;
        fVar39 = local_2fe8 + local_2f78 + (float)local_48;
        fVar40 = fStack_2fe4 + fStack_2f74 + local_48._4_4_;
        fVar41 = fStack_2fe0 + fStack_2f70 + (float)uStack_40;
        fVar42 = fStack_2fdc + fStack_2f6c + uStack_40._4_4_;
        local_3098 = CONCAT44(fVar40,fVar39);
        uStack_3090 = CONCAT44(fVar42,fVar41);
        local_3048._0_4_ = (float)local_3408;
        local_3048._4_4_ = (float)((ulong)local_3408 >> 0x20);
        uStack_3040._0_4_ = (float)uStack_3400;
        uStack_3040._4_4_ = (float)((ulong)uStack_3400 >> 0x20);
        local_3058 = (float)local_f8 * (float)local_3048;
        fStack_3054 = local_f8._4_4_ * local_3048._4_4_;
        fStack_3050 = (float)uStack_f0 * (float)uStack_3040;
        fStack_304c = uStack_f0._4_4_ * uStack_3040._4_4_;
        fVar39 = local_3058 + fVar39;
        fVar40 = fStack_3054 + fVar40;
        fVar41 = fStack_3050 + fVar41;
        fVar42 = fStack_304c + fVar42;
        local_3108 = CONCAT44(fVar40,fVar39);
        uStack_3100 = CONCAT44(fVar42,fVar41);
        local_30b8._0_4_ = (float)local_30f8;
        local_30b8._4_4_ = (float)((ulong)local_30f8 >> 0x20);
        uStack_30b0._0_4_ = (float)uStack_30f0;
        uStack_30b0._4_4_ = (float)((ulong)uStack_30f0 >> 0x20);
        local_30c8 = (float)local_168 * (float)local_30b8;
        fStack_30c4 = local_168._4_4_ * local_30b8._4_4_;
        fStack_30c0 = (float)uStack_160 * (float)uStack_30b0;
        fStack_30bc = uStack_160._4_4_ * uStack_30b0._4_4_;
        fVar39 = local_30c8 + fVar39;
        fVar40 = fStack_30c4 + fVar40;
        fVar41 = fStack_30c0 + fVar41;
        fVar42 = fStack_30bc + fVar42;
        local_3178 = CONCAT44(fVar40,fVar39);
        uStack_3170 = CONCAT44(fVar42,fVar41);
        local_3128._0_4_ = (float)local_34e8;
        local_3128._4_4_ = (float)((ulong)local_34e8 >> 0x20);
        uStack_3120._0_4_ = (float)uStack_34e0;
        uStack_3120._4_4_ = (float)((ulong)uStack_34e0 >> 0x20);
        local_3138 = (float)local_1d8 * (float)local_3128;
        fStack_3134 = local_1d8._4_4_ * local_3128._4_4_;
        fStack_3130 = (float)uStack_1d0 * (float)uStack_3120;
        fStack_312c = uStack_1d0._4_4_ * uStack_3120._4_4_;
        fVar39 = local_3138 + fVar39;
        fVar40 = fStack_3134 + fVar40;
        fVar41 = fStack_3130 + fVar41;
        fVar42 = fStack_312c + fVar42;
        local_31e8 = CONCAT44(fVar40,fVar39);
        uStack_31e0 = CONCAT44(fVar42,fVar41);
        local_3198._0_4_ = (float)local_3558;
        local_3198._4_4_ = (float)((ulong)local_3558 >> 0x20);
        uStack_3190._0_4_ = (float)uStack_3550;
        uStack_3190._4_4_ = (float)((ulong)uStack_3550 >> 0x20);
        local_31a8 = (float)local_248 * (float)local_3198;
        fStack_31a4 = local_248._4_4_ * local_3198._4_4_;
        fStack_31a0 = (float)uStack_240 * (float)uStack_3190;
        fStack_319c = uStack_240._4_4_ * uStack_3190._4_4_;
        fVar39 = local_31a8 + fVar39;
        fVar40 = fStack_31a4 + fVar40;
        fVar41 = fStack_31a0 + fVar41;
        fVar42 = fStack_319c + fVar42;
        local_3258 = CONCAT44(fVar40,fVar39);
        uStack_3250 = CONCAT44(fVar42,fVar41);
        local_3208._0_4_ = (float)local_3248;
        local_3208._4_4_ = (float)((ulong)local_3248 >> 0x20);
        uStack_3200._0_4_ = (float)uStack_3240;
        uStack_3200._4_4_ = (float)((ulong)uStack_3240 >> 0x20);
        local_3218 = (float)local_2b8 * (float)local_3208;
        fStack_3214 = local_2b8._4_4_ * local_3208._4_4_;
        fStack_3210 = (float)uStack_2b0 * (float)uStack_3200;
        fStack_320c = uStack_2b0._4_4_ * uStack_3200._4_4_;
        fVar39 = local_3218 + fVar39;
        fVar40 = fStack_3214 + fVar40;
        fVar41 = fStack_3210 + fVar41;
        fVar42 = fStack_320c + fVar42;
        local_32c8 = CONCAT44(fVar40,fVar39);
        uStack_32c0 = CONCAT44(fVar42,fVar41);
        local_3278._0_4_ = (float)local_3638;
        local_3278._4_4_ = (float)((ulong)local_3638 >> 0x20);
        uStack_3270._0_4_ = (float)uStack_3630;
        uStack_3270._4_4_ = (float)((ulong)uStack_3630 >> 0x20);
        local_3288 = (float)local_328 * (float)local_3278;
        fStack_3284 = local_328._4_4_ * local_3278._4_4_;
        fStack_3280 = (float)uStack_320 * (float)uStack_3270;
        fStack_327c = uStack_320._4_4_ * uStack_3270._4_4_;
        fVar39 = local_3288 + fVar39;
        fVar40 = fStack_3284 + fVar40;
        fVar41 = fStack_3280 + fVar41;
        fVar42 = fStack_327c + fVar42;
        local_3338 = CONCAT44(fVar40,fVar39);
        uStack_3330 = CONCAT44(fVar42,fVar41);
        local_32e8._0_4_ = (float)local_36a8;
        local_32e8._4_4_ = (float)((ulong)local_36a8 >> 0x20);
        uStack_32e0._0_4_ = (float)uStack_36a0;
        uStack_32e0._4_4_ = (float)((ulong)uStack_36a0 >> 0x20);
        local_32f8 = (float)local_398 * (float)local_32e8;
        fStack_32f4 = local_398._4_4_ * local_32e8._4_4_;
        fStack_32f0 = (float)uStack_390 * (float)uStack_32e0;
        fStack_32ec = uStack_390._4_4_ * uStack_32e0._4_4_;
        local_3cb8 = CONCAT44(fStack_32f4 + fVar40,local_32f8 + fVar39);
        uStack_3cb0 = CONCAT44(fStack_32ec + fVar42,fStack_32f0 + fVar41);
        local_3f18 = local_4098 + 0xc;
        local_3478 = *(undefined8 *)local_3f18;
        uStack_3470 = *(undefined8 *)(local_4098 + 0xe);
        local_3f20 = local_40a0 + 0xc;
        local_35c8 = *(undefined8 *)local_3f20;
        uStack_35c0 = *(undefined8 *)(local_40a0 + 0xe);
        local_3f28 = local_40a8 + 0xc;
        local_3718 = *(undefined8 *)local_3f28;
        uStack_3710 = *(undefined8 *)(local_40a8 + 0xe);
        local_3ca0 = local_4048;
        *(undefined8 *)local_4048 = local_3cb8;
        *(undefined8 *)(local_4048 + 2) = uStack_3cb0;
        local_33a8 = local_4028;
        uStack_33a0 = uStack_4020;
        local_3368 = (float)local_18 * (float)local_2fd8;
        fStack_3364 = local_18._4_4_ * local_2fd8._4_4_;
        fStack_3360 = (float)uStack_10 * (float)uStack_2fd0;
        fStack_335c = uStack_10._4_4_ * uStack_2fd0._4_4_;
        local_3378 = local_4028;
        uStack_3370 = uStack_4020;
        local_3418 = CONCAT44(fStack_3364 + local_48._4_4_,local_3368 + (float)local_48);
        uStack_3410 = CONCAT44(fStack_335c + uStack_40._4_4_,fStack_3360 + (float)uStack_40);
        local_33d8 = (float)local_88 * (float)local_3048;
        fStack_33d4 = local_88._4_4_ * local_3048._4_4_;
        fStack_33d0 = (float)uStack_80 * (float)uStack_3040;
        fStack_33cc = uStack_80._4_4_ * uStack_3040._4_4_;
        fVar39 = local_33d8 + local_3368 + (float)local_48;
        fVar40 = fStack_33d4 + fStack_3364 + local_48._4_4_;
        fVar41 = fStack_33d0 + fStack_3360 + (float)uStack_40;
        fVar42 = fStack_33cc + fStack_335c + uStack_40._4_4_;
        local_3488 = CONCAT44(fVar40,fVar39);
        uStack_3480 = CONCAT44(fVar42,fVar41);
        local_3438._0_4_ = (float)local_3478;
        local_3438._4_4_ = (float)((ulong)local_3478 >> 0x20);
        uStack_3430._0_4_ = (float)uStack_3470;
        uStack_3430._4_4_ = (float)((ulong)uStack_3470 >> 0x20);
        local_3448 = (float)local_f8 * (float)local_3438;
        fStack_3444 = local_f8._4_4_ * local_3438._4_4_;
        fStack_3440 = (float)uStack_f0 * (float)uStack_3430;
        fStack_343c = uStack_f0._4_4_ * uStack_3430._4_4_;
        fVar39 = local_3448 + fVar39;
        fVar40 = fStack_3444 + fVar40;
        fVar41 = fStack_3440 + fVar41;
        fVar42 = fStack_343c + fVar42;
        local_34f8 = CONCAT44(fVar40,fVar39);
        uStack_34f0 = CONCAT44(fVar42,fVar41);
        local_34b8 = (float)local_168 * (float)local_3128;
        fStack_34b4 = local_168._4_4_ * local_3128._4_4_;
        fStack_34b0 = (float)uStack_160 * (float)uStack_3120;
        fStack_34ac = uStack_160._4_4_ * uStack_3120._4_4_;
        fVar39 = local_34b8 + fVar39;
        fVar40 = fStack_34b4 + fVar40;
        fVar41 = fStack_34b0 + fVar41;
        fVar42 = fStack_34ac + fVar42;
        local_3568 = CONCAT44(fVar40,fVar39);
        uStack_3560 = CONCAT44(fVar42,fVar41);
        local_3528 = (float)local_1d8 * (float)local_3198;
        fStack_3524 = local_1d8._4_4_ * local_3198._4_4_;
        fStack_3520 = (float)uStack_1d0 * (float)uStack_3190;
        fStack_351c = uStack_1d0._4_4_ * uStack_3190._4_4_;
        fVar39 = local_3528 + fVar39;
        fVar40 = fStack_3524 + fVar40;
        fVar41 = fStack_3520 + fVar41;
        fVar42 = fStack_351c + fVar42;
        local_35d8 = CONCAT44(fVar40,fVar39);
        uStack_35d0 = CONCAT44(fVar42,fVar41);
        local_3588._0_4_ = (float)local_35c8;
        local_3588._4_4_ = (float)((ulong)local_35c8 >> 0x20);
        uStack_3580._0_4_ = (float)uStack_35c0;
        uStack_3580._4_4_ = (float)((ulong)uStack_35c0 >> 0x20);
        local_3598 = (float)local_248 * (float)local_3588;
        fStack_3594 = local_248._4_4_ * local_3588._4_4_;
        fStack_3590 = (float)uStack_240 * (float)uStack_3580;
        fStack_358c = uStack_240._4_4_ * uStack_3580._4_4_;
        fVar39 = local_3598 + fVar39;
        fVar40 = fStack_3594 + fVar40;
        fVar41 = fStack_3590 + fVar41;
        fVar42 = fStack_358c + fVar42;
        local_3648 = CONCAT44(fVar40,fVar39);
        uStack_3640 = CONCAT44(fVar42,fVar41);
        local_3608 = (float)local_2b8 * (float)local_3278;
        fStack_3604 = local_2b8._4_4_ * local_3278._4_4_;
        fStack_3600 = (float)uStack_2b0 * (float)uStack_3270;
        fStack_35fc = uStack_2b0._4_4_ * uStack_3270._4_4_;
        fVar39 = local_3608 + fVar39;
        fVar40 = fStack_3604 + fVar40;
        fVar41 = fStack_3600 + fVar41;
        fVar42 = fStack_35fc + fVar42;
        local_36b8 = CONCAT44(fVar40,fVar39);
        uStack_36b0 = CONCAT44(fVar42,fVar41);
        local_3678 = (float)local_328 * (float)local_32e8;
        fStack_3674 = local_328._4_4_ * local_32e8._4_4_;
        fStack_3670 = (float)uStack_320 * (float)uStack_32e0;
        fStack_366c = uStack_320._4_4_ * uStack_32e0._4_4_;
        fVar39 = local_3678 + fVar39;
        fVar40 = fStack_3674 + fVar40;
        fVar41 = fStack_3670 + fVar41;
        fVar42 = fStack_366c + fVar42;
        local_3728 = CONCAT44(fVar40,fVar39);
        uStack_3720 = CONCAT44(fVar42,fVar41);
        local_36d8._0_4_ = (float)local_3718;
        local_36d8._4_4_ = (float)((ulong)local_3718 >> 0x20);
        uStack_36d0._0_4_ = (float)uStack_3710;
        uStack_36d0._4_4_ = (float)((ulong)uStack_3710 >> 0x20);
        local_36e8._0_4_ = (float)local_398 * (float)local_36d8;
        local_36e8._4_4_ = local_398._4_4_ * local_36d8._4_4_;
        local_36e8._8_4_ = (float)uStack_390 * (float)uStack_36d0;
        local_36e8._12_4_ = uStack_390._4_4_ * uStack_36d0._4_4_;
        local_3cd8 = CONCAT44(local_36e8._4_4_ + fVar40,local_36e8._0_4_ + fVar39);
        uStack_3cd0 = CONCAT44(local_36e8._12_4_ + fVar42,local_36e8._8_4_ + fVar41);
        local_3cc0 = local_4048 + 4;
        *(undefined8 *)local_3cc0 = local_3cd8;
        *(undefined8 *)(local_4048 + 6) = uStack_3cd0;
        local_4098 = local_4098 + 8;
        local_40a0 = local_40a0 + 8;
        local_40a8 = local_40a8 + 8;
        local_4048 = local_4048 + 8;
        local_3708 = uVar17;
        uStack_3700 = uVar18;
        local_36f8 = local_3728;
        uStack_36f0 = uStack_3720;
        local_36d8 = local_3718;
        uStack_36d0 = uStack_3710;
        local_36c8 = uVar17;
        uStack_36c0 = uVar18;
        local_3698 = uVar15;
        uStack_3690 = uVar16;
        local_3688 = local_36b8;
        uStack_3680 = uStack_36b0;
        local_3668 = local_36a8;
        uStack_3660 = uStack_36a0;
        local_3658 = uVar15;
        uStack_3650 = uVar16;
        local_3628 = uVar13;
        uStack_3620 = uVar14;
        local_3618 = local_3648;
        uStack_3610 = uStack_3640;
        local_35f8 = local_3638;
        uStack_35f0 = uStack_3630;
        local_35e8 = uVar13;
        uStack_35e0 = uVar14;
        local_35b8 = uVar11;
        uStack_35b0 = uVar12;
        local_35a8 = local_35d8;
        uStack_35a0 = uStack_35d0;
        local_3588 = local_35c8;
        uStack_3580 = uStack_35c0;
        local_3578 = uVar11;
        uStack_3570 = uVar12;
        local_3548 = uVar9;
        uStack_3540 = uVar10;
        local_3538 = local_3568;
        uStack_3530 = uStack_3560;
        local_3518 = local_3558;
        uStack_3510 = uStack_3550;
        local_3508 = uVar9;
        uStack_3500 = uVar10;
        local_34d8 = uVar7;
        uStack_34d0 = uVar8;
        local_34c8 = local_34f8;
        uStack_34c0 = uStack_34f0;
        local_34a8 = local_34e8;
        uStack_34a0 = uStack_34e0;
        local_3498 = uVar7;
        uStack_3490 = uVar8;
        local_3468 = uVar5;
        uStack_3460 = uVar6;
        local_3458 = local_3488;
        uStack_3450 = uStack_3480;
        local_3438 = local_3478;
        uStack_3430 = uStack_3470;
        local_3428 = uVar5;
        uStack_3420 = uVar6;
        local_33f8 = uVar3;
        uStack_33f0 = uVar4;
        local_33e8 = local_3418;
        uStack_33e0 = uStack_3410;
        local_33c8 = local_3408;
        uStack_33c0 = uStack_3400;
        local_33b8 = uVar3;
        uStack_33b0 = uVar4;
        local_3388 = uVar1;
        uStack_3380 = uVar2;
        local_3358 = local_3398;
        uStack_3350 = uStack_3390;
        local_3348 = uVar1;
        uStack_3340 = uVar2;
        local_3328 = local_36a8;
        uStack_3320 = uStack_36a0;
        local_3318 = uVar17;
        uStack_3310 = uVar18;
        local_3308 = local_3338;
        uStack_3300 = uStack_3330;
        local_32e8 = local_36a8;
        uStack_32e0 = uStack_36a0;
        local_32d8 = uVar17;
        uStack_32d0 = uVar18;
        local_32b8 = local_3638;
        uStack_32b0 = uStack_3630;
        local_32a8 = uVar15;
        uStack_32a0 = uVar16;
        local_3298 = local_32c8;
        uStack_3290 = uStack_32c0;
        local_3278 = local_3638;
        uStack_3270 = uStack_3630;
        local_3268 = uVar15;
        uStack_3260 = uVar16;
        local_3238 = uVar13;
        uStack_3230 = uVar14;
        local_3228 = local_3258;
        uStack_3220 = uStack_3250;
        local_3208 = local_3248;
        uStack_3200 = uStack_3240;
        local_31f8 = uVar13;
        uStack_31f0 = uVar14;
        local_31d8 = local_3558;
        uStack_31d0 = uStack_3550;
        local_31c8 = uVar11;
        uStack_31c0 = uVar12;
        local_31b8 = local_31e8;
        uStack_31b0 = uStack_31e0;
        local_3198 = local_3558;
        uStack_3190 = uStack_3550;
        local_3188 = uVar11;
        uStack_3180 = uVar12;
        local_3168 = local_34e8;
        uStack_3160 = uStack_34e0;
        local_3158 = uVar9;
        uStack_3150 = uVar10;
        local_3148 = local_3178;
        uStack_3140 = uStack_3170;
        local_3128 = local_34e8;
        uStack_3120 = uStack_34e0;
        local_3118 = uVar9;
        uStack_3110 = uVar10;
        local_30e8 = uVar7;
        uStack_30e0 = uVar8;
        local_30d8 = local_3108;
        uStack_30d0 = uStack_3100;
        local_30b8 = local_30f8;
        uStack_30b0 = uStack_30f0;
        local_30a8 = uVar7;
        uStack_30a0 = uVar8;
        local_3088 = local_3408;
        uStack_3080 = uStack_3400;
        local_3078 = uVar5;
        uStack_3070 = uVar6;
        local_3068 = local_3098;
        uStack_3060 = uStack_3090;
        local_3048 = local_3408;
        uStack_3040 = uStack_3400;
        local_3038 = uVar5;
        uStack_3030 = uVar6;
        local_3018 = local_3398;
        uStack_3010 = uStack_3390;
        local_3008 = uVar3;
        uStack_3000 = uVar4;
        local_2ff8 = local_3028;
        uStack_2ff0 = uStack_3020;
        local_2fd8 = local_3398;
        uStack_2fd0 = uStack_3390;
        local_2fc8 = uVar3;
        uStack_2fc0 = uVar4;
        local_2f98 = uVar1;
        uStack_2f90 = uVar2;
        local_2f68 = local_2fa8;
        uStack_2f60 = uStack_2fa0;
        local_2f58 = uVar1;
        uStack_2f50 = uVar2;
      }
      for (; local_4140 < local_3fb4; local_4140 = local_4140 + 1) {
        local_3f30 = local_4098;
        local_3788 = *(undefined8 *)local_4098;
        uStack_3780 = *(undefined8 *)(local_4098 + 2);
        local_3f38 = local_4098 + 4;
        local_37f8 = *(undefined8 *)local_3f38;
        uStack_37f0 = *(undefined8 *)(local_4098 + 6);
        local_3f40 = local_4098 + 8;
        local_3868 = *(undefined8 *)local_3f40;
        uStack_3860 = *(undefined8 *)(local_4098 + 10);
        local_3f48 = local_40a0;
        local_38d8 = *(undefined8 *)local_40a0;
        uStack_38d0 = *(undefined8 *)(local_40a0 + 2);
        local_3f50 = local_40a0 + 4;
        local_3948 = *(undefined8 *)local_3f50;
        uStack_3940 = *(undefined8 *)(local_40a0 + 6);
        local_3f58 = local_40a0 + 8;
        local_39b8 = *(undefined8 *)local_3f58;
        uStack_39b0 = *(undefined8 *)(local_40a0 + 10);
        local_3f60 = local_40a8;
        local_3a28 = *(undefined8 *)local_40a8;
        uStack_3a20 = *(undefined8 *)(local_40a8 + 2);
        local_3f68 = local_40a8 + 4;
        local_3a98 = *(undefined8 *)local_3f68;
        uStack_3a90 = *(undefined8 *)(local_40a8 + 6);
        local_3f70 = local_40a8 + 8;
        local_3b08 = *(undefined8 *)local_3f70;
        uStack_3b00 = *(undefined8 *)(local_40a8 + 10);
        local_3798 = local_4028;
        uStack_3790 = uStack_4020;
        local_3748._0_4_ = (float)local_3788;
        local_3748._4_4_ = (float)((ulong)local_3788 >> 0x20);
        uStack_3740._0_4_ = (float)uStack_3780;
        uStack_3740._4_4_ = (float)((ulong)uStack_3780 >> 0x20);
        local_3758 = (float)local_18 * (float)local_3748;
        fStack_3754 = local_18._4_4_ * local_3748._4_4_;
        fStack_3750 = (float)uStack_10 * (float)uStack_3740;
        fStack_374c = uStack_10._4_4_ * uStack_3740._4_4_;
        local_3768 = local_4028;
        uStack_3760 = uStack_4020;
        local_3808 = CONCAT44(fStack_3754 + local_48._4_4_,local_3758 + (float)local_48);
        uStack_3800 = CONCAT44(fStack_374c + uStack_40._4_4_,fStack_3750 + (float)uStack_40);
        local_37b8._0_4_ = (float)local_37f8;
        local_37b8._4_4_ = (float)((ulong)local_37f8 >> 0x20);
        uStack_37b0._0_4_ = (float)uStack_37f0;
        uStack_37b0._4_4_ = (float)((ulong)uStack_37f0 >> 0x20);
        local_37c8 = (float)local_88 * (float)local_37b8;
        fStack_37c4 = local_88._4_4_ * local_37b8._4_4_;
        fStack_37c0 = (float)uStack_80 * (float)uStack_37b0;
        fStack_37bc = uStack_80._4_4_ * uStack_37b0._4_4_;
        in_stack_ffffffffffffac28 = local_37c8 + local_3758 + (float)local_48;
        in_stack_ffffffffffffac2c = fStack_37c4 + fStack_3754 + local_48._4_4_;
        fVar41 = fStack_37c0 + fStack_3750 + (float)uStack_40;
        in_stack_ffffffffffffac24 = fStack_37bc + fStack_374c + uStack_40._4_4_;
        local_3878 = CONCAT44(in_stack_ffffffffffffac2c,in_stack_ffffffffffffac28);
        uStack_3870 = CONCAT44(in_stack_ffffffffffffac24,fVar41);
        local_3828._0_4_ = (float)local_3868;
        local_3828._4_4_ = (float)((ulong)local_3868 >> 0x20);
        uStack_3820._0_4_ = (float)uStack_3860;
        uStack_3820._4_4_ = (float)((ulong)uStack_3860 >> 0x20);
        local_3838 = (float)local_f8 * (float)local_3828;
        fStack_3834 = local_f8._4_4_ * local_3828._4_4_;
        fStack_3830 = (float)uStack_f0 * (float)uStack_3820;
        fStack_382c = uStack_f0._4_4_ * uStack_3820._4_4_;
        in_stack_ffffffffffffac28 = local_3838 + in_stack_ffffffffffffac28;
        in_stack_ffffffffffffac2c = fStack_3834 + in_stack_ffffffffffffac2c;
        fVar41 = fStack_3830 + fVar41;
        in_stack_ffffffffffffac24 = fStack_382c + in_stack_ffffffffffffac24;
        local_38e8 = CONCAT44(in_stack_ffffffffffffac2c,in_stack_ffffffffffffac28);
        uStack_38e0 = CONCAT44(in_stack_ffffffffffffac24,fVar41);
        local_3898._0_4_ = (float)local_38d8;
        local_3898._4_4_ = (float)((ulong)local_38d8 >> 0x20);
        uStack_3890._0_4_ = (float)uStack_38d0;
        uStack_3890._4_4_ = (float)((ulong)uStack_38d0 >> 0x20);
        local_38a8 = (float)local_168 * (float)local_3898;
        fStack_38a4 = local_168._4_4_ * local_3898._4_4_;
        fStack_38a0 = (float)uStack_160 * (float)uStack_3890;
        fStack_389c = uStack_160._4_4_ * uStack_3890._4_4_;
        in_stack_ffffffffffffac28 = local_38a8 + in_stack_ffffffffffffac28;
        in_stack_ffffffffffffac2c = fStack_38a4 + in_stack_ffffffffffffac2c;
        fVar41 = fStack_38a0 + fVar41;
        in_stack_ffffffffffffac24 = fStack_389c + in_stack_ffffffffffffac24;
        local_3958 = CONCAT44(in_stack_ffffffffffffac2c,in_stack_ffffffffffffac28);
        uStack_3950 = CONCAT44(in_stack_ffffffffffffac24,fVar41);
        local_3908._0_4_ = (float)local_3948;
        local_3908._4_4_ = (float)((ulong)local_3948 >> 0x20);
        uStack_3900._0_4_ = (float)uStack_3940;
        uStack_3900._4_4_ = (float)((ulong)uStack_3940 >> 0x20);
        local_3918 = (float)local_1d8 * (float)local_3908;
        fStack_3914 = local_1d8._4_4_ * local_3908._4_4_;
        fStack_3910 = (float)uStack_1d0 * (float)uStack_3900;
        fStack_390c = uStack_1d0._4_4_ * uStack_3900._4_4_;
        in_stack_ffffffffffffac28 = local_3918 + in_stack_ffffffffffffac28;
        in_stack_ffffffffffffac2c = fStack_3914 + in_stack_ffffffffffffac2c;
        fVar41 = fStack_3910 + fVar41;
        in_stack_ffffffffffffac24 = fStack_390c + in_stack_ffffffffffffac24;
        local_39c8 = CONCAT44(in_stack_ffffffffffffac2c,in_stack_ffffffffffffac28);
        uStack_39c0 = CONCAT44(in_stack_ffffffffffffac24,fVar41);
        local_3978._0_4_ = (float)local_39b8;
        local_3978._4_4_ = (float)((ulong)local_39b8 >> 0x20);
        uStack_3970._0_4_ = (float)uStack_39b0;
        uStack_3970._4_4_ = (float)((ulong)uStack_39b0 >> 0x20);
        local_3988 = (float)local_248 * (float)local_3978;
        fStack_3984 = local_248._4_4_ * local_3978._4_4_;
        fStack_3980 = (float)uStack_240 * (float)uStack_3970;
        fStack_397c = uStack_240._4_4_ * uStack_3970._4_4_;
        in_stack_ffffffffffffac28 = local_3988 + in_stack_ffffffffffffac28;
        in_stack_ffffffffffffac2c = fStack_3984 + in_stack_ffffffffffffac2c;
        fVar41 = fStack_3980 + fVar41;
        in_stack_ffffffffffffac24 = fStack_397c + in_stack_ffffffffffffac24;
        local_3a38 = CONCAT44(in_stack_ffffffffffffac2c,in_stack_ffffffffffffac28);
        uStack_3a30 = CONCAT44(in_stack_ffffffffffffac24,fVar41);
        local_39e8._0_4_ = (float)local_3a28;
        local_39e8._4_4_ = (float)((ulong)local_3a28 >> 0x20);
        uStack_39e0._0_4_ = (float)uStack_3a20;
        uStack_39e0._4_4_ = (float)((ulong)uStack_3a20 >> 0x20);
        local_39f8 = (float)local_2b8 * (float)local_39e8;
        fStack_39f4 = local_2b8._4_4_ * local_39e8._4_4_;
        fStack_39f0 = (float)uStack_2b0 * (float)uStack_39e0;
        fStack_39ec = uStack_2b0._4_4_ * uStack_39e0._4_4_;
        fVar41 = fStack_39f0 + fVar41;
        in_stack_ffffffffffffac24 = fStack_39ec + in_stack_ffffffffffffac24;
        local_3aa8 = CONCAT44(fStack_39f4 + in_stack_ffffffffffffac2c,
                              local_39f8 + in_stack_ffffffffffffac28);
        uStack_3aa0 = CONCAT44(in_stack_ffffffffffffac24,fVar41);
        local_3a58._0_4_ = (float)local_3a98;
        local_3a58._4_4_ = (float)((ulong)local_3a98 >> 0x20);
        uStack_3a50._0_4_ = (float)uStack_3a90;
        uStack_3a50._4_4_ = (float)((ulong)uStack_3a90 >> 0x20);
        local_3a68 = (float)local_328 * (float)local_3a58;
        fStack_3a64 = local_328._4_4_ * local_3a58._4_4_;
        fStack_3a60 = (float)uStack_320 * (float)uStack_3a50;
        fStack_3a5c = uStack_320._4_4_ * uStack_3a50._4_4_;
        fVar39 = local_3a68 + local_39f8 + in_stack_ffffffffffffac28;
        fVar40 = fStack_3a64 + fStack_39f4 + in_stack_ffffffffffffac2c;
        fVar41 = fStack_3a60 + fVar41;
        local_3b18 = CONCAT44(fVar40,fVar39);
        uStack_3b10 = CONCAT44(fStack_3a5c + in_stack_ffffffffffffac24,fVar41);
        local_3ac8._0_4_ = (float)local_3b08;
        local_3ac8._4_4_ = (float)((ulong)local_3b08 >> 0x20);
        uStack_3ac0._0_4_ = (float)uStack_3b00;
        uStack_3ac0._4_4_ = (float)((ulong)uStack_3b00 >> 0x20);
        local_3ad8._0_4_ = (float)local_398 * (float)local_3ac8;
        local_3ad8._4_4_ = local_398._4_4_ * local_3ac8._4_4_;
        local_3ad8._8_4_ = (float)uStack_390 * (float)uStack_3ac0;
        local_3ad8._12_4_ = uStack_390._4_4_ * uStack_3ac0._4_4_;
        local_3cf8 = CONCAT44(local_3ad8._4_4_ + fVar40,local_3ad8._0_4_ + fVar39);
        uStack_3cf0 = CONCAT44(local_3ad8._12_4_ + fStack_3a5c + in_stack_ffffffffffffac24,
                               local_3ad8._8_4_ + fVar41);
        local_3ce0 = local_4048;
        *(undefined8 *)local_4048 = local_3cf8;
        *(undefined8 *)(local_4048 + 2) = uStack_3cf0;
        local_4098 = local_4098 + 4;
        local_40a0 = local_40a0 + 4;
        local_40a8 = local_40a8 + 4;
        local_4048 = local_4048 + 4;
        local_3af8 = uVar17;
        uStack_3af0 = uVar18;
        local_3ae8 = local_3b18;
        uStack_3ae0 = uStack_3b10;
        local_3ac8 = local_3b08;
        uStack_3ac0 = uStack_3b00;
        local_3ab8 = uVar17;
        uStack_3ab0 = uVar18;
        local_3a88 = uVar15;
        uStack_3a80 = uVar16;
        local_3a78 = local_3aa8;
        uStack_3a70 = uStack_3aa0;
        local_3a58 = local_3a98;
        uStack_3a50 = uStack_3a90;
        local_3a48 = uVar15;
        uStack_3a40 = uVar16;
        local_3a18 = uVar13;
        uStack_3a10 = uVar14;
        local_3a08 = local_3a38;
        uStack_3a00 = uStack_3a30;
        local_39e8 = local_3a28;
        uStack_39e0 = uStack_3a20;
        local_39d8 = uVar13;
        uStack_39d0 = uVar14;
        local_39a8 = uVar11;
        uStack_39a0 = uVar12;
        local_3998 = local_39c8;
        uStack_3990 = uStack_39c0;
        local_3978 = local_39b8;
        uStack_3970 = uStack_39b0;
        local_3968 = uVar11;
        uStack_3960 = uVar12;
        local_3938 = uVar9;
        uStack_3930 = uVar10;
        local_3928 = local_3958;
        uStack_3920 = uStack_3950;
        local_3908 = local_3948;
        uStack_3900 = uStack_3940;
        local_38f8 = uVar9;
        uStack_38f0 = uVar10;
        local_38c8 = uVar7;
        uStack_38c0 = uVar8;
        local_38b8 = local_38e8;
        uStack_38b0 = uStack_38e0;
        local_3898 = local_38d8;
        uStack_3890 = uStack_38d0;
        local_3888 = uVar7;
        uStack_3880 = uVar8;
        local_3858 = uVar5;
        uStack_3850 = uVar6;
        local_3848 = local_3878;
        uStack_3840 = uStack_3870;
        local_3828 = local_3868;
        uStack_3820 = uStack_3860;
        local_3818 = uVar5;
        uStack_3810 = uVar6;
        local_37e8 = uVar3;
        uStack_37e0 = uVar4;
        local_37d8 = local_3808;
        uStack_37d0 = uStack_3800;
        local_37b8 = local_37f8;
        uStack_37b0 = uStack_37f0;
        local_37a8 = uVar3;
        uStack_37a0 = uVar4;
        local_3778 = uVar1;
        uStack_3770 = uVar2;
        local_3748 = local_3788;
        uStack_3740 = uStack_3780;
        local_3738 = uVar1;
        uStack_3730 = uVar2;
      }
      local_4098 = local_4098 + 8;
      local_40a0 = local_40a0 + 8;
      local_40a8 = local_40a8 + 8;
      local_398 = uVar19;
      uStack_390 = uVar20;
      local_328 = uVar21;
      uStack_320 = uVar22;
      local_2b8 = uVar23;
      uStack_2b0 = uVar24;
      local_248 = uVar25;
      uStack_240 = uVar26;
      local_1d8 = uVar27;
      uStack_1d0 = uVar28;
      local_168 = uVar29;
      uStack_160 = uVar30;
      local_f8 = uVar31;
      uStack_f0 = uVar32;
      local_88 = uVar33;
      uStack_80 = uVar34;
      local_48 = uVar35;
      uStack_40 = uVar36;
      local_18 = uVar37;
      uStack_10 = uVar38;
    }
    Mat::~Mat((Mat *)0x670361);
    Mat::~Mat((Mat *)0x67036e);
  }
  return;
}

Assistant:

static void convdw3x3s1_pack4_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    int outw = top_blob.w;
    int outh = top_blob.h;

    const int group = bottom_blob.c;

    const float* bias = _bias;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int g = 0; g < group; g++)
    {
        Mat out = top_blob.channel(g);

        __m128 _bias0 = bias ? _mm_loadu_ps((const float*)bias + g * 4) : _mm_set1_ps(0.f);

        const float* k0 = kernel.row(g);

        float* outptr0 = out.row(0);

        const Mat img0 = bottom_blob.channel(g);

        const float* r0 = img0.row(0);
        const float* r1 = img0.row(1);
        const float* r2 = img0.row(2);

        __m128 _k00 = _mm_loadu_ps(k0);
        __m128 _k01 = _mm_loadu_ps(k0 + 4);
        __m128 _k02 = _mm_loadu_ps(k0 + 8);
        __m128 _k10 = _mm_loadu_ps(k0 + 12);
        __m128 _k11 = _mm_loadu_ps(k0 + 16);
        __m128 _k12 = _mm_loadu_ps(k0 + 20);
        __m128 _k20 = _mm_loadu_ps(k0 + 24);
        __m128 _k21 = _mm_loadu_ps(k0 + 28);
        __m128 _k22 = _mm_loadu_ps(k0 + 32);

        int i = 0;

        for (; i < outh; i++)
        {
            int j = 0;
            for (; j + 7 < outw; j += 8)
            {
                __m128 _sum0 = _bias0;

                __m128 _r00 = _mm_loadu_ps(r0);
                __m128 _r01 = _mm_loadu_ps(r0 + 4);
                __m128 _r02 = _mm_loadu_ps(r0 + 8);
                __m128 _r10 = _mm_loadu_ps(r1);
                __m128 _r11 = _mm_loadu_ps(r1 + 4);
                __m128 _r12 = _mm_loadu_ps(r1 + 8);
                __m128 _r20 = _mm_loadu_ps(r2);
                __m128 _r21 = _mm_loadu_ps(r2 + 4);
                __m128 _r22 = _mm_loadu_ps(r2 + 8);

                _sum0 = _mm_comp_fmadd_ps(_k00, _r00, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k01, _r01, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k02, _r02, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k10, _r10, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k11, _r11, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k12, _r12, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k20, _r20, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k21, _r21, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k22, _r22, _sum0);

                __m128 _sum1 = _bias0;
                __m128 _r03 = _mm_loadu_ps(r0 + 12);
                __m128 _r13 = _mm_loadu_ps(r1 + 12);
                __m128 _r23 = _mm_loadu_ps(r2 + 12);
                _mm_storeu_ps(outptr0, _sum0);

                _sum1 = _mm_comp_fmadd_ps(_k00, _r01, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k01, _r02, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k02, _r03, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k10, _r11, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k11, _r12, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k12, _r13, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k20, _r21, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k21, _r22, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k22, _r23, _sum1);

                __m128 _sum2 = _bias0;
                __m128 _r04 = _mm_loadu_ps(r0 + 16);
                __m128 _r14 = _mm_loadu_ps(r1 + 16);
                __m128 _r24 = _mm_loadu_ps(r2 + 16);
                _mm_storeu_ps(outptr0 + 4, _sum1);

                _sum2 = _mm_comp_fmadd_ps(_k00, _r02, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k01, _r03, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k02, _r04, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k10, _r12, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k11, _r13, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k12, _r14, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k20, _r22, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k21, _r23, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k22, _r24, _sum2);

                __m128 _sum3 = _bias0;
                __m128 _r05 = _mm_loadu_ps(r0 + 20);
                __m128 _r15 = _mm_loadu_ps(r1 + 20);
                __m128 _r25 = _mm_loadu_ps(r2 + 20);
                _mm_storeu_ps(outptr0 + 8, _sum2);

                _sum3 = _mm_comp_fmadd_ps(_k00, _r03, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k01, _r04, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k02, _r05, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k10, _r13, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k11, _r14, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k12, _r15, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k20, _r23, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k21, _r24, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k22, _r25, _sum3);

                __m128 _sum4 = _bias0;
                __m128 _r06 = _mm_loadu_ps(r0 + 24);
                __m128 _r16 = _mm_loadu_ps(r1 + 24);
                __m128 _r26 = _mm_loadu_ps(r2 + 24);
                _mm_storeu_ps(outptr0 + 12, _sum3);

                _sum4 = _mm_comp_fmadd_ps(_k00, _r04, _sum4);
                _sum4 = _mm_comp_fmadd_ps(_k01, _r05, _sum4);
                _sum4 = _mm_comp_fmadd_ps(_k02, _r06, _sum4);
                _sum4 = _mm_comp_fmadd_ps(_k10, _r14, _sum4);
                _sum4 = _mm_comp_fmadd_ps(_k11, _r15, _sum4);
                _sum4 = _mm_comp_fmadd_ps(_k12, _r16, _sum4);
                _sum4 = _mm_comp_fmadd_ps(_k20, _r24, _sum4);
                _sum4 = _mm_comp_fmadd_ps(_k21, _r25, _sum4);
                _sum4 = _mm_comp_fmadd_ps(_k22, _r26, _sum4);

                __m128 _sum5 = _bias0;
                __m128 _r07 = _mm_loadu_ps(r0 + 28);
                __m128 _r17 = _mm_loadu_ps(r1 + 28);
                __m128 _r27 = _mm_loadu_ps(r2 + 28);
                _mm_storeu_ps(outptr0 + 16, _sum4);

                _sum5 = _mm_comp_fmadd_ps(_k00, _r05, _sum5);
                _sum5 = _mm_comp_fmadd_ps(_k01, _r06, _sum5);
                _sum5 = _mm_comp_fmadd_ps(_k02, _r07, _sum5);
                _sum5 = _mm_comp_fmadd_ps(_k10, _r15, _sum5);
                _sum5 = _mm_comp_fmadd_ps(_k11, _r16, _sum5);
                _sum5 = _mm_comp_fmadd_ps(_k12, _r17, _sum5);
                _sum5 = _mm_comp_fmadd_ps(_k20, _r25, _sum5);
                _sum5 = _mm_comp_fmadd_ps(_k21, _r26, _sum5);
                _sum5 = _mm_comp_fmadd_ps(_k22, _r27, _sum5);

                __m128 _sum6 = _bias0;
                __m128 _r08 = _mm_loadu_ps(r0 + 32);
                __m128 _r18 = _mm_loadu_ps(r1 + 32);
                __m128 _r28 = _mm_loadu_ps(r2 + 32);
                _mm_storeu_ps(outptr0 + 20, _sum5);

                _sum6 = _mm_comp_fmadd_ps(_k00, _r06, _sum6);
                _sum6 = _mm_comp_fmadd_ps(_k01, _r07, _sum6);
                _sum6 = _mm_comp_fmadd_ps(_k02, _r08, _sum6);
                _sum6 = _mm_comp_fmadd_ps(_k10, _r16, _sum6);
                _sum6 = _mm_comp_fmadd_ps(_k11, _r17, _sum6);
                _sum6 = _mm_comp_fmadd_ps(_k12, _r18, _sum6);
                _sum6 = _mm_comp_fmadd_ps(_k20, _r26, _sum6);
                _sum6 = _mm_comp_fmadd_ps(_k21, _r27, _sum6);
                _sum6 = _mm_comp_fmadd_ps(_k22, _r28, _sum6);

                __m128 _sum7 = _bias0;
                __m128 _r09 = _mm_loadu_ps(r0 + 36);
                __m128 _r19 = _mm_loadu_ps(r1 + 36);
                __m128 _r29 = _mm_loadu_ps(r2 + 36);
                _mm_storeu_ps(outptr0 + 24, _sum6);

                _sum7 = _mm_comp_fmadd_ps(_k00, _r07, _sum7);
                _sum7 = _mm_comp_fmadd_ps(_k01, _r08, _sum7);
                _sum7 = _mm_comp_fmadd_ps(_k02, _r09, _sum7);
                _sum7 = _mm_comp_fmadd_ps(_k10, _r17, _sum7);
                _sum7 = _mm_comp_fmadd_ps(_k11, _r18, _sum7);
                _sum7 = _mm_comp_fmadd_ps(_k12, _r19, _sum7);
                _sum7 = _mm_comp_fmadd_ps(_k20, _r27, _sum7);
                _sum7 = _mm_comp_fmadd_ps(_k21, _r28, _sum7);
                _sum7 = _mm_comp_fmadd_ps(_k22, _r29, _sum7);
                _mm_storeu_ps(outptr0 + 28, _sum7);

                r0 += 32;
                r1 += 32;
                r2 += 32;
                outptr0 += 32;
            }
            for (; j + 3 < outw; j += 4)
            {
                __m128 _sum0 = _bias0;

                __m128 _r00 = _mm_loadu_ps(r0);
                __m128 _r01 = _mm_loadu_ps(r0 + 4);
                __m128 _r02 = _mm_loadu_ps(r0 + 8);
                __m128 _r10 = _mm_loadu_ps(r1);
                __m128 _r11 = _mm_loadu_ps(r1 + 4);
                __m128 _r12 = _mm_loadu_ps(r1 + 8);
                __m128 _r20 = _mm_loadu_ps(r2);
                __m128 _r21 = _mm_loadu_ps(r2 + 4);
                __m128 _r22 = _mm_loadu_ps(r2 + 8);

                _sum0 = _mm_comp_fmadd_ps(_k00, _r00, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k01, _r01, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k02, _r02, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k10, _r10, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k11, _r11, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k12, _r12, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k20, _r20, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k21, _r21, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k22, _r22, _sum0);

                __m128 _sum1 = _bias0;
                __m128 _r03 = _mm_loadu_ps(r0 + 12);
                __m128 _r13 = _mm_loadu_ps(r1 + 12);
                __m128 _r23 = _mm_loadu_ps(r2 + 12);
                _mm_storeu_ps(outptr0, _sum0);

                _sum1 = _mm_comp_fmadd_ps(_k00, _r01, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k01, _r02, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k02, _r03, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k10, _r11, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k11, _r12, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k12, _r13, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k20, _r21, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k21, _r22, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k22, _r23, _sum1);

                __m128 _sum2 = _bias0;
                __m128 _r04 = _mm_loadu_ps(r0 + 16);
                __m128 _r14 = _mm_loadu_ps(r1 + 16);
                __m128 _r24 = _mm_loadu_ps(r2 + 16);
                _mm_storeu_ps(outptr0 + 4, _sum1);

                _sum2 = _mm_comp_fmadd_ps(_k00, _r02, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k01, _r03, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k02, _r04, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k10, _r12, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k11, _r13, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k12, _r14, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k20, _r22, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k21, _r23, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k22, _r24, _sum2);

                __m128 _sum3 = _bias0;
                __m128 _r05 = _mm_loadu_ps(r0 + 20);
                __m128 _r15 = _mm_loadu_ps(r1 + 20);
                __m128 _r25 = _mm_loadu_ps(r2 + 20);
                _mm_storeu_ps(outptr0 + 8, _sum2);

                _sum3 = _mm_comp_fmadd_ps(_k00, _r03, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k01, _r04, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k02, _r05, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k10, _r13, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k11, _r14, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k12, _r15, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k20, _r23, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k21, _r24, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k22, _r25, _sum3);

                _mm_storeu_ps(outptr0 + 12, _sum3);

                r0 += 16;
                r1 += 16;
                r2 += 16;
                outptr0 += 16;
            }
            for (; j + 1 < outw; j += 2)
            {
                __m128 _sum0 = _bias0;

                __m128 _r00 = _mm_loadu_ps(r0);
                __m128 _r01 = _mm_loadu_ps(r0 + 4);
                __m128 _r02 = _mm_loadu_ps(r0 + 8);
                __m128 _r10 = _mm_loadu_ps(r1);
                __m128 _r11 = _mm_loadu_ps(r1 + 4);
                __m128 _r12 = _mm_loadu_ps(r1 + 8);
                __m128 _r20 = _mm_loadu_ps(r2);
                __m128 _r21 = _mm_loadu_ps(r2 + 4);
                __m128 _r22 = _mm_loadu_ps(r2 + 8);

                _sum0 = _mm_comp_fmadd_ps(_k00, _r00, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k01, _r01, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k02, _r02, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k10, _r10, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k11, _r11, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k12, _r12, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k20, _r20, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k21, _r21, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k22, _r22, _sum0);

                __m128 _sum1 = _bias0;
                __m128 _r03 = _mm_loadu_ps(r0 + 12);
                __m128 _r13 = _mm_loadu_ps(r1 + 12);
                __m128 _r23 = _mm_loadu_ps(r2 + 12);
                _mm_storeu_ps(outptr0, _sum0);

                _sum1 = _mm_comp_fmadd_ps(_k00, _r01, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k01, _r02, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k02, _r03, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k10, _r11, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k11, _r12, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k12, _r13, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k20, _r21, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k21, _r22, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k22, _r23, _sum1);

                _mm_storeu_ps(outptr0 + 4, _sum1);

                r0 += 8;
                r1 += 8;
                r2 += 8;
                outptr0 += 8;
            }
            for (; j < outw; j++)
            {
                __m128 _sum0 = _bias0;

                __m128 _r00 = _mm_loadu_ps(r0);
                __m128 _r01 = _mm_loadu_ps(r0 + 4);
                __m128 _r02 = _mm_loadu_ps(r0 + 8);
                __m128 _r10 = _mm_loadu_ps(r1);
                __m128 _r11 = _mm_loadu_ps(r1 + 4);
                __m128 _r12 = _mm_loadu_ps(r1 + 8);
                __m128 _r20 = _mm_loadu_ps(r2);
                __m128 _r21 = _mm_loadu_ps(r2 + 4);
                __m128 _r22 = _mm_loadu_ps(r2 + 8);

                _sum0 = _mm_comp_fmadd_ps(_k00, _r00, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k01, _r01, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k02, _r02, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k10, _r10, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k11, _r11, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k12, _r12, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k20, _r20, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k21, _r21, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k22, _r22, _sum0);

                _mm_storeu_ps(outptr0, _sum0);

                r0 += 4;
                r1 += 4;
                r2 += 4;
                outptr0 += 4;
            }

            r0 += 2 * 4;
            r1 += 2 * 4;
            r2 += 2 * 4;
        }
    }
}